

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  undefined1 (*pauVar3) [12];
  undefined4 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Primitive PVar20;
  uint uVar21;
  Geometry *pGVar22;
  __int_type_conflict _Var23;
  long lVar24;
  long lVar25;
  long lVar26;
  RTCFilterFunctionN p_Var27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  bool bVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [12];
  uint uVar89;
  uint uVar90;
  uint uVar91;
  ulong uVar92;
  ulong uVar93;
  long lVar94;
  uint uVar95;
  long lVar97;
  long lVar98;
  long lVar99;
  float t1;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar113 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar182;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [16];
  float fVar157;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  float fVar183;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar170 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar184;
  float fVar215;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar213;
  float fVar214;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar219;
  float fVar241;
  float fVar242;
  vfloat4 a0_1;
  float fVar243;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar244;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar248;
  float fVar264;
  float fVar265;
  undefined1 auVar249 [16];
  float fVar266;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar263 [32];
  float fVar270;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar275 [16];
  float fVar283;
  float fVar285;
  undefined1 auVar281 [32];
  float fVar284;
  undefined1 auVar282 [32];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar341;
  float fVar342;
  undefined1 auVar333 [16];
  float fVar339;
  float fVar340;
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [16];
  float fVar368;
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  float fVar366;
  float fVar367;
  float fVar369;
  float fVar370;
  float fVar371;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  float fVar372;
  float fVar384;
  float fVar385;
  vfloat4 a0;
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  float fVar386;
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  float in_register_0000151c;
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  float fVar393;
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  float fVar403;
  float fVar404;
  undefined1 auVar402 [32];
  float fVar405;
  undefined1 auVar406 [16];
  float fVar409;
  float fVar410;
  float in_register_0000159c;
  undefined1 auVar407 [32];
  undefined1 auVar408 [64];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  float in_register_000015dc;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_730 [8];
  float fStack_728;
  float fStack_724;
  float local_720;
  float fStack_71c;
  float fStack_718;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  uint local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  RTCFilterFunctionNArguments local_4f0;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float local_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  uint auStack_450 [4];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  float afStack_320 [8];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar96;
  undefined1 auVar212 [32];
  undefined1 auVar415 [32];
  
  PVar20 = prim[1];
  uVar92 = (ulong)(byte)PVar20;
  lVar98 = uVar92 * 0x25;
  auVar141 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar141 = vinsertps_avx(auVar141,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar223 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar223 = vinsertps_avx(auVar223,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar141 = vsubps_avx(auVar141,*(undefined1 (*) [16])(prim + lVar98 + 6));
  fVar184 = *(float *)(prim + lVar98 + 0x12);
  auVar126._0_4_ = fVar184 * auVar141._0_4_;
  auVar126._4_4_ = fVar184 * auVar141._4_4_;
  auVar126._8_4_ = fVar184 * auVar141._8_4_;
  auVar126._12_4_ = fVar184 * auVar141._12_4_;
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 4 + 6)));
  auVar249._0_4_ = fVar184 * auVar223._0_4_;
  auVar249._4_4_ = fVar184 * auVar223._4_4_;
  auVar249._8_4_ = fVar184 * auVar223._8_4_;
  auVar249._12_4_ = fVar184 * auVar223._12_4_;
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 4 + 10)));
  auVar116._16_16_ = auVar223;
  auVar116._0_16_ = auVar141;
  auVar116 = vcvtdq2ps_avx(auVar116);
  lVar94 = uVar92 * 5;
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar94 + 6)));
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar94 + 10)));
  auVar176._16_16_ = auVar223;
  auVar176._0_16_ = auVar141;
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 6 + 6)));
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 6 + 10)));
  auVar28 = vcvtdq2ps_avx(auVar176);
  auVar205._16_16_ = auVar223;
  auVar205._0_16_ = auVar141;
  auVar29 = vcvtdq2ps_avx(auVar205);
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0xf + 6)));
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0xf + 10)));
  auVar206._16_16_ = auVar223;
  auVar206._0_16_ = auVar141;
  auVar30 = vcvtdq2ps_avx(auVar206);
  lVar99 = (ulong)(byte)PVar20 * 0x10;
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar99 + 6)));
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar99 + 10)));
  auVar281._16_16_ = auVar223;
  auVar281._0_16_ = auVar141;
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar99 + uVar92 + 6)));
  auVar31 = vcvtdq2ps_avx(auVar281);
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar99 + uVar92 + 10)));
  auVar295._16_16_ = auVar223;
  auVar295._0_16_ = auVar141;
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0x1a + 6)));
  auVar32 = vcvtdq2ps_avx(auVar295);
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0x1a + 10)));
  auVar296._16_16_ = auVar223;
  auVar296._0_16_ = auVar141;
  auVar33 = vcvtdq2ps_avx(auVar296);
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0x1b + 6)));
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0x1b + 10)));
  auVar334._16_16_ = auVar223;
  auVar334._0_16_ = auVar141;
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0x1c + 6)));
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0x1c + 10)));
  auVar34 = vcvtdq2ps_avx(auVar334);
  auVar349._16_16_ = auVar223;
  auVar349._0_16_ = auVar141;
  auVar35 = vcvtdq2ps_avx(auVar349);
  auVar141 = vshufps_avx(auVar249,auVar249,0);
  auVar223 = vshufps_avx(auVar249,auVar249,0x55);
  auVar261 = vshufps_avx(auVar249,auVar249,0xaa);
  fVar184 = auVar261._0_4_;
  fVar219 = auVar261._4_4_;
  fVar270 = auVar261._8_4_;
  fVar213 = auVar261._12_4_;
  fVar183 = auVar223._0_4_;
  fVar157 = auVar223._4_4_;
  fVar214 = auVar223._8_4_;
  fVar242 = auVar223._12_4_;
  fVar182 = auVar141._0_4_;
  fVar215 = auVar141._4_4_;
  fVar243 = auVar141._8_4_;
  fVar340 = auVar141._12_4_;
  auVar380._0_4_ = fVar182 * auVar116._0_4_ + fVar183 * auVar28._0_4_ + fVar184 * auVar29._0_4_;
  auVar380._4_4_ = fVar215 * auVar116._4_4_ + fVar157 * auVar28._4_4_ + fVar219 * auVar29._4_4_;
  auVar380._8_4_ = fVar243 * auVar116._8_4_ + fVar214 * auVar28._8_4_ + fVar270 * auVar29._8_4_;
  auVar380._12_4_ = fVar340 * auVar116._12_4_ + fVar242 * auVar28._12_4_ + fVar213 * auVar29._12_4_;
  auVar380._16_4_ = fVar182 * auVar116._16_4_ + fVar183 * auVar28._16_4_ + fVar184 * auVar29._16_4_;
  auVar380._20_4_ = fVar215 * auVar116._20_4_ + fVar157 * auVar28._20_4_ + fVar219 * auVar29._20_4_;
  auVar380._24_4_ = fVar243 * auVar116._24_4_ + fVar214 * auVar28._24_4_ + fVar270 * auVar29._24_4_;
  auVar380._28_4_ = fVar242 + in_register_000015dc + in_register_0000151c;
  auVar361._0_4_ = fVar182 * auVar30._0_4_ + fVar183 * auVar31._0_4_ + auVar32._0_4_ * fVar184;
  auVar361._4_4_ = fVar215 * auVar30._4_4_ + fVar157 * auVar31._4_4_ + auVar32._4_4_ * fVar219;
  auVar361._8_4_ = fVar243 * auVar30._8_4_ + fVar214 * auVar31._8_4_ + auVar32._8_4_ * fVar270;
  auVar361._12_4_ = fVar340 * auVar30._12_4_ + fVar242 * auVar31._12_4_ + auVar32._12_4_ * fVar213;
  auVar361._16_4_ = fVar182 * auVar30._16_4_ + fVar183 * auVar31._16_4_ + auVar32._16_4_ * fVar184;
  auVar361._20_4_ = fVar215 * auVar30._20_4_ + fVar157 * auVar31._20_4_ + auVar32._20_4_ * fVar219;
  auVar361._24_4_ = fVar243 * auVar30._24_4_ + fVar214 * auVar31._24_4_ + auVar32._24_4_ * fVar270;
  auVar361._28_4_ = fVar242 + in_register_000015dc + in_register_0000159c;
  auVar263._0_4_ = fVar182 * auVar33._0_4_ + fVar183 * auVar34._0_4_ + auVar35._0_4_ * fVar184;
  auVar263._4_4_ = fVar215 * auVar33._4_4_ + fVar157 * auVar34._4_4_ + auVar35._4_4_ * fVar219;
  auVar263._8_4_ = fVar243 * auVar33._8_4_ + fVar214 * auVar34._8_4_ + auVar35._8_4_ * fVar270;
  auVar263._12_4_ = fVar340 * auVar33._12_4_ + fVar242 * auVar34._12_4_ + auVar35._12_4_ * fVar213;
  auVar263._16_4_ = fVar182 * auVar33._16_4_ + fVar183 * auVar34._16_4_ + auVar35._16_4_ * fVar184;
  auVar263._20_4_ = fVar215 * auVar33._20_4_ + fVar157 * auVar34._20_4_ + auVar35._20_4_ * fVar219;
  auVar263._24_4_ = fVar243 * auVar33._24_4_ + fVar214 * auVar34._24_4_ + auVar35._24_4_ * fVar270;
  auVar263._28_4_ = fVar340 + fVar242 + fVar213;
  auVar141 = vshufps_avx(auVar126,auVar126,0);
  auVar223 = vshufps_avx(auVar126,auVar126,0x55);
  auVar261 = vshufps_avx(auVar126,auVar126,0xaa);
  fVar184 = auVar261._0_4_;
  fVar219 = auVar261._4_4_;
  fVar270 = auVar261._8_4_;
  fVar213 = auVar261._12_4_;
  fVar215 = auVar223._0_4_;
  fVar243 = auVar223._4_4_;
  fVar340 = auVar223._8_4_;
  fVar216 = auVar223._12_4_;
  fVar183 = auVar28._28_4_ + auVar29._28_4_;
  fVar157 = auVar141._0_4_;
  fVar214 = auVar141._4_4_;
  fVar242 = auVar141._8_4_;
  fVar182 = auVar141._12_4_;
  auVar151._0_4_ = fVar157 * auVar116._0_4_ + fVar215 * auVar28._0_4_ + fVar184 * auVar29._0_4_;
  auVar151._4_4_ = fVar214 * auVar116._4_4_ + fVar243 * auVar28._4_4_ + fVar219 * auVar29._4_4_;
  auVar151._8_4_ = fVar242 * auVar116._8_4_ + fVar340 * auVar28._8_4_ + fVar270 * auVar29._8_4_;
  auVar151._12_4_ = fVar182 * auVar116._12_4_ + fVar216 * auVar28._12_4_ + fVar213 * auVar29._12_4_;
  auVar151._16_4_ = fVar157 * auVar116._16_4_ + fVar215 * auVar28._16_4_ + fVar184 * auVar29._16_4_;
  auVar151._20_4_ = fVar214 * auVar116._20_4_ + fVar243 * auVar28._20_4_ + fVar219 * auVar29._20_4_;
  auVar151._24_4_ = fVar242 * auVar116._24_4_ + fVar340 * auVar28._24_4_ + fVar270 * auVar29._24_4_;
  auVar151._28_4_ = auVar116._28_4_ + fVar183;
  auVar117._0_4_ = fVar157 * auVar30._0_4_ + auVar32._0_4_ * fVar184 + fVar215 * auVar31._0_4_;
  auVar117._4_4_ = fVar214 * auVar30._4_4_ + auVar32._4_4_ * fVar219 + fVar243 * auVar31._4_4_;
  auVar117._8_4_ = fVar242 * auVar30._8_4_ + auVar32._8_4_ * fVar270 + fVar340 * auVar31._8_4_;
  auVar117._12_4_ = fVar182 * auVar30._12_4_ + auVar32._12_4_ * fVar213 + fVar216 * auVar31._12_4_;
  auVar117._16_4_ = fVar157 * auVar30._16_4_ + auVar32._16_4_ * fVar184 + fVar215 * auVar31._16_4_;
  auVar117._20_4_ = fVar214 * auVar30._20_4_ + auVar32._20_4_ * fVar219 + fVar243 * auVar31._20_4_;
  auVar117._24_4_ = fVar242 * auVar30._24_4_ + auVar32._24_4_ * fVar270 + fVar340 * auVar31._24_4_;
  auVar117._28_4_ = auVar116._28_4_ + auVar32._28_4_ + auVar29._28_4_;
  auVar207._8_4_ = 0x7fffffff;
  auVar207._0_8_ = 0x7fffffff7fffffff;
  auVar207._12_4_ = 0x7fffffff;
  auVar207._16_4_ = 0x7fffffff;
  auVar207._20_4_ = 0x7fffffff;
  auVar207._24_4_ = 0x7fffffff;
  auVar207._28_4_ = 0x7fffffff;
  auVar237._8_4_ = 0x219392ef;
  auVar237._0_8_ = 0x219392ef219392ef;
  auVar237._12_4_ = 0x219392ef;
  auVar237._16_4_ = 0x219392ef;
  auVar237._20_4_ = 0x219392ef;
  auVar237._24_4_ = 0x219392ef;
  auVar237._28_4_ = 0x219392ef;
  auVar116 = vandps_avx(auVar380,auVar207);
  auVar116 = vcmpps_avx(auVar116,auVar237,1);
  auVar28 = vblendvps_avx(auVar380,auVar237,auVar116);
  auVar116 = vandps_avx(auVar361,auVar207);
  auVar116 = vcmpps_avx(auVar116,auVar237,1);
  auVar29 = vblendvps_avx(auVar361,auVar237,auVar116);
  auVar116 = vandps_avx(auVar263,auVar207);
  auVar116 = vcmpps_avx(auVar116,auVar237,1);
  auVar116 = vblendvps_avx(auVar263,auVar237,auVar116);
  auVar177._0_4_ = fVar157 * auVar33._0_4_ + fVar215 * auVar34._0_4_ + auVar35._0_4_ * fVar184;
  auVar177._4_4_ = fVar214 * auVar33._4_4_ + fVar243 * auVar34._4_4_ + auVar35._4_4_ * fVar219;
  auVar177._8_4_ = fVar242 * auVar33._8_4_ + fVar340 * auVar34._8_4_ + auVar35._8_4_ * fVar270;
  auVar177._12_4_ = fVar182 * auVar33._12_4_ + fVar216 * auVar34._12_4_ + auVar35._12_4_ * fVar213;
  auVar177._16_4_ = fVar157 * auVar33._16_4_ + fVar215 * auVar34._16_4_ + auVar35._16_4_ * fVar184;
  auVar177._20_4_ = fVar214 * auVar33._20_4_ + fVar243 * auVar34._20_4_ + auVar35._20_4_ * fVar219;
  auVar177._24_4_ = fVar242 * auVar33._24_4_ + fVar340 * auVar34._24_4_ + auVar35._24_4_ * fVar270;
  auVar177._28_4_ = fVar183 + auVar31._28_4_ + fVar213;
  auVar30 = vrcpps_avx(auVar28);
  fVar184 = auVar30._0_4_;
  fVar213 = auVar30._4_4_;
  auVar31._4_4_ = auVar28._4_4_ * fVar213;
  auVar31._0_4_ = auVar28._0_4_ * fVar184;
  fVar214 = auVar30._8_4_;
  auVar31._8_4_ = auVar28._8_4_ * fVar214;
  fVar215 = auVar30._12_4_;
  auVar31._12_4_ = auVar28._12_4_ * fVar215;
  fVar216 = auVar30._16_4_;
  auVar31._16_4_ = auVar28._16_4_ * fVar216;
  fVar217 = auVar30._20_4_;
  auVar31._20_4_ = auVar28._20_4_ * fVar217;
  fVar218 = auVar30._24_4_;
  auVar31._24_4_ = auVar28._24_4_ * fVar218;
  auVar31._28_4_ = 0x219392ef;
  auVar297._8_4_ = 0x3f800000;
  auVar297._0_8_ = &DAT_3f8000003f800000;
  auVar297._12_4_ = 0x3f800000;
  auVar297._16_4_ = 0x3f800000;
  auVar297._20_4_ = 0x3f800000;
  auVar297._24_4_ = 0x3f800000;
  auVar297._28_4_ = 0x3f800000;
  auVar32 = vsubps_avx(auVar297,auVar31);
  auVar31 = vrcpps_avx(auVar29);
  fVar184 = fVar184 + fVar184 * auVar32._0_4_;
  fVar213 = fVar213 + fVar213 * auVar32._4_4_;
  fVar214 = fVar214 + fVar214 * auVar32._8_4_;
  fVar215 = fVar215 + fVar215 * auVar32._12_4_;
  fVar216 = fVar216 + fVar216 * auVar32._16_4_;
  fVar217 = fVar217 + fVar217 * auVar32._20_4_;
  fVar218 = fVar218 + fVar218 * auVar32._24_4_;
  fVar219 = auVar31._0_4_;
  fVar183 = auVar31._4_4_;
  auVar28._4_4_ = auVar29._4_4_ * fVar183;
  auVar28._0_4_ = auVar29._0_4_ * fVar219;
  fVar242 = auVar31._8_4_;
  auVar28._8_4_ = auVar29._8_4_ * fVar242;
  fVar243 = auVar31._12_4_;
  auVar28._12_4_ = auVar29._12_4_ * fVar243;
  fVar245 = auVar31._16_4_;
  auVar28._16_4_ = auVar29._16_4_ * fVar245;
  fVar246 = auVar31._20_4_;
  auVar28._20_4_ = auVar29._20_4_ * fVar246;
  fVar247 = auVar31._24_4_;
  auVar28._24_4_ = auVar29._24_4_ * fVar247;
  auVar28._28_4_ = auVar32._28_4_;
  auVar29 = vsubps_avx(auVar297,auVar28);
  fVar219 = fVar219 + fVar219 * auVar29._0_4_;
  fVar183 = fVar183 + fVar183 * auVar29._4_4_;
  fVar242 = fVar242 + fVar242 * auVar29._8_4_;
  fVar243 = fVar243 + fVar243 * auVar29._12_4_;
  fVar245 = fVar245 + fVar245 * auVar29._16_4_;
  fVar246 = fVar246 + fVar246 * auVar29._20_4_;
  fVar247 = fVar247 + fVar247 * auVar29._24_4_;
  auVar28 = vrcpps_avx(auVar116);
  fVar248 = auVar28._0_4_;
  fVar264 = auVar28._4_4_;
  auVar33._4_4_ = fVar264 * auVar116._4_4_;
  auVar33._0_4_ = fVar248 * auVar116._0_4_;
  fVar265 = auVar28._8_4_;
  auVar33._8_4_ = fVar265 * auVar116._8_4_;
  fVar266 = auVar28._12_4_;
  auVar33._12_4_ = fVar266 * auVar116._12_4_;
  fVar267 = auVar28._16_4_;
  auVar33._16_4_ = fVar267 * auVar116._16_4_;
  fVar268 = auVar28._20_4_;
  auVar33._20_4_ = fVar268 * auVar116._20_4_;
  fVar269 = auVar28._24_4_;
  auVar33._24_4_ = fVar269 * auVar116._24_4_;
  auVar33._28_4_ = auVar116._28_4_;
  auVar116 = vsubps_avx(auVar297,auVar33);
  fVar248 = fVar248 + fVar248 * auVar116._0_4_;
  fVar264 = fVar264 + fVar264 * auVar116._4_4_;
  fVar265 = fVar265 + fVar265 * auVar116._8_4_;
  fVar266 = fVar266 + fVar266 * auVar116._12_4_;
  fVar267 = fVar267 + fVar267 * auVar116._16_4_;
  fVar268 = fVar268 + fVar268 * auVar116._20_4_;
  fVar269 = fVar269 + fVar269 * auVar116._24_4_;
  auVar141 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar98 + 0x16)) *
                           *(float *)(prim + lVar98 + 0x1a)));
  auVar37 = vshufps_avx(auVar141,auVar141,0);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar92 * 7 + 6);
  auVar141 = vpmovsxwd_avx(auVar141);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar92 * 7 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar223);
  auVar298._16_16_ = auVar223;
  auVar298._0_16_ = auVar141;
  auVar116 = vcvtdq2ps_avx(auVar298);
  auVar261._8_8_ = 0;
  auVar261._0_8_ = *(ulong *)(prim + uVar92 * 0xb + 6);
  auVar141 = vpmovsxwd_avx(auVar261);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar92 * 0xb + 0xe);
  auVar223 = vpmovsxwd_avx(auVar7);
  auVar317._16_16_ = auVar223;
  auVar317._0_16_ = auVar141;
  auVar28 = vcvtdq2ps_avx(auVar317);
  auVar28 = vsubps_avx(auVar28,auVar116);
  fVar270 = auVar37._0_4_;
  fVar157 = auVar37._4_4_;
  fVar182 = auVar37._8_4_;
  fVar340 = auVar37._12_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar92 * 9 + 6);
  auVar141 = vpmovsxwd_avx(auVar37);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar92 * 9 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar8);
  auVar299._0_4_ = auVar28._0_4_ * fVar270 + auVar116._0_4_;
  auVar299._4_4_ = auVar28._4_4_ * fVar157 + auVar116._4_4_;
  auVar299._8_4_ = auVar28._8_4_ * fVar182 + auVar116._8_4_;
  auVar299._12_4_ = auVar28._12_4_ * fVar340 + auVar116._12_4_;
  auVar299._16_4_ = auVar28._16_4_ * fVar270 + auVar116._16_4_;
  auVar299._20_4_ = auVar28._20_4_ * fVar157 + auVar116._20_4_;
  auVar299._24_4_ = auVar28._24_4_ * fVar182 + auVar116._24_4_;
  auVar299._28_4_ = auVar28._28_4_ + auVar116._28_4_;
  auVar318._16_16_ = auVar223;
  auVar318._0_16_ = auVar141;
  auVar116 = vcvtdq2ps_avx(auVar318);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar92 * 0xd + 6);
  auVar141 = vpmovsxwd_avx(auVar202);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar92 * 0xd + 0xe);
  auVar223 = vpmovsxwd_avx(auVar140);
  auVar335._16_16_ = auVar223;
  auVar335._0_16_ = auVar141;
  auVar28 = vcvtdq2ps_avx(auVar335);
  auVar28 = vsubps_avx(auVar28,auVar116);
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + uVar92 * 0x12 + 6);
  auVar141 = vpmovsxwd_avx(auVar201);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar92 * 0x12 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar114);
  auVar319._0_4_ = auVar116._0_4_ + auVar28._0_4_ * fVar270;
  auVar319._4_4_ = auVar116._4_4_ + auVar28._4_4_ * fVar157;
  auVar319._8_4_ = auVar116._8_4_ + auVar28._8_4_ * fVar182;
  auVar319._12_4_ = auVar116._12_4_ + auVar28._12_4_ * fVar340;
  auVar319._16_4_ = auVar116._16_4_ + auVar28._16_4_ * fVar270;
  auVar319._20_4_ = auVar116._20_4_ + auVar28._20_4_ * fVar157;
  auVar319._24_4_ = auVar116._24_4_ + auVar28._24_4_ * fVar182;
  auVar319._28_4_ = auVar116._28_4_ + auVar28._28_4_;
  auVar336._16_16_ = auVar223;
  auVar336._0_16_ = auVar141;
  auVar116 = vcvtdq2ps_avx(auVar336);
  uVar93 = (ulong)(uint)((int)lVar94 << 2);
  lVar98 = uVar92 * 2 + uVar93;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *(ulong *)(prim + lVar98 + 6);
  auVar141 = vpmovsxwd_avx(auVar171);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar98 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar9);
  auVar350._16_16_ = auVar223;
  auVar350._0_16_ = auVar141;
  auVar28 = vcvtdq2ps_avx(auVar350);
  auVar28 = vsubps_avx(auVar28,auVar116);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar93 + 6);
  auVar141 = vpmovsxwd_avx(auVar10);
  auVar337._0_4_ = auVar116._0_4_ + auVar28._0_4_ * fVar270;
  auVar337._4_4_ = auVar116._4_4_ + auVar28._4_4_ * fVar157;
  auVar337._8_4_ = auVar116._8_4_ + auVar28._8_4_ * fVar182;
  auVar337._12_4_ = auVar116._12_4_ + auVar28._12_4_ * fVar340;
  auVar337._16_4_ = auVar116._16_4_ + auVar28._16_4_ * fVar270;
  auVar337._20_4_ = auVar116._20_4_ + auVar28._20_4_ * fVar157;
  auVar337._24_4_ = auVar116._24_4_ + auVar28._24_4_ * fVar182;
  auVar337._28_4_ = auVar116._28_4_ + auVar28._28_4_;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = *(ulong *)(prim + uVar93 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar291);
  auVar351._16_16_ = auVar223;
  auVar351._0_16_ = auVar141;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *(ulong *)(prim + uVar92 * 0x18 + 6);
  auVar141 = vpmovsxwd_avx(auVar227);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar92 * 0x18 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar11);
  auVar116 = vcvtdq2ps_avx(auVar351);
  auVar362._16_16_ = auVar223;
  auVar362._0_16_ = auVar141;
  auVar28 = vcvtdq2ps_avx(auVar362);
  auVar28 = vsubps_avx(auVar28,auVar116);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar92 * 0x1d + 6);
  auVar141 = vpmovsxwd_avx(auVar12);
  auVar352._0_4_ = auVar116._0_4_ + auVar28._0_4_ * fVar270;
  auVar352._4_4_ = auVar116._4_4_ + auVar28._4_4_ * fVar157;
  auVar352._8_4_ = auVar116._8_4_ + auVar28._8_4_ * fVar182;
  auVar352._12_4_ = auVar116._12_4_ + auVar28._12_4_ * fVar340;
  auVar352._16_4_ = auVar116._16_4_ + auVar28._16_4_ * fVar270;
  auVar352._20_4_ = auVar116._20_4_ + auVar28._20_4_ * fVar157;
  auVar352._24_4_ = auVar116._24_4_ + auVar28._24_4_ * fVar182;
  auVar352._28_4_ = auVar116._28_4_ + auVar28._28_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar92 * 0x1d + 0xe);
  auVar223 = vpmovsxwd_avx(auVar13);
  auVar363._16_16_ = auVar223;
  auVar363._0_16_ = auVar141;
  auVar116 = vcvtdq2ps_avx(auVar363);
  lVar98 = uVar92 + (ulong)(byte)PVar20 * 0x20;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar98 + 6);
  auVar141 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + lVar98 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar15);
  auVar381._16_16_ = auVar223;
  auVar381._0_16_ = auVar141;
  auVar28 = vcvtdq2ps_avx(auVar381);
  auVar28 = vsubps_avx(auVar28,auVar116);
  auVar364._0_4_ = auVar116._0_4_ + auVar28._0_4_ * fVar270;
  auVar364._4_4_ = auVar116._4_4_ + auVar28._4_4_ * fVar157;
  auVar364._8_4_ = auVar116._8_4_ + auVar28._8_4_ * fVar182;
  auVar364._12_4_ = auVar116._12_4_ + auVar28._12_4_ * fVar340;
  auVar364._16_4_ = auVar116._16_4_ + auVar28._16_4_ * fVar270;
  auVar364._20_4_ = auVar116._20_4_ + auVar28._20_4_ * fVar157;
  auVar364._24_4_ = auVar116._24_4_ + auVar28._24_4_ * fVar182;
  auVar364._28_4_ = auVar116._28_4_ + auVar28._28_4_;
  lVar98 = (ulong)(byte)PVar20 * 0x20 - uVar92;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + lVar98 + 6);
  auVar141 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar98 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar17);
  auVar382._16_16_ = auVar223;
  auVar382._0_16_ = auVar141;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar92 * 0x23 + 6);
  auVar141 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar92 * 0x23 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar19);
  auVar116 = vcvtdq2ps_avx(auVar382);
  auVar400._16_16_ = auVar223;
  auVar400._0_16_ = auVar141;
  auVar28 = vcvtdq2ps_avx(auVar400);
  auVar28 = vsubps_avx(auVar28,auVar116);
  auVar383._0_4_ = auVar116._0_4_ + auVar28._0_4_ * fVar270;
  auVar383._4_4_ = auVar116._4_4_ + auVar28._4_4_ * fVar157;
  auVar383._8_4_ = auVar116._8_4_ + auVar28._8_4_ * fVar182;
  auVar383._12_4_ = auVar116._12_4_ + auVar28._12_4_ * fVar340;
  auVar383._16_4_ = auVar116._16_4_ + auVar28._16_4_ * fVar270;
  auVar383._20_4_ = auVar116._20_4_ + auVar28._20_4_ * fVar157;
  auVar383._24_4_ = auVar116._24_4_ + auVar28._24_4_ * fVar182;
  auVar383._28_4_ = auVar116._28_4_ + fVar340;
  auVar116 = vsubps_avx(auVar299,auVar151);
  auVar271._0_4_ = fVar184 * auVar116._0_4_;
  auVar271._4_4_ = fVar213 * auVar116._4_4_;
  auVar271._8_4_ = fVar214 * auVar116._8_4_;
  auVar271._12_4_ = fVar215 * auVar116._12_4_;
  auVar34._16_4_ = fVar216 * auVar116._16_4_;
  auVar34._0_16_ = auVar271;
  auVar34._20_4_ = fVar217 * auVar116._20_4_;
  auVar34._24_4_ = fVar218 * auVar116._24_4_;
  auVar34._28_4_ = auVar116._28_4_;
  auVar116 = vsubps_avx(auVar319,auVar151);
  auVar185._0_4_ = fVar184 * auVar116._0_4_;
  auVar185._4_4_ = fVar213 * auVar116._4_4_;
  auVar185._8_4_ = fVar214 * auVar116._8_4_;
  auVar185._12_4_ = fVar215 * auVar116._12_4_;
  auVar35._16_4_ = fVar216 * auVar116._16_4_;
  auVar35._0_16_ = auVar185;
  auVar35._20_4_ = fVar217 * auVar116._20_4_;
  auVar35._24_4_ = fVar218 * auVar116._24_4_;
  auVar35._28_4_ = auVar30._28_4_ + auVar32._28_4_;
  auVar116 = vsubps_avx(auVar337,auVar117);
  auVar127._0_4_ = fVar219 * auVar116._0_4_;
  auVar127._4_4_ = fVar183 * auVar116._4_4_;
  auVar127._8_4_ = fVar242 * auVar116._8_4_;
  auVar127._12_4_ = fVar243 * auVar116._12_4_;
  auVar30._16_4_ = fVar245 * auVar116._16_4_;
  auVar30._0_16_ = auVar127;
  auVar30._20_4_ = fVar246 * auVar116._20_4_;
  auVar30._24_4_ = fVar247 * auVar116._24_4_;
  auVar30._28_4_ = auVar116._28_4_;
  auVar116 = vsubps_avx(auVar352,auVar117);
  auVar220._0_4_ = fVar219 * auVar116._0_4_;
  auVar220._4_4_ = fVar183 * auVar116._4_4_;
  auVar220._8_4_ = fVar242 * auVar116._8_4_;
  auVar220._12_4_ = fVar243 * auVar116._12_4_;
  auVar32._16_4_ = fVar245 * auVar116._16_4_;
  auVar32._0_16_ = auVar220;
  auVar32._20_4_ = fVar246 * auVar116._20_4_;
  auVar32._24_4_ = fVar247 * auVar116._24_4_;
  auVar32._28_4_ = auVar31._28_4_ + auVar29._28_4_;
  auVar116 = vsubps_avx(auVar364,auVar177);
  auVar100._0_4_ = fVar248 * auVar116._0_4_;
  auVar100._4_4_ = fVar264 * auVar116._4_4_;
  auVar100._8_4_ = fVar265 * auVar116._8_4_;
  auVar100._12_4_ = fVar266 * auVar116._12_4_;
  auVar29._16_4_ = fVar267 * auVar116._16_4_;
  auVar29._0_16_ = auVar100;
  auVar29._20_4_ = fVar268 * auVar116._20_4_;
  auVar29._24_4_ = fVar269 * auVar116._24_4_;
  auVar29._28_4_ = auVar116._28_4_;
  auVar116 = vsubps_avx(auVar383,auVar177);
  auVar158._0_4_ = fVar248 * auVar116._0_4_;
  auVar158._4_4_ = fVar264 * auVar116._4_4_;
  auVar158._8_4_ = fVar265 * auVar116._8_4_;
  auVar158._12_4_ = fVar266 * auVar116._12_4_;
  auVar38._16_4_ = fVar267 * auVar116._16_4_;
  auVar38._0_16_ = auVar158;
  auVar38._20_4_ = fVar268 * auVar116._20_4_;
  auVar38._24_4_ = fVar269 * auVar116._24_4_;
  auVar38._28_4_ = auVar116._28_4_;
  auVar141 = vpminsd_avx(auVar34._16_16_,auVar35._16_16_);
  auVar223 = vpminsd_avx(auVar271,auVar185);
  auVar320._16_16_ = auVar141;
  auVar320._0_16_ = auVar223;
  auVar141 = vpminsd_avx(auVar30._16_16_,auVar32._16_16_);
  auVar223 = vpminsd_avx(auVar127,auVar220);
  auVar365._16_16_ = auVar141;
  auVar365._0_16_ = auVar223;
  auVar116 = vmaxps_avx(auVar320,auVar365);
  auVar141 = vpminsd_avx(auVar29._16_16_,auVar38._16_16_);
  auVar223 = vpminsd_avx(auVar100,auVar158);
  auVar401._16_16_ = auVar141;
  auVar401._0_16_ = auVar223;
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar407._4_4_ = uVar4;
  auVar407._0_4_ = uVar4;
  auVar407._8_4_ = uVar4;
  auVar407._12_4_ = uVar4;
  auVar407._16_4_ = uVar4;
  auVar407._20_4_ = uVar4;
  auVar407._24_4_ = uVar4;
  auVar407._28_4_ = uVar4;
  auVar28 = vmaxps_avx(auVar401,auVar407);
  auVar116 = vmaxps_avx(auVar116,auVar28);
  local_2c0._4_4_ = auVar116._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar116._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar116._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar116._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar116._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar116._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar116._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar116._28_4_;
  auVar141 = vpmaxsd_avx(auVar34._16_16_,auVar35._16_16_);
  auVar223 = vpmaxsd_avx(auVar271,auVar185);
  auVar208._16_16_ = auVar141;
  auVar208._0_16_ = auVar223;
  auVar141 = vpmaxsd_avx(auVar30._16_16_,auVar32._16_16_);
  auVar223 = vpmaxsd_avx(auVar127,auVar220);
  auVar152._16_16_ = auVar141;
  auVar152._0_16_ = auVar223;
  auVar116 = vminps_avx(auVar208,auVar152);
  auVar141 = vpmaxsd_avx(auVar29._16_16_,auVar38._16_16_);
  auVar223 = vpmaxsd_avx(auVar100,auVar158);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar178._4_4_ = uVar4;
  auVar178._0_4_ = uVar4;
  auVar178._8_4_ = uVar4;
  auVar178._12_4_ = uVar4;
  auVar178._16_4_ = uVar4;
  auVar178._20_4_ = uVar4;
  auVar178._24_4_ = uVar4;
  auVar178._28_4_ = uVar4;
  auVar118._16_16_ = auVar141;
  auVar118._0_16_ = auVar223;
  auVar28 = vminps_avx(auVar118,auVar178);
  auVar116 = vminps_avx(auVar116,auVar28);
  auVar39._4_4_ = auVar116._4_4_ * 1.0000004;
  auVar39._0_4_ = auVar116._0_4_ * 1.0000004;
  auVar39._8_4_ = auVar116._8_4_ * 1.0000004;
  auVar39._12_4_ = auVar116._12_4_ * 1.0000004;
  auVar39._16_4_ = auVar116._16_4_ * 1.0000004;
  auVar39._20_4_ = auVar116._20_4_ * 1.0000004;
  auVar39._24_4_ = auVar116._24_4_ * 1.0000004;
  auVar39._28_4_ = auVar116._28_4_;
  auVar116 = vcmpps_avx(local_2c0,auVar39,2);
  auVar141 = vpshufd_avx(ZEXT116((byte)PVar20),0);
  auVar153._16_16_ = auVar141;
  auVar153._0_16_ = auVar141;
  auVar28 = vcvtdq2ps_avx(auVar153);
  auVar28 = vcmpps_avx(_DAT_02020f40,auVar28,1);
  auVar116 = vandps_avx(auVar116,auVar28);
  uVar89 = vmovmskps_avx(auVar116);
  if (uVar89 == 0) {
    return;
  }
  uVar89 = uVar89 & 0xff;
  auVar119._16_16_ = mm_lookupmask_ps._240_16_;
  auVar119._0_16_ = mm_lookupmask_ps._240_16_;
  local_340 = vblendps_avx(auVar119,ZEXT832(0) << 0x20,0x80);
  uVar90 = 1 << ((byte)k & 0x1f);
  uVar92 = (ulong)((uVar90 & 0xf) << 4);
  lVar98 = (long)((int)uVar90 >> 4) * 0x10;
  auVar408 = ZEXT464(0) << 0x20;
LAB_0123f677:
  lVar94 = 0;
  if (uVar89 != 0) {
    for (; (uVar89 >> lVar94 & 1) == 0; lVar94 = lVar94 + 1) {
    }
  }
  uVar90 = *(uint *)(prim + 2);
  pGVar22 = (context->scene->geometries).items[uVar90].ptr;
  fVar184 = (pGVar22->time_range).lower;
  fVar270 = pGVar22->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar184) / ((pGVar22->time_range).upper - fVar184));
  auVar141 = vroundss_avx(ZEXT416((uint)fVar270),ZEXT416((uint)fVar270),9);
  auVar141 = vminss_avx(auVar141,ZEXT416((uint)(pGVar22->fnumTimeSegments + -1.0)));
  auVar141 = vmaxss_avx(ZEXT816(0) << 0x20,auVar141);
  uVar21 = *(uint *)(prim + lVar94 * 4 + 6);
  uVar93 = (ulong)*(uint *)(*(long *)&pGVar22->field_0x58 +
                           (ulong)uVar21 *
                           pGVar22[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var23 = pGVar22[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar97 = (long)(int)auVar141._0_4_ * 0x38;
  lVar24 = *(long *)(_Var23 + lVar97);
  lVar25 = *(long *)(_Var23 + 0x10 + lVar97);
  pfVar2 = (float *)(lVar24 + lVar25 * uVar93);
  fVar213 = *pfVar2;
  fVar183 = pfVar2[1];
  fVar157 = pfVar2[2];
  fVar214 = pfVar2[3];
  lVar94 = uVar93 + 1;
  pfVar2 = (float *)(lVar24 + lVar25 * lVar94);
  fVar242 = *pfVar2;
  fVar182 = pfVar2[1];
  fVar215 = pfVar2[2];
  fVar243 = pfVar2[3];
  lVar99 = uVar93 + 2;
  pfVar2 = (float *)(lVar24 + lVar25 * lVar99);
  fVar340 = *pfVar2;
  fVar216 = pfVar2[1];
  fVar245 = pfVar2[2];
  fVar217 = pfVar2[3];
  lVar1 = uVar93 + 3;
  pfVar2 = (float *)(lVar24 + lVar25 * lVar1);
  fVar246 = *pfVar2;
  fVar218 = pfVar2[1];
  fVar247 = pfVar2[2];
  fVar248 = pfVar2[3];
  lVar24 = *(long *)&pGVar22[4].fnumTimeSegments;
  lVar25 = *(long *)(lVar24 + lVar97);
  lVar26 = *(long *)(lVar24 + 0x10 + lVar97);
  auVar223 = *(undefined1 (*) [16])(lVar25 + lVar26 * uVar93);
  pfVar2 = (float *)(lVar25 + lVar26 * lVar94);
  fVar264 = *pfVar2;
  fVar265 = pfVar2[1];
  fVar266 = pfVar2[2];
  fVar267 = pfVar2[3];
  pfVar2 = (float *)(lVar25 + lVar26 * lVar99);
  fVar268 = *pfVar2;
  fVar269 = pfVar2[1];
  fVar339 = pfVar2[2];
  fVar341 = pfVar2[3];
  fVar270 = fVar270 - auVar141._0_4_;
  pfVar2 = (float *)(lVar25 + lVar26 * lVar1);
  fVar342 = *pfVar2;
  fVar36 = pfVar2[1];
  fVar366 = pfVar2[2];
  fVar241 = pfVar2[3];
  fVar184 = auVar408._8_4_;
  fVar219 = auVar408._12_4_;
  local_730._0_4_ =
       fVar213 * 0.16666667 + fVar242 * 0.6666667 + fVar340 * 0.16666667 + fVar246 * 0.0;
  local_730._4_4_ =
       fVar183 * 0.16666667 + fVar182 * 0.6666667 + fVar216 * 0.16666667 + fVar218 * 0.0;
  fStack_728 = fVar157 * 0.16666667 + fVar215 * 0.6666667 + fVar245 * 0.16666667 + fVar247 * fVar184
  ;
  fStack_724 = fVar214 * 0.16666667 + fVar243 * 0.6666667 + fVar217 * 0.16666667 + fVar248 * fVar219
  ;
  auVar101._0_4_ = fVar340 * 0.5 + fVar246 * 0.0;
  auVar101._4_4_ = fVar216 * 0.5 + fVar218 * 0.0;
  auVar101._8_4_ = fVar245 * 0.5 + fVar247 * fVar184;
  auVar101._12_4_ = fVar217 * 0.5 + fVar248 * fVar219;
  auVar159._0_4_ = fVar242 * 0.0;
  auVar159._4_4_ = fVar182 * 0.0;
  auVar159._8_4_ = fVar184 * fVar215;
  auVar159._12_4_ = fVar219 * fVar243;
  auVar141 = vsubps_avx(auVar101,auVar159);
  auVar160._0_4_ = fVar213 * 0.5;
  auVar160._4_4_ = fVar183 * 0.5;
  auVar160._8_4_ = fVar157 * 0.5;
  auVar160._12_4_ = fVar214 * 0.5;
  auVar140 = vsubps_avx(auVar141,auVar160);
  local_6a0._0_4_ = auVar223._0_4_;
  local_6a0._4_4_ = auVar223._4_4_;
  fStack_698 = auVar223._8_4_;
  fStack_694 = auVar223._12_4_;
  auVar102._0_4_ =
       (float)local_6a0._0_4_ * 0.16666667 +
       fVar264 * 0.6666667 + fVar268 * 0.16666667 + fVar342 * 0.0;
  auVar102._4_4_ =
       (float)local_6a0._4_4_ * 0.16666667 +
       fVar265 * 0.6666667 + fVar269 * 0.16666667 + fVar36 * 0.0;
  auVar102._8_4_ =
       fStack_698 * 0.16666667 + fVar266 * 0.6666667 + fVar339 * 0.16666667 + fVar366 * fVar184;
  auVar102._12_4_ =
       fStack_694 * 0.16666667 + fVar267 * 0.6666667 + fVar341 * 0.16666667 + fVar241 * fVar219;
  auVar272._0_4_ = fVar268 * 0.5 + fVar342 * 0.0;
  auVar272._4_4_ = fVar269 * 0.5 + fVar36 * 0.0;
  auVar272._8_4_ = fVar339 * 0.5 + fVar366 * fVar184;
  auVar272._12_4_ = fVar341 * 0.5 + fVar241 * fVar219;
  auVar373._0_4_ = fVar264 * 0.0;
  auVar373._4_4_ = fVar265 * 0.0;
  auVar373._8_4_ = fVar184 * fVar266;
  auVar373._12_4_ = fVar219 * fVar267;
  auVar141 = vsubps_avx(auVar272,auVar373);
  auVar374._0_4_ = (float)local_6a0._0_4_ * 0.5;
  auVar374._4_4_ = (float)local_6a0._4_4_ * 0.5;
  auVar374._8_4_ = fStack_698 * 0.5;
  auVar374._12_4_ = fStack_694 * 0.5;
  auVar7 = vsubps_avx(auVar141,auVar374);
  auVar221._0_4_ = fVar213 * 0.0;
  auVar221._4_4_ = fVar183 * 0.0;
  auVar221._8_4_ = fVar184 * fVar157;
  auVar221._12_4_ = fVar219 * fVar214;
  auVar273._0_4_ =
       auVar221._0_4_ + fVar242 * 0.16666667 + fVar340 * 0.6666667 + fVar246 * 0.16666667;
  auVar273._4_4_ =
       auVar221._4_4_ + fVar182 * 0.16666667 + fVar216 * 0.6666667 + fVar218 * 0.16666667;
  auVar273._8_4_ =
       auVar221._8_4_ + fVar215 * 0.16666667 + fVar245 * 0.6666667 + fVar247 * 0.16666667;
  auVar273._12_4_ =
       auVar221._12_4_ + fVar243 * 0.16666667 + fVar217 * 0.6666667 + fVar248 * 0.16666667;
  auVar286._0_4_ = fVar246 * 0.5 + fVar340 * 0.0;
  auVar286._4_4_ = fVar218 * 0.5 + fVar216 * 0.0;
  auVar286._8_4_ = fVar247 * 0.5 + fVar184 * fVar245;
  auVar286._12_4_ = fVar248 * 0.5 + fVar219 * fVar217;
  auVar186._0_4_ = fVar242 * 0.5;
  auVar186._4_4_ = fVar182 * 0.5;
  auVar186._8_4_ = fVar215 * 0.5;
  auVar186._12_4_ = fVar243 * 0.5;
  auVar141 = vsubps_avx(auVar286,auVar186);
  auVar201 = vsubps_avx(auVar141,auVar221);
  auVar222._0_4_ = (float)local_6a0._0_4_ * 0.0;
  auVar222._4_4_ = (float)local_6a0._4_4_ * 0.0;
  auVar222._8_4_ = fVar184 * fStack_698;
  auVar222._12_4_ = fVar219 * fStack_694;
  auVar187._0_4_ =
       auVar222._0_4_ + fVar264 * 0.16666667 + fVar268 * 0.6666667 + fVar342 * 0.16666667;
  auVar187._4_4_ = auVar222._4_4_ + fVar265 * 0.16666667 + fVar269 * 0.6666667 + fVar36 * 0.16666667
  ;
  auVar187._8_4_ =
       auVar222._8_4_ + fVar266 * 0.16666667 + fVar339 * 0.6666667 + fVar366 * 0.16666667;
  auVar187._12_4_ =
       auVar222._12_4_ + fVar267 * 0.16666667 + fVar341 * 0.6666667 + fVar241 * 0.16666667;
  auVar287._0_4_ = fVar268 * 0.0 + fVar342 * 0.5;
  auVar287._4_4_ = fVar269 * 0.0 + fVar36 * 0.5;
  auVar287._8_4_ = fVar339 * fVar184 + fVar366 * 0.5;
  auVar287._12_4_ = fVar341 * fVar219 + fVar241 * 0.5;
  auVar250._0_4_ = fVar264 * 0.5;
  auVar250._4_4_ = fVar265 * 0.5;
  auVar250._8_4_ = fVar266 * 0.5;
  auVar250._12_4_ = fVar267 * 0.5;
  auVar141 = vsubps_avx(auVar287,auVar250);
  auVar8 = vsubps_avx(auVar141,auVar222);
  auVar141 = vshufps_avx(auVar140,auVar140,0xc9);
  auVar223 = vshufps_avx(auVar102,auVar102,0xc9);
  fVar241 = auVar140._0_4_;
  auVar251._0_4_ = fVar241 * auVar223._0_4_;
  fVar367 = auVar140._4_4_;
  auVar251._4_4_ = fVar367 * auVar223._4_4_;
  fVar244 = auVar140._8_4_;
  auVar251._8_4_ = fVar244 * auVar223._8_4_;
  fVar368 = auVar140._12_4_;
  auVar251._12_4_ = fVar368 * auVar223._12_4_;
  auVar103._0_4_ = auVar141._0_4_ * auVar102._0_4_;
  auVar103._4_4_ = auVar141._4_4_ * auVar102._4_4_;
  auVar103._8_4_ = auVar141._8_4_ * auVar102._8_4_;
  auVar103._12_4_ = auVar141._12_4_ * auVar102._12_4_;
  auVar223 = vsubps_avx(auVar103,auVar251);
  auVar261 = vshufps_avx(auVar223,auVar223,0xc9);
  auVar223 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar104._0_4_ = fVar241 * auVar223._0_4_;
  auVar104._4_4_ = fVar367 * auVar223._4_4_;
  auVar104._8_4_ = fVar244 * auVar223._8_4_;
  auVar104._12_4_ = fVar368 * auVar223._12_4_;
  auVar288._0_4_ = auVar7._0_4_ * auVar141._0_4_;
  auVar288._4_4_ = auVar7._4_4_ * auVar141._4_4_;
  auVar288._8_4_ = auVar7._8_4_ * auVar141._8_4_;
  auVar288._12_4_ = auVar7._12_4_ * auVar141._12_4_;
  auVar141 = vsubps_avx(auVar288,auVar104);
  auVar7 = vshufps_avx(auVar141,auVar141,0xc9);
  auVar141 = vshufps_avx(auVar201,auVar201,0xc9);
  auVar223 = vshufps_avx(auVar187,auVar187,0xc9);
  fVar369 = auVar201._0_4_;
  auVar301._0_4_ = fVar369 * auVar223._0_4_;
  fVar370 = auVar201._4_4_;
  auVar301._4_4_ = fVar370 * auVar223._4_4_;
  fVar371 = auVar201._8_4_;
  auVar301._8_4_ = fVar371 * auVar223._8_4_;
  fVar283 = auVar201._12_4_;
  auVar301._12_4_ = fVar283 * auVar223._12_4_;
  auVar188._0_4_ = auVar141._0_4_ * auVar187._0_4_;
  auVar188._4_4_ = auVar141._4_4_ * auVar187._4_4_;
  auVar188._8_4_ = auVar141._8_4_ * auVar187._8_4_;
  auVar188._12_4_ = auVar141._12_4_ * auVar187._12_4_;
  auVar223 = vsubps_avx(auVar188,auVar301);
  auVar37 = vshufps_avx(auVar223,auVar223,0xc9);
  auVar223 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar302._0_4_ = fVar369 * auVar223._0_4_;
  auVar302._4_4_ = fVar370 * auVar223._4_4_;
  auVar302._8_4_ = fVar371 * auVar223._8_4_;
  auVar302._12_4_ = fVar283 * auVar223._12_4_;
  auVar105._0_4_ = auVar141._0_4_ * auVar8._0_4_;
  auVar105._4_4_ = auVar141._4_4_ * auVar8._4_4_;
  auVar105._8_4_ = auVar141._8_4_ * auVar8._8_4_;
  auVar105._12_4_ = auVar141._12_4_ * auVar8._12_4_;
  auVar141 = vdpps_avx(auVar261,auVar261,0x7f);
  auVar223 = vsubps_avx(auVar105,auVar302);
  auVar8 = vshufps_avx(auVar223,auVar223,0xc9);
  fVar219 = auVar141._0_4_;
  auVar303._4_12_ = auVar408._4_12_;
  auVar303._0_4_ = fVar219;
  auVar223 = vrsqrtss_avx(auVar303,auVar303);
  fVar184 = auVar223._0_4_;
  auVar223 = ZEXT416((uint)(fVar184 * 1.5 - fVar219 * 0.5 * fVar184 * fVar184 * fVar184));
  auVar202 = vshufps_avx(auVar223,auVar223,0);
  fVar248 = auVar202._0_4_ * auVar261._0_4_;
  fVar264 = auVar202._4_4_ * auVar261._4_4_;
  fVar265 = auVar202._8_4_ * auVar261._8_4_;
  fVar266 = auVar202._12_4_ * auVar261._12_4_;
  auVar223 = vdpps_avx(auVar261,auVar7,0x7f);
  auVar141 = vshufps_avx(auVar141,auVar141,0);
  auVar289._0_4_ = auVar141._0_4_ * auVar7._0_4_;
  auVar289._4_4_ = auVar141._4_4_ * auVar7._4_4_;
  auVar289._8_4_ = auVar141._8_4_ * auVar7._8_4_;
  auVar289._12_4_ = auVar141._12_4_ * auVar7._12_4_;
  auVar141 = vshufps_avx(auVar223,auVar223,0);
  auVar252._0_4_ = auVar141._0_4_ * auVar261._0_4_;
  auVar252._4_4_ = auVar141._4_4_ * auVar261._4_4_;
  auVar252._8_4_ = auVar141._8_4_ * auVar261._8_4_;
  auVar252._12_4_ = auVar141._12_4_ * auVar261._12_4_;
  auVar114 = vsubps_avx(auVar289,auVar252);
  auVar141 = vrcpss_avx(auVar303,auVar303);
  auVar141 = ZEXT416((uint)((2.0 - fVar219 * auVar141._0_4_) * auVar141._0_4_));
  auVar261 = vshufps_avx(auVar141,auVar141,0);
  auVar141 = vdpps_avx(auVar37,auVar37,0x7f);
  fVar267 = auVar141._0_4_;
  auVar304._4_12_ = auVar408._4_12_;
  auVar304._0_4_ = fVar267;
  auVar223 = vrsqrtss_avx(auVar304,auVar304);
  fVar217 = auVar223._0_4_;
  auVar223 = vdpps_avx(auVar37,auVar8,0x7f);
  auVar141 = vshufps_avx(auVar141,auVar141,0);
  auVar411._0_4_ = auVar141._0_4_ * auVar8._0_4_;
  auVar411._4_4_ = auVar141._4_4_ * auVar8._4_4_;
  auVar411._8_4_ = auVar141._8_4_ * auVar8._8_4_;
  auVar411._12_4_ = auVar141._12_4_ * auVar8._12_4_;
  lVar25 = *(long *)(_Var23 + 0x38 + lVar97);
  lVar26 = *(long *)(_Var23 + 0x48 + lVar97);
  pauVar3 = (undefined1 (*) [12])(lVar25 + lVar26 * uVar93);
  auVar88 = *pauVar3;
  fVar184 = *(float *)pauVar3[1];
  pfVar2 = (float *)(lVar25 + lVar26 * lVar94);
  fVar219 = *pfVar2;
  fVar213 = pfVar2[1];
  fVar183 = pfVar2[2];
  fVar157 = pfVar2[3];
  pfVar2 = (float *)(lVar25 + lVar26 * lVar99);
  fVar214 = *pfVar2;
  fVar242 = pfVar2[1];
  fVar182 = pfVar2[2];
  fVar215 = pfVar2[3];
  auVar141 = vshufps_avx(auVar223,auVar223,0);
  auVar106._0_4_ = auVar141._0_4_ * auVar37._0_4_;
  auVar106._4_4_ = auVar141._4_4_ * auVar37._4_4_;
  auVar106._8_4_ = auVar141._8_4_ * auVar37._8_4_;
  auVar106._12_4_ = auVar141._12_4_ * auVar37._12_4_;
  auVar8 = vsubps_avx(auVar411,auVar106);
  pfVar2 = (float *)(lVar25 + lVar26 * lVar1);
  fVar243 = *pfVar2;
  fVar340 = pfVar2[1];
  fVar216 = pfVar2[2];
  fVar245 = pfVar2[3];
  lVar25 = *(long *)(lVar24 + 0x38 + lVar97);
  lVar24 = *(long *)(lVar24 + 0x48 + lVar97);
  auVar141 = ZEXT416((uint)(fVar217 * 1.5 - fVar267 * 0.5 * fVar217 * fVar217 * fVar217));
  auVar223 = vshufps_avx(auVar141,auVar141,0);
  fVar217 = auVar223._0_4_ * auVar37._0_4_;
  fVar246 = auVar223._4_4_ * auVar37._4_4_;
  fVar218 = auVar223._8_4_ * auVar37._8_4_;
  fVar247 = auVar223._12_4_ * auVar37._12_4_;
  auVar141 = vrcpss_avx(auVar304,auVar304);
  auVar141 = ZEXT416((uint)(auVar141._0_4_ * (2.0 - auVar141._0_4_ * fVar267)));
  auVar141 = vshufps_avx(auVar141,auVar141,0);
  auVar7 = vshufps_avx(_local_730,_local_730,0xff);
  auVar343._0_4_ = auVar7._0_4_ * fVar248;
  auVar343._4_4_ = auVar7._4_4_ * fVar264;
  auVar343._8_4_ = auVar7._8_4_ * fVar265;
  auVar343._12_4_ = auVar7._12_4_ * fVar266;
  auVar37 = vshufps_avx(auVar140,auVar140,0xff);
  auVar171 = vsubps_avx(_local_730,auVar343);
  auVar224._0_4_ =
       auVar37._0_4_ * fVar248 + auVar7._0_4_ * auVar202._0_4_ * auVar114._0_4_ * auVar261._0_4_;
  auVar224._4_4_ =
       auVar37._4_4_ * fVar264 + auVar7._4_4_ * auVar202._4_4_ * auVar114._4_4_ * auVar261._4_4_;
  auVar224._8_4_ =
       auVar37._8_4_ * fVar265 + auVar7._8_4_ * auVar202._8_4_ * auVar114._8_4_ * auVar261._8_4_;
  auVar224._12_4_ =
       auVar37._12_4_ * fVar266 +
       auVar7._12_4_ * auVar202._12_4_ * auVar114._12_4_ * auVar261._12_4_;
  auVar202 = vsubps_avx(auVar140,auVar224);
  local_730._0_4_ = (float)local_730._0_4_ + auVar343._0_4_;
  local_730._4_4_ = (float)local_730._4_4_ + auVar343._4_4_;
  fStack_728 = fStack_728 + auVar343._8_4_;
  fStack_724 = fStack_724 + auVar343._12_4_;
  auVar261 = vshufps_avx(auVar273,auVar273,0xff);
  auVar161._0_4_ = auVar261._0_4_ * fVar217;
  auVar161._4_4_ = auVar261._4_4_ * fVar246;
  auVar161._8_4_ = auVar261._8_4_ * fVar218;
  auVar161._12_4_ = auVar261._12_4_ * fVar247;
  auVar7 = vshufps_avx(auVar201,auVar201,0xff);
  auVar140 = vsubps_avx(auVar273,auVar161);
  auVar107._0_4_ =
       auVar7._0_4_ * fVar217 + auVar261._0_4_ * auVar223._0_4_ * auVar8._0_4_ * auVar141._0_4_;
  auVar107._4_4_ =
       auVar7._4_4_ * fVar246 + auVar261._4_4_ * auVar223._4_4_ * auVar8._4_4_ * auVar141._4_4_;
  auVar107._8_4_ =
       auVar7._8_4_ * fVar218 + auVar261._8_4_ * auVar223._8_4_ * auVar8._8_4_ * auVar141._8_4_;
  auVar107._12_4_ =
       auVar7._12_4_ * fVar247 + auVar261._12_4_ * auVar223._12_4_ * auVar8._12_4_ * auVar141._12_4_
  ;
  auVar201 = vsubps_avx(auVar201,auVar107);
  local_6a0._4_4_ = auVar273._4_4_ + auVar161._4_4_;
  local_6a0._0_4_ = auVar273._0_4_ + auVar161._0_4_;
  fStack_698 = auVar273._8_4_ + auVar161._8_4_;
  fStack_694 = auVar273._12_4_ + auVar161._12_4_;
  local_6e0._0_4_ =
       *(float *)*pauVar3 * 0.16666667 + fVar219 * 0.6666667 + fVar214 * 0.16666667 + fVar243 * 0.0;
  local_6e0._4_4_ =
       *(float *)(*pauVar3 + 4) * 0.16666667 +
       fVar213 * 0.6666667 + fVar242 * 0.16666667 + fVar340 * 0.0;
  fStack_6d8 = *(float *)(*pauVar3 + 8) * 0.16666667 +
               fVar183 * 0.6666667 + fVar182 * 0.16666667 + fVar216 * 0.0;
  fStack_6d4 = fVar184 * 0.16666667 + fVar157 * 0.6666667 + fVar215 * 0.16666667 + fVar245 * 0.0;
  auVar108._0_4_ = fVar214 * 0.5 + fVar243 * 0.0;
  auVar108._4_4_ = fVar242 * 0.5 + fVar340 * 0.0;
  auVar108._8_4_ = fVar182 * 0.5 + fVar216 * 0.0;
  auVar108._12_4_ = fVar215 * 0.5 + fVar245 * 0.0;
  auVar128._0_4_ = fVar219 * 0.0;
  auVar128._4_4_ = fVar213 * 0.0;
  auVar128._8_4_ = fVar183 * 0.0;
  auVar128._12_4_ = fVar157 * 0.0;
  auVar141 = vsubps_avx(auVar108,auVar128);
  auVar129._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar129._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar129._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar129._12_4_ = fVar184 * 0.5;
  auVar114 = vsubps_avx(auVar141,auVar129);
  pfVar2 = (float *)(lVar25 + lVar99 * lVar24);
  fVar217 = *pfVar2;
  fVar246 = pfVar2[1];
  fVar218 = pfVar2[2];
  fVar247 = pfVar2[3];
  pfVar2 = (float *)(lVar25 + lVar24 * lVar1);
  fVar248 = *pfVar2;
  fVar264 = pfVar2[1];
  fVar265 = pfVar2[2];
  fVar266 = pfVar2[3];
  pfVar2 = (float *)(lVar25 + lVar94 * lVar24);
  fVar267 = *pfVar2;
  fVar268 = pfVar2[1];
  fVar269 = pfVar2[2];
  fVar339 = pfVar2[3];
  pfVar2 = (float *)(lVar25 + uVar93 * lVar24);
  fVar341 = *pfVar2;
  fVar342 = pfVar2[1];
  fVar36 = pfVar2[2];
  fVar366 = pfVar2[3];
  auVar225._0_4_ = fVar341 * 0.16666667 + fVar267 * 0.6666667 + fVar217 * 0.16666667 + fVar248 * 0.0
  ;
  auVar225._4_4_ = fVar342 * 0.16666667 + fVar268 * 0.6666667 + fVar246 * 0.16666667 + fVar264 * 0.0
  ;
  auVar225._8_4_ = fVar36 * 0.16666667 + fVar269 * 0.6666667 + fVar218 * 0.16666667 + fVar265 * 0.0;
  auVar225._12_4_ =
       fVar366 * 0.16666667 + fVar339 * 0.6666667 + fVar247 * 0.16666667 + fVar266 * 0.0;
  auVar189._0_4_ = fVar217 * 0.5 + fVar248 * 0.0;
  auVar189._4_4_ = fVar246 * 0.5 + fVar264 * 0.0;
  auVar189._8_4_ = fVar218 * 0.5 + fVar265 * 0.0;
  auVar189._12_4_ = fVar247 * 0.5 + fVar266 * 0.0;
  auVar305._0_4_ = fVar267 * 0.0;
  auVar305._4_4_ = fVar268 * 0.0;
  auVar305._8_4_ = fVar269 * 0.0;
  auVar305._12_4_ = fVar339 * 0.0;
  auVar141 = vsubps_avx(auVar189,auVar305);
  auVar306._0_4_ = fVar341 * 0.5;
  auVar306._4_4_ = fVar342 * 0.5;
  auVar306._8_4_ = fVar36 * 0.5;
  auVar306._12_4_ = fVar366 * 0.5;
  auVar223 = vsubps_avx(auVar141,auVar306);
  auVar307._0_4_ = fVar214 * 0.0 + fVar243 * 0.5;
  auVar307._4_4_ = fVar242 * 0.0 + fVar340 * 0.5;
  auVar307._8_4_ = fVar182 * 0.0 + fVar216 * 0.5;
  auVar307._12_4_ = fVar215 * 0.0 + fVar245 * 0.5;
  auVar375._0_4_ = fVar219 * 0.5;
  auVar375._4_4_ = fVar213 * 0.5;
  auVar375._8_4_ = fVar183 * 0.5;
  auVar375._12_4_ = fVar157 * 0.5;
  auVar141 = vsubps_avx(auVar307,auVar375);
  local_720 = auVar88._0_4_;
  fStack_71c = auVar88._4_4_;
  fStack_718 = auVar88._8_4_;
  auVar354._0_4_ = local_720 * 0.0;
  auVar354._4_4_ = fStack_71c * 0.0;
  auVar354._8_4_ = fStack_718 * 0.0;
  auVar354._12_4_ = fVar184 * 0.0;
  auVar376._0_4_ =
       auVar354._0_4_ + fVar219 * 0.16666667 + fVar243 * 0.16666667 + fVar214 * 0.6666667;
  auVar376._4_4_ =
       auVar354._4_4_ + fVar213 * 0.16666667 + fVar340 * 0.16666667 + fVar242 * 0.6666667;
  auVar376._8_4_ =
       auVar354._8_4_ + fVar183 * 0.16666667 + fVar216 * 0.16666667 + fVar182 * 0.6666667;
  auVar376._12_4_ =
       auVar354._12_4_ + fVar157 * 0.16666667 + fVar245 * 0.16666667 + fVar215 * 0.6666667;
  auVar9 = vsubps_avx(auVar141,auVar354);
  auVar162._0_4_ = fVar217 * 0.0 + fVar248 * 0.5;
  auVar162._4_4_ = fVar246 * 0.0 + fVar264 * 0.5;
  auVar162._8_4_ = fVar218 * 0.0 + fVar265 * 0.5;
  auVar162._12_4_ = fVar247 * 0.0 + fVar266 * 0.5;
  auVar109._0_4_ = fVar267 * 0.5;
  auVar109._4_4_ = fVar268 * 0.5;
  auVar109._8_4_ = fVar269 * 0.5;
  auVar109._12_4_ = fVar339 * 0.5;
  auVar141 = vsubps_avx(auVar162,auVar109);
  auVar130._0_4_ = fVar341 * 0.0;
  auVar130._4_4_ = fVar342 * 0.0;
  auVar130._8_4_ = fVar36 * 0.0;
  auVar130._12_4_ = fVar366 * 0.0;
  auVar163._0_4_ =
       auVar130._0_4_ + fVar267 * 0.16666667 + fVar217 * 0.6666667 + fVar248 * 0.16666667;
  auVar163._4_4_ =
       auVar130._4_4_ + fVar268 * 0.16666667 + fVar246 * 0.6666667 + fVar264 * 0.16666667;
  auVar163._8_4_ =
       auVar130._8_4_ + fVar269 * 0.16666667 + fVar218 * 0.6666667 + fVar265 * 0.16666667;
  auVar163._12_4_ =
       auVar130._12_4_ + fVar339 * 0.16666667 + fVar247 * 0.6666667 + fVar266 * 0.16666667;
  auVar261 = vsubps_avx(auVar141,auVar130);
  auVar141 = vshufps_avx(auVar225,auVar225,0xc9);
  fVar215 = auVar114._0_4_;
  auVar131._0_4_ = fVar215 * auVar141._0_4_;
  fVar243 = auVar114._4_4_;
  auVar131._4_4_ = fVar243 * auVar141._4_4_;
  fVar340 = auVar114._8_4_;
  auVar131._8_4_ = fVar340 * auVar141._8_4_;
  fVar264 = auVar114._12_4_;
  auVar131._12_4_ = fVar264 * auVar141._12_4_;
  auVar141 = vshufps_avx(auVar114,auVar114,0xc9);
  auVar226._0_4_ = auVar141._0_4_ * auVar225._0_4_;
  auVar226._4_4_ = auVar141._4_4_ * auVar225._4_4_;
  auVar226._8_4_ = auVar141._8_4_ * auVar225._8_4_;
  auVar226._12_4_ = auVar141._12_4_ * auVar225._12_4_;
  auVar7 = vsubps_avx(auVar226,auVar131);
  auVar132._0_4_ = auVar141._0_4_ * auVar223._0_4_;
  auVar132._4_4_ = auVar141._4_4_ * auVar223._4_4_;
  auVar132._8_4_ = auVar141._8_4_ * auVar223._8_4_;
  auVar132._12_4_ = auVar141._12_4_ * auVar223._12_4_;
  auVar141 = vshufps_avx(auVar223,auVar223,0xc9);
  auVar190._0_4_ = fVar215 * auVar141._0_4_;
  auVar190._4_4_ = fVar243 * auVar141._4_4_;
  auVar190._8_4_ = fVar340 * auVar141._8_4_;
  auVar190._12_4_ = fVar264 * auVar141._12_4_;
  auVar37 = vsubps_avx(auVar132,auVar190);
  auVar141 = vshufps_avx(auVar163,auVar163,0xc9);
  fVar245 = auVar9._0_4_;
  auVar133._0_4_ = fVar245 * auVar141._0_4_;
  fVar246 = auVar9._4_4_;
  auVar133._4_4_ = fVar246 * auVar141._4_4_;
  fVar247 = auVar9._8_4_;
  auVar133._8_4_ = fVar247 * auVar141._8_4_;
  fVar265 = auVar9._12_4_;
  auVar133._12_4_ = fVar265 * auVar141._12_4_;
  auVar141 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar164._0_4_ = auVar141._0_4_ * auVar163._0_4_;
  auVar164._4_4_ = auVar141._4_4_ * auVar163._4_4_;
  auVar164._8_4_ = auVar141._8_4_ * auVar163._8_4_;
  auVar164._12_4_ = auVar141._12_4_ * auVar163._12_4_;
  auVar8 = vsubps_avx(auVar164,auVar133);
  auVar165._0_4_ = auVar141._0_4_ * auVar261._0_4_;
  auVar165._4_4_ = auVar141._4_4_ * auVar261._4_4_;
  auVar165._8_4_ = auVar141._8_4_ * auVar261._8_4_;
  auVar165._12_4_ = auVar141._12_4_ * auVar261._12_4_;
  auVar141 = vshufps_avx(auVar261,auVar261,0xc9);
  auVar110._0_4_ = fVar245 * auVar141._0_4_;
  auVar110._4_4_ = fVar246 * auVar141._4_4_;
  auVar110._8_4_ = fVar247 * auVar141._8_4_;
  auVar110._12_4_ = fVar265 * auVar141._12_4_;
  auVar10 = vsubps_avx(auVar165,auVar110);
  auVar261 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar141 = vdpps_avx(auVar261,auVar261,0x7f);
  fVar184 = auVar141._0_4_;
  auVar227 = ZEXT416((uint)fVar184);
  auVar223 = vrsqrtss_avx(auVar227,auVar227);
  fVar219 = auVar223._0_4_;
  auVar7 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar223 = vdpps_avx(auVar261,auVar7,0x7f);
  auVar141 = vshufps_avx(auVar141,auVar141,0);
  auVar191._0_4_ = auVar141._0_4_ * auVar7._0_4_;
  auVar191._4_4_ = auVar141._4_4_ * auVar7._4_4_;
  auVar191._8_4_ = auVar141._8_4_ * auVar7._8_4_;
  auVar191._12_4_ = auVar141._12_4_ * auVar7._12_4_;
  auVar141 = vshufps_avx(auVar223,auVar223,0);
  auVar394._0_4_ = auVar141._0_4_ * auVar261._0_4_;
  auVar394._4_4_ = auVar141._4_4_ * auVar261._4_4_;
  auVar394._8_4_ = auVar141._8_4_ * auVar261._8_4_;
  auVar394._12_4_ = auVar141._12_4_ * auVar261._12_4_;
  auVar291 = vsubps_avx(auVar191,auVar394);
  auVar141 = vrcpss_avx(auVar227,auVar227);
  auVar141 = ZEXT416((uint)(auVar141._0_4_ * (2.0 - fVar184 * auVar141._0_4_)));
  auVar7 = vshufps_avx(auVar141,auVar141,0);
  auVar141 = ZEXT416((uint)(fVar219 * 1.5 - fVar184 * 0.5 * fVar219 * fVar219 * fVar219));
  auVar37 = vshufps_avx(auVar141,auVar141,0);
  fVar157 = auVar261._0_4_ * auVar37._0_4_;
  fVar214 = auVar261._4_4_ * auVar37._4_4_;
  fVar242 = auVar261._8_4_ * auVar37._8_4_;
  fVar182 = auVar261._12_4_ * auVar37._12_4_;
  auVar261 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar141 = vdpps_avx(auVar261,auVar261,0x7f);
  fVar184 = auVar141._0_4_;
  auVar227 = ZEXT416((uint)fVar184);
  auVar223 = vrsqrtss_avx(auVar227,auVar227);
  fVar219 = auVar223._0_4_;
  auVar8 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar223 = vdpps_avx(auVar261,auVar8,0x7f);
  auVar141 = vshufps_avx(auVar141,auVar141,0);
  auVar111._0_4_ = auVar141._0_4_ * auVar8._0_4_;
  auVar111._4_4_ = auVar141._4_4_ * auVar8._4_4_;
  auVar111._8_4_ = auVar141._8_4_ * auVar8._8_4_;
  auVar111._12_4_ = auVar141._12_4_ * auVar8._12_4_;
  auVar141 = vshufps_avx(auVar223,auVar223,0);
  auVar308._0_4_ = auVar141._0_4_ * auVar261._0_4_;
  auVar308._4_4_ = auVar141._4_4_ * auVar261._4_4_;
  auVar308._8_4_ = auVar141._8_4_ * auVar261._8_4_;
  auVar308._12_4_ = auVar141._12_4_ * auVar261._12_4_;
  auVar10 = vsubps_avx(auVar111,auVar308);
  auVar141 = vrcpss_avx(auVar227,auVar227);
  auVar141 = ZEXT416((uint)(auVar141._0_4_ * (2.0 - fVar184 * auVar141._0_4_)));
  auVar141 = vshufps_avx(auVar141,auVar141,0);
  auVar223 = ZEXT416((uint)(fVar219 * 1.5 - fVar184 * 0.5 * fVar219 * fVar219 * fVar219));
  auVar223 = vshufps_avx(auVar223,auVar223,0);
  fVar184 = auVar261._0_4_ * auVar223._0_4_;
  fVar219 = auVar261._4_4_ * auVar223._4_4_;
  fVar213 = auVar261._8_4_ * auVar223._8_4_;
  fVar183 = auVar261._12_4_ * auVar223._12_4_;
  auVar261 = vshufps_avx(auVar114,auVar114,0xff);
  auVar8 = vshufps_avx(_local_6e0,_local_6e0,0xff);
  auVar166._0_4_ = auVar8._0_4_ * fVar157;
  auVar166._4_4_ = auVar8._4_4_ * fVar214;
  auVar166._8_4_ = auVar8._8_4_ * fVar242;
  auVar166._12_4_ = auVar8._12_4_ * fVar182;
  auVar192._0_4_ =
       auVar261._0_4_ * fVar157 + auVar37._0_4_ * auVar291._0_4_ * auVar7._0_4_ * auVar8._0_4_;
  auVar192._4_4_ =
       auVar261._4_4_ * fVar214 + auVar37._4_4_ * auVar291._4_4_ * auVar7._4_4_ * auVar8._4_4_;
  auVar192._8_4_ =
       auVar261._8_4_ * fVar242 + auVar37._8_4_ * auVar291._8_4_ * auVar7._8_4_ * auVar8._8_4_;
  auVar192._12_4_ =
       auVar261._12_4_ * fVar182 + auVar37._12_4_ * auVar291._12_4_ * auVar7._12_4_ * auVar8._12_4_;
  auVar37 = vsubps_avx(_local_6e0,auVar166);
  local_6e0._0_4_ = (float)local_6e0._0_4_ + auVar166._0_4_;
  local_6e0._4_4_ = (float)local_6e0._4_4_ + auVar166._4_4_;
  fStack_6d8 = fStack_6d8 + auVar166._8_4_;
  fStack_6d4 = fStack_6d4 + auVar166._12_4_;
  auVar8 = vsubps_avx(auVar114,auVar192);
  auVar261 = vshufps_avx(auVar9,auVar9,0xff);
  auVar7 = vshufps_avx(auVar376,auVar376,0xff);
  auVar134._0_4_ = auVar7._0_4_ * fVar184;
  auVar134._4_4_ = auVar7._4_4_ * fVar219;
  auVar134._8_4_ = auVar7._8_4_ * fVar213;
  auVar134._12_4_ = auVar7._12_4_ * fVar183;
  auVar167._0_4_ =
       auVar261._0_4_ * fVar184 + auVar7._0_4_ * auVar223._0_4_ * auVar10._0_4_ * auVar141._0_4_;
  auVar167._4_4_ =
       auVar261._4_4_ * fVar219 + auVar7._4_4_ * auVar223._4_4_ * auVar10._4_4_ * auVar141._4_4_;
  auVar167._8_4_ =
       auVar261._8_4_ * fVar213 + auVar7._8_4_ * auVar223._8_4_ * auVar10._8_4_ * auVar141._8_4_;
  auVar167._12_4_ =
       auVar261._12_4_ * fVar183 +
       auVar7._12_4_ * auVar223._12_4_ * auVar10._12_4_ * auVar141._12_4_;
  auVar261 = vsubps_avx(auVar376,auVar134);
  auVar395._0_4_ = auVar376._0_4_ + auVar134._0_4_;
  auVar395._4_4_ = auVar376._4_4_ + auVar134._4_4_;
  auVar395._8_4_ = auVar376._8_4_ + auVar134._8_4_;
  auVar395._12_4_ = auVar376._12_4_ + auVar134._12_4_;
  auVar7 = vsubps_avx(auVar9,auVar167);
  local_640 = auVar202._0_4_;
  fStack_63c = auVar202._4_4_;
  fStack_638 = auVar202._8_4_;
  fStack_634 = auVar202._12_4_;
  local_6c0 = auVar171._0_4_;
  fStack_6bc = auVar171._4_4_;
  fStack_6b8 = auVar171._8_4_;
  fStack_6b4 = auVar171._12_4_;
  auVar141 = vshufps_avx(ZEXT416((uint)fVar270),ZEXT416((uint)fVar270),0);
  auVar223 = vshufps_avx(ZEXT416((uint)(1.0 - fVar270)),ZEXT416((uint)(1.0 - fVar270)),0);
  fVar183 = auVar141._0_4_;
  fVar157 = auVar141._4_4_;
  fVar214 = auVar141._8_4_;
  fVar242 = auVar141._12_4_;
  fVar184 = auVar223._0_4_;
  fVar219 = auVar223._4_4_;
  fVar270 = auVar223._8_4_;
  fVar213 = auVar223._12_4_;
  local_470._0_4_ = fVar184 * local_6c0 + fVar183 * auVar37._0_4_;
  local_470._4_4_ = fVar219 * fStack_6bc + fVar157 * auVar37._4_4_;
  fStack_468 = fVar270 * fStack_6b8 + fVar214 * auVar37._8_4_;
  fStack_464 = fVar213 * fStack_6b4 + fVar242 * auVar37._12_4_;
  fVar216 = (local_6c0 + local_640 * 0.33333334) * fVar184 +
            fVar183 * (auVar37._0_4_ + auVar8._0_4_ * 0.33333334);
  fVar217 = (fStack_6bc + fStack_63c * 0.33333334) * fVar219 +
            fVar157 * (auVar37._4_4_ + auVar8._4_4_ * 0.33333334);
  fVar218 = (fStack_6b8 + fStack_638 * 0.33333334) * fVar270 +
            fVar214 * (auVar37._8_4_ + auVar8._8_4_ * 0.33333334);
  fVar248 = (fStack_6b4 + fStack_634 * 0.33333334) * fVar213 +
            fVar242 * (auVar37._12_4_ + auVar8._12_4_ * 0.33333334);
  local_610 = auVar201._0_4_;
  fStack_60c = auVar201._4_4_;
  fStack_608 = auVar201._8_4_;
  fStack_604 = auVar201._12_4_;
  auVar228._0_4_ = local_610 * 0.33333334;
  auVar228._4_4_ = fStack_60c * 0.33333334;
  auVar228._8_4_ = fStack_608 * 0.33333334;
  auVar228._12_4_ = fStack_604 * 0.33333334;
  auVar141 = vsubps_avx(auVar140,auVar228);
  auVar274._0_4_ = (fVar369 + auVar107._0_4_) * 0.33333334;
  auVar274._4_4_ = (fVar370 + auVar107._4_4_) * 0.33333334;
  auVar274._8_4_ = (fVar371 + auVar107._8_4_) * 0.33333334;
  auVar274._12_4_ = (fVar283 + auVar107._12_4_) * 0.33333334;
  auVar223 = vsubps_avx(_local_6a0,auVar274);
  auVar309._0_4_ = auVar7._0_4_ * 0.33333334;
  auVar309._4_4_ = auVar7._4_4_ * 0.33333334;
  auVar309._8_4_ = auVar7._8_4_ * 0.33333334;
  auVar309._12_4_ = auVar7._12_4_ * 0.33333334;
  auVar7 = vsubps_avx(auVar261,auVar309);
  auVar168._0_4_ = (fVar245 + auVar167._0_4_) * 0.33333334;
  auVar168._4_4_ = (fVar246 + auVar167._4_4_) * 0.33333334;
  auVar168._8_4_ = (fVar247 + auVar167._8_4_) * 0.33333334;
  auVar168._12_4_ = (fVar265 + auVar167._12_4_) * 0.33333334;
  auVar37 = vsubps_avx(auVar395,auVar168);
  local_480._0_4_ = auVar7._0_4_ * fVar183 + fVar184 * auVar141._0_4_;
  local_480._4_4_ = auVar7._4_4_ * fVar157 + fVar219 * auVar141._4_4_;
  fStack_478 = auVar7._8_4_ * fVar214 + fVar270 * auVar141._8_4_;
  fStack_474 = auVar7._12_4_ * fVar242 + fVar213 * auVar141._12_4_;
  local_490._0_4_ = auVar261._0_4_ * fVar183 + auVar140._0_4_ * fVar184;
  local_490._4_4_ = auVar261._4_4_ * fVar157 + auVar140._4_4_ * fVar219;
  fStack_488 = auVar261._8_4_ * fVar214 + auVar140._8_4_ * fVar270;
  fStack_484 = auVar261._12_4_ * fVar242 + auVar140._12_4_ * fVar213;
  local_4a0._0_4_ = fVar184 * (float)local_730._0_4_ + fVar183 * (float)local_6e0._0_4_;
  local_4a0._4_4_ = fVar219 * (float)local_730._4_4_ + fVar157 * (float)local_6e0._4_4_;
  fStack_498 = fVar270 * fStack_728 + fVar214 * fStack_6d8;
  fStack_494 = fVar213 * fStack_724 + fVar242 * fStack_6d4;
  fVar245 = fVar184 * ((float)local_730._0_4_ + (fVar241 + auVar224._0_4_) * 0.33333334) +
            ((fVar215 + auVar192._0_4_) * 0.33333334 + (float)local_6e0._0_4_) * fVar183;
  fVar246 = fVar219 * ((float)local_730._4_4_ + (fVar367 + auVar224._4_4_) * 0.33333334) +
            ((fVar243 + auVar192._4_4_) * 0.33333334 + (float)local_6e0._4_4_) * fVar157;
  fVar247 = fVar270 * (fStack_728 + (fVar244 + auVar224._8_4_) * 0.33333334) +
            ((fVar340 + auVar192._8_4_) * 0.33333334 + fStack_6d8) * fVar214;
  fVar264 = fVar213 * (fStack_724 + (fVar368 + auVar224._12_4_) * 0.33333334) +
            ((fVar264 + auVar192._12_4_) * 0.33333334 + fStack_6d4) * fVar242;
  local_4b0 = fVar184 * auVar223._0_4_ + fVar183 * auVar37._0_4_;
  fStack_4ac = fVar219 * auVar223._4_4_ + fVar157 * auVar37._4_4_;
  fStack_4a8 = fVar270 * auVar223._8_4_ + fVar214 * auVar37._8_4_;
  fStack_4a4 = fVar213 * auVar223._12_4_ + fVar242 * auVar37._12_4_;
  auVar141 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  local_4c0._0_4_ = (auVar273._0_4_ + auVar161._0_4_) * fVar184 + auVar395._0_4_ * fVar183;
  local_4c0._4_4_ = (auVar273._4_4_ + auVar161._4_4_) * fVar219 + auVar395._4_4_ * fVar157;
  fStack_4b8 = (auVar273._8_4_ + auVar161._8_4_) * fVar270 + auVar395._8_4_ * fVar214;
  fStack_4b4 = (auVar273._12_4_ + auVar161._12_4_) * fVar213 + auVar395._12_4_ * fVar242;
  auVar141 = vinsertps_avx(auVar141,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_380 = vsubps_avx(_local_470,auVar141);
  auVar261 = vmovsldup_avx(local_380);
  auVar223 = vmovshdup_avx(local_380);
  auVar7 = vshufps_avx(local_380,local_380,0xaa);
  fVar184 = pre->ray_space[k].vx.field_0.m128[0];
  fVar219 = pre->ray_space[k].vx.field_0.m128[1];
  fVar270 = pre->ray_space[k].vx.field_0.m128[2];
  fVar213 = pre->ray_space[k].vx.field_0.m128[3];
  fVar183 = pre->ray_space[k].vy.field_0.m128[0];
  fVar157 = pre->ray_space[k].vy.field_0.m128[1];
  fVar214 = pre->ray_space[k].vy.field_0.m128[2];
  fVar242 = pre->ray_space[k].vy.field_0.m128[3];
  fVar182 = pre->ray_space[k].vz.field_0.m128[0];
  fVar215 = pre->ray_space[k].vz.field_0.m128[1];
  fVar243 = pre->ray_space[k].vz.field_0.m128[2];
  fVar340 = pre->ray_space[k].vz.field_0.m128[3];
  local_5f0._0_4_ = fVar184 * auVar261._0_4_ + fVar183 * auVar223._0_4_ + fVar182 * auVar7._0_4_;
  local_5f0._4_4_ = fVar219 * auVar261._4_4_ + fVar157 * auVar223._4_4_ + fVar215 * auVar7._4_4_;
  fStack_5e8 = fVar270 * auVar261._8_4_ + fVar214 * auVar223._8_4_ + fVar243 * auVar7._8_4_;
  fStack_5e4 = fVar213 * auVar261._12_4_ + fVar242 * auVar223._12_4_ + fVar340 * auVar7._12_4_;
  auVar81._4_4_ = fVar217;
  auVar81._0_4_ = fVar216;
  auVar81._8_4_ = fVar218;
  auVar81._12_4_ = fVar248;
  local_390 = vsubps_avx(auVar81,auVar141);
  auVar7 = vshufps_avx(local_390,local_390,0xaa);
  auVar223 = vmovshdup_avx(local_390);
  auVar261 = vmovsldup_avx(local_390);
  auVar396._0_4_ = fVar184 * auVar261._0_4_ + fVar183 * auVar223._0_4_ + fVar182 * auVar7._0_4_;
  auVar396._4_4_ = fVar219 * auVar261._4_4_ + fVar157 * auVar223._4_4_ + fVar215 * auVar7._4_4_;
  auVar396._8_4_ = fVar270 * auVar261._8_4_ + fVar214 * auVar223._8_4_ + fVar243 * auVar7._8_4_;
  auVar396._12_4_ = fVar213 * auVar261._12_4_ + fVar242 * auVar223._12_4_ + fVar340 * auVar7._12_4_;
  local_3a0 = vsubps_avx(_local_480,auVar141);
  auVar7 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar223 = vmovshdup_avx(local_3a0);
  auVar261 = vmovsldup_avx(local_3a0);
  auVar377._0_4_ = fVar184 * auVar261._0_4_ + fVar183 * auVar223._0_4_ + fVar182 * auVar7._0_4_;
  auVar377._4_4_ = fVar219 * auVar261._4_4_ + fVar157 * auVar223._4_4_ + fVar215 * auVar7._4_4_;
  auVar377._8_4_ = fVar270 * auVar261._8_4_ + fVar214 * auVar223._8_4_ + fVar243 * auVar7._8_4_;
  auVar377._12_4_ = fVar213 * auVar261._12_4_ + fVar242 * auVar223._12_4_ + fVar340 * auVar7._12_4_;
  local_3b0 = vsubps_avx(_local_490,auVar141);
  auVar7 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar223 = vmovshdup_avx(local_3b0);
  auVar261 = vmovsldup_avx(local_3b0);
  auVar135._0_4_ = auVar261._0_4_ * fVar184 + auVar223._0_4_ * fVar183 + fVar182 * auVar7._0_4_;
  auVar135._4_4_ = auVar261._4_4_ * fVar219 + auVar223._4_4_ * fVar157 + fVar215 * auVar7._4_4_;
  auVar135._8_4_ = auVar261._8_4_ * fVar270 + auVar223._8_4_ * fVar214 + fVar243 * auVar7._8_4_;
  auVar135._12_4_ = auVar261._12_4_ * fVar213 + auVar223._12_4_ * fVar242 + fVar340 * auVar7._12_4_;
  local_3c0 = vsubps_avx(_local_4a0,auVar141);
  auVar7 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar223 = vmovshdup_avx(local_3c0);
  auVar261 = vmovsldup_avx(local_3c0);
  auVar310._0_4_ = auVar261._0_4_ * fVar184 + auVar223._0_4_ * fVar183 + auVar7._0_4_ * fVar182;
  auVar310._4_4_ = auVar261._4_4_ * fVar219 + auVar223._4_4_ * fVar157 + auVar7._4_4_ * fVar215;
  auVar310._8_4_ = auVar261._8_4_ * fVar270 + auVar223._8_4_ * fVar214 + auVar7._8_4_ * fVar243;
  auVar310._12_4_ = auVar261._12_4_ * fVar213 + auVar223._12_4_ * fVar242 + auVar7._12_4_ * fVar340;
  auVar79._4_4_ = fVar246;
  auVar79._0_4_ = fVar245;
  auVar79._8_4_ = fVar247;
  auVar79._12_4_ = fVar264;
  local_3d0 = vsubps_avx(auVar79,auVar141);
  auVar7 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar223 = vmovshdup_avx(local_3d0);
  auVar261 = vmovsldup_avx(local_3d0);
  auVar323._0_4_ = auVar261._0_4_ * fVar184 + auVar223._0_4_ * fVar183 + auVar7._0_4_ * fVar182;
  auVar323._4_4_ = auVar261._4_4_ * fVar219 + auVar223._4_4_ * fVar157 + auVar7._4_4_ * fVar215;
  auVar323._8_4_ = auVar261._8_4_ * fVar270 + auVar223._8_4_ * fVar214 + auVar7._8_4_ * fVar243;
  auVar323._12_4_ = auVar261._12_4_ * fVar213 + auVar223._12_4_ * fVar242 + auVar7._12_4_ * fVar340;
  auVar87._4_4_ = fStack_4ac;
  auVar87._0_4_ = local_4b0;
  auVar87._8_4_ = fStack_4a8;
  auVar87._12_4_ = fStack_4a4;
  local_3e0 = vsubps_avx(auVar87,auVar141);
  auVar7 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar223 = vmovshdup_avx(local_3e0);
  auVar261 = vmovsldup_avx(local_3e0);
  auVar344._0_4_ = auVar261._0_4_ * fVar184 + auVar223._0_4_ * fVar183 + auVar7._0_4_ * fVar182;
  auVar344._4_4_ = auVar261._4_4_ * fVar219 + auVar223._4_4_ * fVar157 + auVar7._4_4_ * fVar215;
  auVar344._8_4_ = auVar261._8_4_ * fVar270 + auVar223._8_4_ * fVar214 + auVar7._8_4_ * fVar243;
  auVar344._12_4_ = auVar261._12_4_ * fVar213 + auVar223._12_4_ * fVar242 + auVar7._12_4_ * fVar340;
  local_3f0 = vsubps_avx(_local_4c0,auVar141);
  auVar261 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar141 = vmovshdup_avx(local_3f0);
  auVar223 = vmovsldup_avx(local_3f0);
  auVar112._0_4_ = fVar184 * auVar223._0_4_ + fVar183 * auVar141._0_4_ + fVar182 * auVar261._0_4_;
  auVar112._4_4_ = fVar219 * auVar223._4_4_ + fVar157 * auVar141._4_4_ + fVar215 * auVar261._4_4_;
  auVar112._8_4_ = fVar270 * auVar223._8_4_ + fVar214 * auVar141._8_4_ + fVar243 * auVar261._8_4_;
  auVar112._12_4_ =
       fVar213 * auVar223._12_4_ + fVar242 * auVar141._12_4_ + fVar340 * auVar261._12_4_;
  auVar7 = vmovlhps_avx(_local_5f0,auVar310);
  auVar37 = vmovlhps_avx(auVar396,auVar323);
  auVar8 = vmovlhps_avx(auVar377,auVar344);
  _local_460 = vmovlhps_avx(auVar135,auVar112);
  auVar141 = vminps_avx(auVar7,auVar37);
  auVar223 = vminps_avx(auVar8,_local_460);
  auVar261 = vminps_avx(auVar141,auVar223);
  auVar141 = vmaxps_avx(auVar7,auVar37);
  auVar223 = vmaxps_avx(auVar8,_local_460);
  auVar141 = vmaxps_avx(auVar141,auVar223);
  auVar223 = vshufpd_avx(auVar261,auVar261,3);
  auVar261 = vminps_avx(auVar261,auVar223);
  auVar223 = vshufpd_avx(auVar141,auVar141,3);
  auVar223 = vmaxps_avx(auVar141,auVar223);
  auVar275._8_4_ = 0x7fffffff;
  auVar275._0_8_ = 0x7fffffff7fffffff;
  auVar275._12_4_ = 0x7fffffff;
  auVar141 = vandps_avx(auVar261,auVar275);
  auVar223 = vandps_avx(auVar223,auVar275);
  auVar141 = vmaxps_avx(auVar141,auVar223);
  auVar223 = vmovshdup_avx(auVar141);
  auVar141 = vmaxss_avx(auVar223,auVar141);
  local_528 = uVar89 + 0xff;
  fVar219 = auVar141._0_4_ * 9.536743e-07;
  auVar141 = vshufps_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),0);
  local_280._16_16_ = auVar141;
  local_280._0_16_ = auVar141;
  auVar113._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
  auVar113._8_4_ = auVar141._8_4_ ^ 0x80000000;
  auVar113._12_4_ = auVar141._12_4_ ^ 0x80000000;
  local_2a0._16_16_ = auVar113;
  local_2a0._0_16_ = auVar113;
  auVar141 = vshufps_avx(ZEXT416(uVar90),ZEXT416(uVar90),0);
  local_2e0._16_16_ = auVar141;
  local_2e0._0_16_ = auVar141;
  auVar141 = vpshufd_avx(ZEXT416(uVar21),0);
  local_300._16_16_ = auVar141;
  local_300._0_16_ = auVar141;
  uVar93 = 0;
  fVar184 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar37,auVar7);
  _local_360 = vsubps_avx(auVar8,auVar37);
  _local_370 = vsubps_avx(_local_460,auVar8);
  _local_410 = vsubps_avx(_local_4a0,_local_470);
  auVar80._4_4_ = fVar246;
  auVar80._0_4_ = fVar245;
  auVar80._8_4_ = fVar247;
  auVar80._12_4_ = fVar264;
  auVar82._4_4_ = fVar217;
  auVar82._0_4_ = fVar216;
  auVar82._8_4_ = fVar218;
  auVar82._12_4_ = fVar248;
  _local_420 = vsubps_avx(auVar80,auVar82);
  _local_430 = vsubps_avx(auVar87,_local_480);
  _local_440 = vsubps_avx(_local_4c0,_local_490);
  _local_730 = ZEXT816(0x3f80000000000000);
  local_400 = _local_730;
  do {
    auVar141 = vshufps_avx(_local_730,_local_730,0x50);
    auVar412._8_4_ = 0x3f800000;
    auVar412._0_8_ = &DAT_3f8000003f800000;
    auVar412._12_4_ = 0x3f800000;
    auVar415._16_4_ = 0x3f800000;
    auVar415._0_16_ = auVar412;
    auVar415._20_4_ = 0x3f800000;
    auVar415._24_4_ = 0x3f800000;
    auVar415._28_4_ = 0x3f800000;
    auVar223 = vsubps_avx(auVar412,auVar141);
    fVar270 = auVar141._0_4_;
    fVar213 = auVar141._4_4_;
    fVar183 = auVar141._8_4_;
    fVar157 = auVar141._12_4_;
    fVar214 = auVar223._0_4_;
    fVar242 = auVar223._4_4_;
    fVar182 = auVar223._8_4_;
    fVar215 = auVar223._12_4_;
    auVar169._0_4_ = auVar310._0_4_ * fVar270 + fVar214 * (float)local_5f0._0_4_;
    auVar169._4_4_ = auVar310._4_4_ * fVar213 + fVar242 * (float)local_5f0._4_4_;
    auVar169._8_4_ = auVar310._0_4_ * fVar183 + fVar182 * (float)local_5f0._0_4_;
    auVar169._12_4_ = auVar310._4_4_ * fVar157 + fVar215 * (float)local_5f0._4_4_;
    auVar136._0_4_ = auVar323._0_4_ * fVar270 + auVar396._0_4_ * fVar214;
    auVar136._4_4_ = auVar323._4_4_ * fVar213 + auVar396._4_4_ * fVar242;
    auVar136._8_4_ = auVar323._0_4_ * fVar183 + auVar396._0_4_ * fVar182;
    auVar136._12_4_ = auVar323._4_4_ * fVar157 + auVar396._4_4_ * fVar215;
    auVar290._0_4_ = auVar344._0_4_ * fVar270 + auVar377._0_4_ * fVar214;
    auVar290._4_4_ = auVar344._4_4_ * fVar213 + auVar377._4_4_ * fVar242;
    auVar290._8_4_ = auVar344._0_4_ * fVar183 + auVar377._0_4_ * fVar182;
    auVar290._12_4_ = auVar344._4_4_ * fVar157 + auVar377._4_4_ * fVar215;
    auVar193._0_4_ = auVar112._0_4_ * fVar270 + auVar135._0_4_ * fVar214;
    auVar193._4_4_ = auVar112._4_4_ * fVar213 + auVar135._4_4_ * fVar242;
    auVar193._8_4_ = auVar112._0_4_ * fVar183 + auVar135._0_4_ * fVar182;
    auVar193._12_4_ = auVar112._4_4_ * fVar157 + auVar135._4_4_ * fVar215;
    auVar141 = vmovshdup_avx(local_400);
    auVar223 = vshufps_avx(local_400,local_400,0);
    auVar321._16_16_ = auVar223;
    auVar321._0_16_ = auVar223;
    auVar261 = vshufps_avx(local_400,local_400,0x55);
    auVar120._16_16_ = auVar261;
    auVar120._0_16_ = auVar261;
    auVar116 = vsubps_avx(auVar120,auVar321);
    auVar261 = vshufps_avx(auVar169,auVar169,0);
    auVar202 = vshufps_avx(auVar169,auVar169,0x55);
    auVar140 = vshufps_avx(auVar136,auVar136,0);
    auVar201 = vshufps_avx(auVar136,auVar136,0x55);
    auVar114 = vshufps_avx(auVar290,auVar290,0);
    auVar171 = vshufps_avx(auVar290,auVar290,0x55);
    auVar9 = vshufps_avx(auVar193,auVar193,0);
    auVar10 = vshufps_avx(auVar193,auVar193,0x55);
    auVar141 = ZEXT416((uint)((auVar141._0_4_ - local_400._0_4_) * 0.04761905));
    auVar141 = vshufps_avx(auVar141,auVar141,0);
    auVar338._0_4_ = auVar223._0_4_ + auVar116._0_4_ * 0.0;
    auVar338._4_4_ = auVar223._4_4_ + auVar116._4_4_ * 0.14285715;
    auVar338._8_4_ = auVar223._8_4_ + auVar116._8_4_ * 0.2857143;
    auVar338._12_4_ = auVar223._12_4_ + auVar116._12_4_ * 0.42857146;
    auVar338._16_4_ = auVar223._0_4_ + auVar116._16_4_ * 0.5714286;
    auVar338._20_4_ = auVar223._4_4_ + auVar116._20_4_ * 0.71428573;
    auVar338._24_4_ = auVar223._8_4_ + auVar116._24_4_ * 0.8571429;
    auVar338._28_4_ = auVar223._12_4_ + auVar116._28_4_;
    auVar29 = vsubps_avx(auVar415,auVar338);
    fVar268 = auVar140._0_4_;
    fVar339 = auVar140._4_4_;
    fVar241 = auVar140._8_4_;
    fVar244 = auVar140._12_4_;
    fVar270 = auVar29._0_4_;
    fVar214 = auVar29._4_4_;
    fVar243 = auVar29._8_4_;
    fVar267 = auVar29._12_4_;
    fVar403 = auVar261._12_4_;
    fVar341 = auVar29._16_4_;
    fVar342 = auVar29._20_4_;
    fVar36 = auVar29._24_4_;
    fVar283 = auVar201._0_4_;
    fVar284 = auVar201._4_4_;
    fVar285 = auVar201._8_4_;
    fVar393 = auVar201._12_4_;
    local_680 = auVar202._0_4_;
    fStack_67c = auVar202._4_4_;
    fStack_678 = auVar202._8_4_;
    fStack_674 = auVar202._12_4_;
    fVar213 = auVar114._0_4_;
    fVar157 = auVar114._4_4_;
    fVar182 = auVar114._8_4_;
    fVar340 = auVar114._12_4_;
    fVar269 = auVar338._0_4_ * fVar213 + fVar268 * fVar270;
    fVar366 = auVar338._4_4_ * fVar157 + fVar339 * fVar214;
    fVar367 = auVar338._8_4_ * fVar182 + fVar241 * fVar243;
    fVar368 = auVar338._12_4_ * fVar340 + fVar244 * fVar267;
    fVar369 = auVar338._16_4_ * fVar213 + fVar268 * fVar341;
    fVar370 = auVar338._20_4_ * fVar157 + fVar339 * fVar342;
    fVar371 = auVar338._24_4_ * fVar182 + fVar241 * fVar36;
    fVar183 = auVar171._0_4_;
    fVar242 = auVar171._4_4_;
    fVar215 = auVar171._8_4_;
    fVar265 = auVar171._12_4_;
    fVar372 = auVar338._0_4_ * fVar183 + fVar283 * fVar270;
    fVar384 = auVar338._4_4_ * fVar242 + fVar284 * fVar214;
    fVar385 = auVar338._8_4_ * fVar215 + fVar285 * fVar243;
    fVar386 = auVar338._12_4_ * fVar265 + fVar393 * fVar267;
    fVar387 = auVar338._16_4_ * fVar183 + fVar283 * fVar341;
    fVar389 = auVar338._20_4_ * fVar242 + fVar284 * fVar342;
    fVar391 = auVar338._24_4_ * fVar215 + fVar285 * fVar36;
    auVar223 = vshufps_avx(auVar169,auVar169,0xaa);
    auVar202 = vshufps_avx(auVar169,auVar169,0xff);
    fVar266 = fVar340 + 0.0;
    auVar140 = vshufps_avx(auVar136,auVar136,0xaa);
    auVar201 = vshufps_avx(auVar136,auVar136,0xff);
    auVar121._0_4_ =
         fVar270 * (fVar268 * auVar338._0_4_ + auVar261._0_4_ * fVar270) + auVar338._0_4_ * fVar269;
    auVar121._4_4_ =
         fVar214 * (fVar339 * auVar338._4_4_ + auVar261._4_4_ * fVar214) + auVar338._4_4_ * fVar366;
    auVar121._8_4_ =
         fVar243 * (fVar241 * auVar338._8_4_ + auVar261._8_4_ * fVar243) + auVar338._8_4_ * fVar367;
    auVar121._12_4_ =
         fVar267 * (fVar244 * auVar338._12_4_ + fVar403 * fVar267) + auVar338._12_4_ * fVar368;
    auVar121._16_4_ =
         fVar341 * (fVar268 * auVar338._16_4_ + auVar261._0_4_ * fVar341) +
         auVar338._16_4_ * fVar369;
    auVar121._20_4_ =
         fVar342 * (fVar339 * auVar338._20_4_ + auVar261._4_4_ * fVar342) +
         auVar338._20_4_ * fVar370;
    auVar121._24_4_ =
         fVar36 * (fVar241 * auVar338._24_4_ + auVar261._8_4_ * fVar36) + auVar338._24_4_ * fVar371;
    auVar121._28_4_ = fVar403 + 1.0 + fVar265;
    auVar209._0_4_ =
         fVar270 * (fVar283 * auVar338._0_4_ + fVar270 * local_680) + auVar338._0_4_ * fVar372;
    auVar209._4_4_ =
         fVar214 * (fVar284 * auVar338._4_4_ + fVar214 * fStack_67c) + auVar338._4_4_ * fVar384;
    auVar209._8_4_ =
         fVar243 * (fVar285 * auVar338._8_4_ + fVar243 * fStack_678) + auVar338._8_4_ * fVar385;
    auVar209._12_4_ =
         fVar267 * (fVar393 * auVar338._12_4_ + fVar267 * fStack_674) + auVar338._12_4_ * fVar386;
    auVar209._16_4_ =
         fVar341 * (fVar283 * auVar338._16_4_ + fVar341 * local_680) + auVar338._16_4_ * fVar387;
    auVar209._20_4_ =
         fVar342 * (fVar284 * auVar338._20_4_ + fVar342 * fStack_67c) + auVar338._20_4_ * fVar389;
    auVar209._24_4_ =
         fVar36 * (fVar285 * auVar338._24_4_ + fVar36 * fStack_678) + auVar338._24_4_ * fVar391;
    auVar209._28_4_ = fVar403 + 1.0 + fVar265;
    auVar238._0_4_ =
         fVar270 * fVar269 + auVar338._0_4_ * (auVar9._0_4_ * auVar338._0_4_ + fVar270 * fVar213);
    auVar238._4_4_ =
         fVar214 * fVar366 + auVar338._4_4_ * (auVar9._4_4_ * auVar338._4_4_ + fVar214 * fVar157);
    auVar238._8_4_ =
         fVar243 * fVar367 + auVar338._8_4_ * (auVar9._8_4_ * auVar338._8_4_ + fVar243 * fVar182);
    auVar238._12_4_ =
         fVar267 * fVar368 + auVar338._12_4_ * (auVar9._12_4_ * auVar338._12_4_ + fVar267 * fVar340)
    ;
    auVar238._16_4_ =
         fVar341 * fVar369 + auVar338._16_4_ * (auVar9._0_4_ * auVar338._16_4_ + fVar341 * fVar213);
    auVar238._20_4_ =
         fVar342 * fVar370 + auVar338._20_4_ * (auVar9._4_4_ * auVar338._20_4_ + fVar342 * fVar157);
    auVar238._24_4_ =
         fVar36 * fVar371 + auVar338._24_4_ * (auVar9._8_4_ * auVar338._24_4_ + fVar36 * fVar182);
    auVar238._28_4_ = fVar265 + fVar266;
    auVar353._0_4_ =
         fVar270 * fVar372 + auVar338._0_4_ * (auVar10._0_4_ * auVar338._0_4_ + fVar270 * fVar183);
    auVar353._4_4_ =
         fVar214 * fVar384 + auVar338._4_4_ * (auVar10._4_4_ * auVar338._4_4_ + fVar214 * fVar242);
    auVar353._8_4_ =
         fVar243 * fVar385 + auVar338._8_4_ * (auVar10._8_4_ * auVar338._8_4_ + fVar243 * fVar215);
    auVar353._12_4_ =
         fVar267 * fVar386 +
         auVar338._12_4_ * (auVar10._12_4_ * auVar338._12_4_ + fVar267 * fVar265);
    auVar353._16_4_ =
         fVar341 * fVar387 + auVar338._16_4_ * (auVar10._0_4_ * auVar338._16_4_ + fVar341 * fVar183)
    ;
    auVar353._20_4_ =
         fVar342 * fVar389 + auVar338._20_4_ * (auVar10._4_4_ * auVar338._20_4_ + fVar342 * fVar242)
    ;
    auVar353._24_4_ =
         fVar36 * fVar391 + auVar338._24_4_ * (auVar10._8_4_ * auVar338._24_4_ + fVar36 * fVar215);
    auVar353._28_4_ = fVar266 + fVar265 + 0.0;
    local_1c0._0_4_ = fVar270 * auVar121._0_4_ + auVar338._0_4_ * auVar238._0_4_;
    local_1c0._4_4_ = fVar214 * auVar121._4_4_ + auVar338._4_4_ * auVar238._4_4_;
    local_1c0._8_4_ = fVar243 * auVar121._8_4_ + auVar338._8_4_ * auVar238._8_4_;
    local_1c0._12_4_ = fVar267 * auVar121._12_4_ + auVar338._12_4_ * auVar238._12_4_;
    local_1c0._16_4_ = fVar341 * auVar121._16_4_ + auVar338._16_4_ * auVar238._16_4_;
    local_1c0._20_4_ = fVar342 * auVar121._20_4_ + auVar338._20_4_ * auVar238._20_4_;
    local_1c0._24_4_ = fVar36 * auVar121._24_4_ + auVar338._24_4_ * auVar238._24_4_;
    local_1c0._28_4_ = fVar403 + fVar244 + fVar265 + 0.0;
    local_1e0._0_4_ = fVar270 * auVar209._0_4_ + auVar338._0_4_ * auVar353._0_4_;
    local_1e0._4_4_ = fVar214 * auVar209._4_4_ + auVar338._4_4_ * auVar353._4_4_;
    local_1e0._8_4_ = fVar243 * auVar209._8_4_ + auVar338._8_4_ * auVar353._8_4_;
    local_1e0._12_4_ = fVar267 * auVar209._12_4_ + auVar338._12_4_ * auVar353._12_4_;
    local_1e0._16_4_ = fVar341 * auVar209._16_4_ + auVar338._16_4_ * auVar353._16_4_;
    local_1e0._20_4_ = fVar342 * auVar209._20_4_ + auVar338._20_4_ * auVar353._20_4_;
    local_1e0._24_4_ = fVar36 * auVar209._24_4_ + auVar338._24_4_ * auVar353._24_4_;
    local_1e0._28_4_ = fVar403 + fVar244 + fVar266;
    auVar30 = vsubps_avx(auVar238,auVar121);
    auVar116 = vsubps_avx(auVar353,auVar209);
    local_6e0._0_4_ = auVar141._0_4_;
    local_6e0._4_4_ = auVar141._4_4_;
    fStack_6d8 = auVar141._8_4_;
    fStack_6d4 = auVar141._12_4_;
    local_220 = (float)local_6e0._0_4_ * auVar30._0_4_ * 3.0;
    fStack_21c = (float)local_6e0._4_4_ * auVar30._4_4_ * 3.0;
    auVar40._4_4_ = fStack_21c;
    auVar40._0_4_ = local_220;
    fStack_218 = fStack_6d8 * auVar30._8_4_ * 3.0;
    auVar40._8_4_ = fStack_218;
    fStack_214 = fStack_6d4 * auVar30._12_4_ * 3.0;
    auVar40._12_4_ = fStack_214;
    fStack_210 = (float)local_6e0._0_4_ * auVar30._16_4_ * 3.0;
    auVar40._16_4_ = fStack_210;
    fStack_20c = (float)local_6e0._4_4_ * auVar30._20_4_ * 3.0;
    auVar40._20_4_ = fStack_20c;
    fStack_208 = fStack_6d8 * auVar30._24_4_ * 3.0;
    auVar40._24_4_ = fStack_208;
    auVar40._28_4_ = auVar30._28_4_;
    fVar366 = (float)local_6e0._0_4_ * auVar116._0_4_ * 3.0;
    fVar241 = (float)local_6e0._4_4_ * auVar116._4_4_ * 3.0;
    auVar41._4_4_ = fVar241;
    auVar41._0_4_ = fVar366;
    fVar367 = fStack_6d8 * auVar116._8_4_ * 3.0;
    auVar41._8_4_ = fVar367;
    fVar244 = fStack_6d4 * auVar116._12_4_ * 3.0;
    auVar41._12_4_ = fVar244;
    fVar368 = (float)local_6e0._0_4_ * auVar116._16_4_ * 3.0;
    auVar41._16_4_ = fVar368;
    fVar369 = (float)local_6e0._4_4_ * auVar116._20_4_ * 3.0;
    auVar41._20_4_ = fVar369;
    fVar370 = fStack_6d8 * auVar116._24_4_ * 3.0;
    auVar41._24_4_ = fVar370;
    auVar41._28_4_ = auVar238._28_4_;
    auVar28 = vsubps_avx(local_1c0,auVar40);
    auVar116 = vperm2f128_avx(auVar28,auVar28,1);
    auVar116 = vshufps_avx(auVar116,auVar28,0x30);
    auVar116 = vshufps_avx(auVar28,auVar116,0x29);
    auVar31 = vsubps_avx(local_1e0,auVar41);
    auVar28 = vperm2f128_avx(auVar31,auVar31,1);
    auVar28 = vshufps_avx(auVar28,auVar31,0x30);
    auVar32 = vshufps_avx(auVar31,auVar28,0x29);
    fVar405 = auVar140._0_4_;
    fVar409 = auVar140._4_4_;
    fVar410 = auVar140._8_4_;
    fVar213 = auVar201._0_4_;
    fVar242 = auVar201._4_4_;
    fVar340 = auVar201._8_4_;
    fVar268 = auVar201._12_4_;
    fVar404 = auVar202._12_4_;
    auVar141 = vshufps_avx(auVar290,auVar290,0xaa);
    fVar183 = auVar141._0_4_;
    fVar182 = auVar141._4_4_;
    fVar265 = auVar141._8_4_;
    fVar269 = auVar141._12_4_;
    fVar386 = auVar338._0_4_ * fVar183 + fVar405 * fVar270;
    fVar387 = auVar338._4_4_ * fVar182 + fVar409 * fVar214;
    fVar389 = auVar338._8_4_ * fVar265 + fVar410 * fVar243;
    fVar391 = auVar338._12_4_ * fVar269 + auVar140._12_4_ * fVar267;
    fVar388 = auVar338._16_4_ * fVar183 + fVar405 * fVar341;
    fVar390 = auVar338._20_4_ * fVar182 + fVar409 * fVar342;
    fVar392 = auVar338._24_4_ * fVar265 + fVar410 * fVar36;
    fVar393 = fVar404 + fVar403 + fVar393;
    auVar141 = vshufps_avx(auVar290,auVar290,0xff);
    fVar157 = auVar141._0_4_;
    fVar215 = auVar141._4_4_;
    fVar266 = auVar141._8_4_;
    fVar339 = auVar141._12_4_;
    fVar371 = auVar338._0_4_ * fVar157 + fVar270 * fVar213;
    fVar283 = auVar338._4_4_ * fVar215 + fVar214 * fVar242;
    fVar372 = auVar338._8_4_ * fVar266 + fVar243 * fVar340;
    fVar284 = auVar338._12_4_ * fVar339 + fVar267 * fVar268;
    fVar384 = auVar338._16_4_ * fVar157 + fVar341 * fVar213;
    fVar285 = auVar338._20_4_ * fVar215 + fVar342 * fVar242;
    fVar385 = auVar338._24_4_ * fVar266 + fVar36 * fVar340;
    auVar141 = vshufps_avx(auVar193,auVar193,0xaa);
    auVar261 = vshufps_avx(auVar193,auVar193,0xff);
    fVar403 = auVar261._12_4_;
    auVar122._0_4_ =
         auVar338._0_4_ * fVar386 + fVar270 * (fVar405 * auVar338._0_4_ + auVar223._0_4_ * fVar270);
    auVar122._4_4_ =
         auVar338._4_4_ * fVar387 + fVar214 * (fVar409 * auVar338._4_4_ + auVar223._4_4_ * fVar214);
    auVar122._8_4_ =
         auVar338._8_4_ * fVar389 + fVar243 * (fVar410 * auVar338._8_4_ + auVar223._8_4_ * fVar243);
    auVar122._12_4_ =
         auVar338._12_4_ * fVar391 +
         fVar267 * (auVar140._12_4_ * auVar338._12_4_ + auVar223._12_4_ * fVar267);
    auVar122._16_4_ =
         auVar338._16_4_ * fVar388 +
         fVar341 * (fVar405 * auVar338._16_4_ + auVar223._0_4_ * fVar341);
    auVar122._20_4_ =
         auVar338._20_4_ * fVar390 +
         fVar342 * (fVar409 * auVar338._20_4_ + auVar223._4_4_ * fVar342);
    auVar122._24_4_ =
         auVar338._24_4_ * fVar392 + fVar36 * (fVar410 * auVar338._24_4_ + auVar223._8_4_ * fVar36);
    auVar122._28_4_ = fVar403 + auVar31._28_4_ + auVar28._28_4_;
    auVar402._0_4_ =
         auVar338._0_4_ * fVar371 + fVar270 * (auVar338._0_4_ * fVar213 + auVar202._0_4_ * fVar270);
    auVar402._4_4_ =
         auVar338._4_4_ * fVar283 + fVar214 * (auVar338._4_4_ * fVar242 + auVar202._4_4_ * fVar214);
    auVar402._8_4_ =
         auVar338._8_4_ * fVar372 + fVar243 * (auVar338._8_4_ * fVar340 + auVar202._8_4_ * fVar243);
    auVar402._12_4_ =
         auVar338._12_4_ * fVar284 + fVar267 * (auVar338._12_4_ * fVar268 + fVar404 * fVar267);
    auVar402._16_4_ =
         auVar338._16_4_ * fVar384 +
         fVar341 * (auVar338._16_4_ * fVar213 + auVar202._0_4_ * fVar341);
    auVar402._20_4_ =
         auVar338._20_4_ * fVar285 +
         fVar342 * (auVar338._20_4_ * fVar242 + auVar202._4_4_ * fVar342);
    auVar402._24_4_ =
         auVar338._24_4_ * fVar385 + fVar36 * (auVar338._24_4_ * fVar340 + auVar202._8_4_ * fVar36);
    auVar402._28_4_ = fVar403 + auVar28._28_4_ + auVar238._28_4_;
    auVar28 = vperm2f128_avx(local_1c0,local_1c0,1);
    auVar28 = vshufps_avx(auVar28,local_1c0,0x30);
    auVar33 = vshufps_avx(local_1c0,auVar28,0x29);
    auVar239._0_4_ =
         fVar270 * fVar386 + auVar338._0_4_ * (auVar141._0_4_ * auVar338._0_4_ + fVar270 * fVar183);
    auVar239._4_4_ =
         fVar214 * fVar387 + auVar338._4_4_ * (auVar141._4_4_ * auVar338._4_4_ + fVar214 * fVar182);
    auVar239._8_4_ =
         fVar243 * fVar389 + auVar338._8_4_ * (auVar141._8_4_ * auVar338._8_4_ + fVar243 * fVar265);
    auVar239._12_4_ =
         fVar267 * fVar391 +
         auVar338._12_4_ * (auVar141._12_4_ * auVar338._12_4_ + fVar267 * fVar269);
    auVar239._16_4_ =
         fVar341 * fVar388 +
         auVar338._16_4_ * (auVar141._0_4_ * auVar338._16_4_ + fVar341 * fVar183);
    auVar239._20_4_ =
         fVar342 * fVar390 +
         auVar338._20_4_ * (auVar141._4_4_ * auVar338._20_4_ + fVar342 * fVar182);
    auVar239._24_4_ =
         fVar36 * fVar392 + auVar338._24_4_ * (auVar141._8_4_ * auVar338._24_4_ + fVar36 * fVar265);
    auVar239._28_4_ = fVar393 + auVar141._12_4_ + fVar269;
    auVar282._0_4_ =
         fVar270 * fVar371 + auVar338._0_4_ * (auVar261._0_4_ * auVar338._0_4_ + fVar270 * fVar157);
    auVar282._4_4_ =
         fVar214 * fVar283 + auVar338._4_4_ * (auVar261._4_4_ * auVar338._4_4_ + fVar214 * fVar215);
    auVar282._8_4_ =
         fVar243 * fVar372 + auVar338._8_4_ * (auVar261._8_4_ * auVar338._8_4_ + fVar243 * fVar266);
    auVar282._12_4_ =
         fVar267 * fVar284 + auVar338._12_4_ * (fVar403 * auVar338._12_4_ + fVar267 * fVar339);
    auVar282._16_4_ =
         fVar341 * fVar384 +
         auVar338._16_4_ * (auVar261._0_4_ * auVar338._16_4_ + fVar341 * fVar157);
    auVar282._20_4_ =
         fVar342 * fVar285 +
         auVar338._20_4_ * (auVar261._4_4_ * auVar338._20_4_ + fVar342 * fVar215);
    auVar282._24_4_ =
         fVar36 * fVar385 + auVar338._24_4_ * (auVar261._8_4_ * auVar338._24_4_ + fVar36 * fVar266);
    auVar282._28_4_ = fVar404 + fVar268 + fVar403 + fVar339;
    auVar300._0_4_ = fVar270 * auVar122._0_4_ + auVar338._0_4_ * auVar239._0_4_;
    auVar300._4_4_ = fVar214 * auVar122._4_4_ + auVar338._4_4_ * auVar239._4_4_;
    auVar300._8_4_ = fVar243 * auVar122._8_4_ + auVar338._8_4_ * auVar239._8_4_;
    auVar300._12_4_ = fVar267 * auVar122._12_4_ + auVar338._12_4_ * auVar239._12_4_;
    auVar300._16_4_ = fVar341 * auVar122._16_4_ + auVar338._16_4_ * auVar239._16_4_;
    auVar300._20_4_ = fVar342 * auVar122._20_4_ + auVar338._20_4_ * auVar239._20_4_;
    auVar300._24_4_ = fVar36 * auVar122._24_4_ + auVar338._24_4_ * auVar239._24_4_;
    auVar300._28_4_ = fVar393 + fVar403 + fVar339;
    auVar322._0_4_ = fVar270 * auVar402._0_4_ + auVar338._0_4_ * auVar282._0_4_;
    auVar322._4_4_ = fVar214 * auVar402._4_4_ + auVar338._4_4_ * auVar282._4_4_;
    auVar322._8_4_ = fVar243 * auVar402._8_4_ + auVar338._8_4_ * auVar282._8_4_;
    auVar322._12_4_ = fVar267 * auVar402._12_4_ + auVar338._12_4_ * auVar282._12_4_;
    auVar322._16_4_ = fVar341 * auVar402._16_4_ + auVar338._16_4_ * auVar282._16_4_;
    auVar322._20_4_ = fVar342 * auVar402._20_4_ + auVar338._20_4_ * auVar282._20_4_;
    auVar322._24_4_ = fVar36 * auVar402._24_4_ + auVar338._24_4_ * auVar282._24_4_;
    auVar322._28_4_ = auVar29._28_4_ + auVar338._28_4_;
    auVar28 = vsubps_avx(auVar239,auVar122);
    auVar29 = vsubps_avx(auVar282,auVar402);
    local_240 = (float)local_6e0._0_4_ * auVar28._0_4_ * 3.0;
    fStack_23c = (float)local_6e0._4_4_ * auVar28._4_4_ * 3.0;
    auVar42._4_4_ = fStack_23c;
    auVar42._0_4_ = local_240;
    fStack_238 = fStack_6d8 * auVar28._8_4_ * 3.0;
    auVar42._8_4_ = fStack_238;
    fStack_234 = fStack_6d4 * auVar28._12_4_ * 3.0;
    auVar42._12_4_ = fStack_234;
    fStack_230 = (float)local_6e0._0_4_ * auVar28._16_4_ * 3.0;
    auVar42._16_4_ = fStack_230;
    fStack_22c = (float)local_6e0._4_4_ * auVar28._20_4_ * 3.0;
    auVar42._20_4_ = fStack_22c;
    fStack_228 = fStack_6d8 * auVar28._24_4_ * 3.0;
    auVar42._24_4_ = fStack_228;
    auVar42._28_4_ = auVar282._28_4_;
    local_260 = (float)local_6e0._0_4_ * auVar29._0_4_ * 3.0;
    fStack_25c = (float)local_6e0._4_4_ * auVar29._4_4_ * 3.0;
    auVar43._4_4_ = fStack_25c;
    auVar43._0_4_ = local_260;
    fStack_258 = fStack_6d8 * auVar29._8_4_ * 3.0;
    auVar43._8_4_ = fStack_258;
    fStack_254 = fStack_6d4 * auVar29._12_4_ * 3.0;
    auVar43._12_4_ = fStack_254;
    local_6e0._0_4_ = (float)local_6e0._0_4_ * auVar29._16_4_ * 3.0;
    auVar43._16_4_ = local_6e0._0_4_;
    local_6e0._4_4_ = (float)local_6e0._4_4_ * auVar29._20_4_ * 3.0;
    auVar43._20_4_ = local_6e0._4_4_;
    fStack_6d8 = fStack_6d8 * auVar29._24_4_ * 3.0;
    auVar43._24_4_ = fStack_6d8;
    auVar43._28_4_ = fStack_6d4;
    auVar28 = vperm2f128_avx(auVar300,auVar300,1);
    auVar28 = vshufps_avx(auVar28,auVar300,0x30);
    auVar34 = vshufps_avx(auVar300,auVar28,0x29);
    auVar29 = vsubps_avx(auVar300,auVar42);
    auVar28 = vperm2f128_avx(auVar29,auVar29,1);
    auVar28 = vshufps_avx(auVar28,auVar29,0x30);
    auVar35 = vshufps_avx(auVar29,auVar28,0x29);
    auVar29 = vsubps_avx(auVar322,auVar43);
    auVar28 = vperm2f128_avx(auVar29,auVar29,1);
    auVar28 = vshufps_avx(auVar28,auVar29,0x30);
    auVar38 = vshufps_avx(auVar29,auVar28,0x29);
    auVar31 = vsubps_avx(auVar300,local_1c0);
    auVar117 = vsubps_avx(auVar34,auVar33);
    fVar270 = auVar117._0_4_ + auVar31._0_4_;
    fVar213 = auVar117._4_4_ + auVar31._4_4_;
    fVar183 = auVar117._8_4_ + auVar31._8_4_;
    fVar157 = auVar117._12_4_ + auVar31._12_4_;
    fVar214 = auVar117._16_4_ + auVar31._16_4_;
    fVar242 = auVar117._20_4_ + auVar31._20_4_;
    fVar182 = auVar117._24_4_ + auVar31._24_4_;
    auVar29 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar29 = vshufps_avx(auVar29,local_1e0,0x30);
    local_200 = vshufps_avx(local_1e0,auVar29,0x29);
    auVar29 = vperm2f128_avx(auVar322,auVar322,1);
    auVar29 = vshufps_avx(auVar29,auVar322,0x30);
    auVar39 = vshufps_avx(auVar322,auVar29,0x29);
    auVar29 = vsubps_avx(auVar322,local_1e0);
    auVar118 = vsubps_avx(auVar39,local_200);
    fVar215 = auVar29._0_4_ + auVar118._0_4_;
    fVar243 = auVar29._4_4_ + auVar118._4_4_;
    fVar340 = auVar29._8_4_ + auVar118._8_4_;
    fVar265 = auVar29._12_4_ + auVar118._12_4_;
    fVar266 = auVar29._16_4_ + auVar118._16_4_;
    fVar267 = auVar29._20_4_ + auVar118._20_4_;
    fVar268 = auVar29._24_4_ + auVar118._24_4_;
    fVar269 = auVar29._28_4_;
    auVar44._4_4_ = local_1e0._4_4_ * fVar213;
    auVar44._0_4_ = local_1e0._0_4_ * fVar270;
    auVar44._8_4_ = local_1e0._8_4_ * fVar183;
    auVar44._12_4_ = local_1e0._12_4_ * fVar157;
    auVar44._16_4_ = local_1e0._16_4_ * fVar214;
    auVar44._20_4_ = local_1e0._20_4_ * fVar242;
    auVar44._24_4_ = local_1e0._24_4_ * fVar182;
    auVar44._28_4_ = fVar269;
    auVar45._4_4_ = fVar243 * local_1c0._4_4_;
    auVar45._0_4_ = fVar215 * local_1c0._0_4_;
    auVar45._8_4_ = fVar340 * local_1c0._8_4_;
    auVar45._12_4_ = fVar265 * local_1c0._12_4_;
    auVar45._16_4_ = fVar266 * local_1c0._16_4_;
    auVar45._20_4_ = fVar267 * local_1c0._20_4_;
    auVar45._24_4_ = fVar268 * local_1c0._24_4_;
    auVar45._28_4_ = auVar28._28_4_;
    auVar29 = vsubps_avx(auVar44,auVar45);
    local_220 = local_1c0._0_4_ + local_220;
    fStack_21c = local_1c0._4_4_ + fStack_21c;
    fStack_218 = local_1c0._8_4_ + fStack_218;
    fStack_214 = local_1c0._12_4_ + fStack_214;
    fStack_210 = local_1c0._16_4_ + fStack_210;
    fStack_20c = local_1c0._20_4_ + fStack_20c;
    fStack_208 = local_1c0._24_4_ + fStack_208;
    fStack_204 = local_1c0._28_4_ + auVar30._28_4_;
    fVar366 = local_1e0._0_4_ + fVar366;
    fVar241 = local_1e0._4_4_ + fVar241;
    fVar367 = local_1e0._8_4_ + fVar367;
    fVar244 = local_1e0._12_4_ + fVar244;
    fVar368 = local_1e0._16_4_ + fVar368;
    fVar369 = local_1e0._20_4_ + fVar369;
    fVar370 = local_1e0._24_4_ + fVar370;
    auVar46._4_4_ = fVar241 * fVar213;
    auVar46._0_4_ = fVar366 * fVar270;
    auVar46._8_4_ = fVar367 * fVar183;
    auVar46._12_4_ = fVar244 * fVar157;
    auVar46._16_4_ = fVar368 * fVar214;
    auVar46._20_4_ = fVar369 * fVar242;
    auVar46._24_4_ = fVar370 * fVar182;
    auVar46._28_4_ = fVar269;
    auVar47._4_4_ = fVar243 * fStack_21c;
    auVar47._0_4_ = fVar215 * local_220;
    auVar47._8_4_ = fVar340 * fStack_218;
    auVar47._12_4_ = fVar265 * fStack_214;
    auVar47._16_4_ = fVar266 * fStack_210;
    auVar47._20_4_ = fVar267 * fStack_20c;
    auVar47._24_4_ = fVar268 * fStack_208;
    auVar47._28_4_ = fStack_204;
    auVar30 = vsubps_avx(auVar46,auVar47);
    auVar48._4_4_ = auVar32._4_4_ * fVar213;
    auVar48._0_4_ = auVar32._0_4_ * fVar270;
    auVar48._8_4_ = auVar32._8_4_ * fVar183;
    auVar48._12_4_ = auVar32._12_4_ * fVar157;
    auVar48._16_4_ = auVar32._16_4_ * fVar214;
    auVar48._20_4_ = auVar32._20_4_ * fVar242;
    auVar48._24_4_ = auVar32._24_4_ * fVar182;
    auVar48._28_4_ = fVar269;
    local_680 = auVar116._0_4_;
    fStack_67c = auVar116._4_4_;
    fStack_678 = auVar116._8_4_;
    fStack_674 = auVar116._12_4_;
    fStack_670 = auVar116._16_4_;
    fStack_66c = auVar116._20_4_;
    fStack_668 = auVar116._24_4_;
    auVar49._4_4_ = fVar243 * fStack_67c;
    auVar49._0_4_ = fVar215 * local_680;
    auVar49._8_4_ = fVar340 * fStack_678;
    auVar49._12_4_ = fVar265 * fStack_674;
    auVar49._16_4_ = fVar266 * fStack_670;
    auVar49._20_4_ = fVar267 * fStack_66c;
    auVar49._24_4_ = fVar268 * fStack_668;
    auVar49._28_4_ = 0x40400000;
    auVar151 = vsubps_avx(auVar48,auVar49);
    auVar50._4_4_ = local_200._4_4_ * fVar213;
    auVar50._0_4_ = local_200._0_4_ * fVar270;
    auVar50._8_4_ = local_200._8_4_ * fVar183;
    auVar50._12_4_ = local_200._12_4_ * fVar157;
    auVar50._16_4_ = local_200._16_4_ * fVar214;
    auVar50._20_4_ = local_200._20_4_ * fVar242;
    auVar50._24_4_ = local_200._24_4_ * fVar182;
    auVar50._28_4_ = fVar269;
    auVar51._4_4_ = auVar33._4_4_ * fVar243;
    auVar51._0_4_ = auVar33._0_4_ * fVar215;
    auVar51._8_4_ = auVar33._8_4_ * fVar340;
    auVar51._12_4_ = auVar33._12_4_ * fVar265;
    auVar51._16_4_ = auVar33._16_4_ * fVar266;
    auVar51._20_4_ = auVar33._20_4_ * fVar267;
    auVar51._24_4_ = auVar33._24_4_ * fVar268;
    auVar51._28_4_ = local_200._28_4_;
    auVar152 = vsubps_avx(auVar50,auVar51);
    auVar52._4_4_ = auVar322._4_4_ * fVar213;
    auVar52._0_4_ = auVar322._0_4_ * fVar270;
    auVar52._8_4_ = auVar322._8_4_ * fVar183;
    auVar52._12_4_ = auVar322._12_4_ * fVar157;
    auVar52._16_4_ = auVar322._16_4_ * fVar214;
    auVar52._20_4_ = auVar322._20_4_ * fVar242;
    auVar52._24_4_ = auVar322._24_4_ * fVar182;
    auVar52._28_4_ = fVar269;
    auVar53._4_4_ = fVar243 * auVar300._4_4_;
    auVar53._0_4_ = fVar215 * auVar300._0_4_;
    auVar53._8_4_ = fVar340 * auVar300._8_4_;
    auVar53._12_4_ = fVar265 * auVar300._12_4_;
    auVar53._16_4_ = fVar266 * auVar300._16_4_;
    auVar53._20_4_ = fVar267 * auVar300._20_4_;
    auVar53._24_4_ = fVar268 * auVar300._24_4_;
    auVar53._28_4_ = auVar32._28_4_;
    auVar153 = vsubps_avx(auVar52,auVar53);
    local_240 = auVar300._0_4_ + local_240;
    fStack_23c = auVar300._4_4_ + fStack_23c;
    fStack_238 = auVar300._8_4_ + fStack_238;
    fStack_234 = auVar300._12_4_ + fStack_234;
    fStack_230 = auVar300._16_4_ + fStack_230;
    fStack_22c = auVar300._20_4_ + fStack_22c;
    fStack_228 = auVar300._24_4_ + fStack_228;
    fStack_224 = auVar300._28_4_ + auVar282._28_4_;
    local_260 = auVar322._0_4_ + local_260;
    fStack_25c = auVar322._4_4_ + fStack_25c;
    fStack_258 = auVar322._8_4_ + fStack_258;
    fStack_254 = auVar322._12_4_ + fStack_254;
    fStack_250 = auVar322._16_4_ + (float)local_6e0._0_4_;
    fStack_24c = auVar322._20_4_ + (float)local_6e0._4_4_;
    fStack_248 = auVar322._24_4_ + fStack_6d8;
    fStack_244 = auVar322._28_4_ + fStack_6d4;
    auVar54._4_4_ = fStack_25c * fVar213;
    auVar54._0_4_ = local_260 * fVar270;
    auVar54._8_4_ = fStack_258 * fVar183;
    auVar54._12_4_ = fStack_254 * fVar157;
    auVar54._16_4_ = fStack_250 * fVar214;
    auVar54._20_4_ = fStack_24c * fVar242;
    auVar54._24_4_ = fStack_248 * fVar182;
    auVar54._28_4_ = auVar322._28_4_ + fStack_6d4;
    auVar55._4_4_ = fStack_23c * fVar243;
    auVar55._0_4_ = local_240 * fVar215;
    auVar55._8_4_ = fStack_238 * fVar340;
    auVar55._12_4_ = fStack_234 * fVar265;
    auVar55._16_4_ = fStack_230 * fVar266;
    auVar55._20_4_ = fStack_22c * fVar267;
    auVar55._24_4_ = fStack_228 * fVar268;
    auVar55._28_4_ = fStack_224;
    auVar176 = vsubps_avx(auVar54,auVar55);
    auVar56._4_4_ = auVar38._4_4_ * fVar213;
    auVar56._0_4_ = auVar38._0_4_ * fVar270;
    auVar56._8_4_ = auVar38._8_4_ * fVar183;
    auVar56._12_4_ = auVar38._12_4_ * fVar157;
    auVar56._16_4_ = auVar38._16_4_ * fVar214;
    auVar56._20_4_ = auVar38._20_4_ * fVar242;
    auVar56._24_4_ = auVar38._24_4_ * fVar182;
    auVar56._28_4_ = fStack_224;
    auVar57._4_4_ = fVar243 * auVar35._4_4_;
    auVar57._0_4_ = fVar215 * auVar35._0_4_;
    auVar57._8_4_ = fVar340 * auVar35._8_4_;
    auVar57._12_4_ = fVar265 * auVar35._12_4_;
    auVar57._16_4_ = fVar266 * auVar35._16_4_;
    auVar57._20_4_ = fVar267 * auVar35._20_4_;
    auVar57._24_4_ = fVar268 * auVar35._24_4_;
    auVar57._28_4_ = auVar35._28_4_;
    auVar177 = vsubps_avx(auVar56,auVar57);
    auVar58._4_4_ = auVar39._4_4_ * fVar213;
    auVar58._0_4_ = auVar39._0_4_ * fVar270;
    auVar58._8_4_ = auVar39._8_4_ * fVar183;
    auVar58._12_4_ = auVar39._12_4_ * fVar157;
    auVar58._16_4_ = auVar39._16_4_ * fVar214;
    auVar58._20_4_ = auVar39._20_4_ * fVar242;
    auVar58._24_4_ = auVar39._24_4_ * fVar182;
    auVar58._28_4_ = auVar117._28_4_ + auVar31._28_4_;
    auVar59._4_4_ = auVar34._4_4_ * fVar243;
    auVar59._0_4_ = auVar34._0_4_ * fVar215;
    auVar59._8_4_ = auVar34._8_4_ * fVar340;
    auVar59._12_4_ = auVar34._12_4_ * fVar265;
    auVar59._16_4_ = auVar34._16_4_ * fVar266;
    auVar59._20_4_ = auVar34._20_4_ * fVar267;
    auVar59._24_4_ = auVar34._24_4_ * fVar268;
    auVar59._28_4_ = fVar269 + auVar118._28_4_;
    auVar117 = vsubps_avx(auVar58,auVar59);
    auVar28 = vminps_avx(auVar29,auVar30);
    auVar116 = vmaxps_avx(auVar29,auVar30);
    auVar29 = vminps_avx(auVar151,auVar152);
    auVar29 = vminps_avx(auVar28,auVar29);
    auVar28 = vmaxps_avx(auVar151,auVar152);
    auVar116 = vmaxps_avx(auVar116,auVar28);
    auVar30 = vminps_avx(auVar153,auVar176);
    auVar28 = vmaxps_avx(auVar153,auVar176);
    auVar31 = vminps_avx(auVar177,auVar117);
    auVar30 = vminps_avx(auVar30,auVar31);
    auVar30 = vminps_avx(auVar29,auVar30);
    auVar29 = vmaxps_avx(auVar177,auVar117);
    auVar28 = vmaxps_avx(auVar28,auVar29);
    auVar28 = vmaxps_avx(auVar116,auVar28);
    auVar116 = vcmpps_avx(auVar30,local_280,2);
    auVar28 = vcmpps_avx(auVar28,local_2a0,5);
    auVar116 = vandps_avx(auVar28,auVar116);
    auVar28 = local_340 & auVar116;
    uVar91 = 0;
    if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar28 >> 0x7f,0) != '\0') ||
          (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar28 >> 0xbf,0) != '\0') ||
        (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar28[0x1f] < '\0')
    {
      auVar28 = vsubps_avx(auVar33,local_1c0);
      auVar29 = vsubps_avx(auVar34,auVar300);
      fVar213 = auVar28._0_4_ + auVar29._0_4_;
      fVar183 = auVar28._4_4_ + auVar29._4_4_;
      fVar157 = auVar28._8_4_ + auVar29._8_4_;
      fVar214 = auVar28._12_4_ + auVar29._12_4_;
      fVar242 = auVar28._16_4_ + auVar29._16_4_;
      fVar182 = auVar28._20_4_ + auVar29._20_4_;
      fVar215 = auVar28._24_4_ + auVar29._24_4_;
      auVar30 = vsubps_avx(local_200,local_1e0);
      auVar31 = vsubps_avx(auVar39,auVar322);
      fVar243 = auVar30._0_4_ + auVar31._0_4_;
      fVar340 = auVar30._4_4_ + auVar31._4_4_;
      fVar265 = auVar30._8_4_ + auVar31._8_4_;
      fVar266 = auVar30._12_4_ + auVar31._12_4_;
      fVar267 = auVar30._16_4_ + auVar31._16_4_;
      fVar268 = auVar30._20_4_ + auVar31._20_4_;
      fVar269 = auVar30._24_4_ + auVar31._24_4_;
      fVar270 = auVar31._28_4_;
      auVar60._4_4_ = local_1e0._4_4_ * fVar183;
      auVar60._0_4_ = local_1e0._0_4_ * fVar213;
      auVar60._8_4_ = local_1e0._8_4_ * fVar157;
      auVar60._12_4_ = local_1e0._12_4_ * fVar214;
      auVar60._16_4_ = local_1e0._16_4_ * fVar242;
      auVar60._20_4_ = local_1e0._20_4_ * fVar182;
      auVar60._24_4_ = local_1e0._24_4_ * fVar215;
      auVar60._28_4_ = local_1e0._28_4_;
      auVar61._4_4_ = local_1c0._4_4_ * fVar340;
      auVar61._0_4_ = local_1c0._0_4_ * fVar243;
      auVar61._8_4_ = local_1c0._8_4_ * fVar265;
      auVar61._12_4_ = local_1c0._12_4_ * fVar266;
      auVar61._16_4_ = local_1c0._16_4_ * fVar267;
      auVar61._20_4_ = local_1c0._20_4_ * fVar268;
      auVar61._24_4_ = local_1c0._24_4_ * fVar269;
      auVar61._28_4_ = local_1c0._28_4_;
      auVar31 = vsubps_avx(auVar60,auVar61);
      auVar62._4_4_ = fVar241 * fVar183;
      auVar62._0_4_ = fVar366 * fVar213;
      auVar62._8_4_ = fVar367 * fVar157;
      auVar62._12_4_ = fVar244 * fVar214;
      auVar62._16_4_ = fVar368 * fVar242;
      auVar62._20_4_ = fVar369 * fVar182;
      auVar62._24_4_ = fVar370 * fVar215;
      auVar62._28_4_ = local_1e0._28_4_;
      auVar63._4_4_ = fVar340 * fStack_21c;
      auVar63._0_4_ = fVar243 * local_220;
      auVar63._8_4_ = fVar265 * fStack_218;
      auVar63._12_4_ = fVar266 * fStack_214;
      auVar63._16_4_ = fVar267 * fStack_210;
      auVar63._20_4_ = fVar268 * fStack_20c;
      auVar63._24_4_ = fVar269 * fStack_208;
      auVar63._28_4_ = fVar270;
      auVar117 = vsubps_avx(auVar62,auVar63);
      auVar64._4_4_ = fVar183 * auVar32._4_4_;
      auVar64._0_4_ = fVar213 * auVar32._0_4_;
      auVar64._8_4_ = fVar157 * auVar32._8_4_;
      auVar64._12_4_ = fVar214 * auVar32._12_4_;
      auVar64._16_4_ = fVar242 * auVar32._16_4_;
      auVar64._20_4_ = fVar182 * auVar32._20_4_;
      auVar64._24_4_ = fVar215 * auVar32._24_4_;
      auVar64._28_4_ = fVar270;
      auVar65._4_4_ = fVar340 * fStack_67c;
      auVar65._0_4_ = fVar243 * local_680;
      auVar65._8_4_ = fVar265 * fStack_678;
      auVar65._12_4_ = fVar266 * fStack_674;
      auVar65._16_4_ = fVar267 * fStack_670;
      auVar65._20_4_ = fVar268 * fStack_66c;
      auVar65._24_4_ = fVar269 * fStack_668;
      auVar65._28_4_ = local_1e0._28_4_ + auVar238._28_4_;
      auVar32 = vsubps_avx(auVar64,auVar65);
      auVar66._4_4_ = local_200._4_4_ * fVar183;
      auVar66._0_4_ = local_200._0_4_ * fVar213;
      auVar66._8_4_ = local_200._8_4_ * fVar157;
      auVar66._12_4_ = local_200._12_4_ * fVar214;
      auVar66._16_4_ = local_200._16_4_ * fVar242;
      auVar66._20_4_ = local_200._20_4_ * fVar182;
      auVar66._24_4_ = local_200._24_4_ * fVar215;
      auVar66._28_4_ = local_1e0._28_4_ + auVar238._28_4_;
      auVar67._4_4_ = auVar33._4_4_ * fVar340;
      auVar67._0_4_ = auVar33._0_4_ * fVar243;
      auVar67._8_4_ = auVar33._8_4_ * fVar265;
      auVar67._12_4_ = auVar33._12_4_ * fVar266;
      auVar67._16_4_ = auVar33._16_4_ * fVar267;
      auVar67._20_4_ = auVar33._20_4_ * fVar268;
      uVar4 = auVar33._28_4_;
      auVar67._24_4_ = auVar33._24_4_ * fVar269;
      auVar67._28_4_ = uVar4;
      auVar33 = vsubps_avx(auVar66,auVar67);
      auVar68._4_4_ = auVar322._4_4_ * fVar183;
      auVar68._0_4_ = auVar322._0_4_ * fVar213;
      auVar68._8_4_ = auVar322._8_4_ * fVar157;
      auVar68._12_4_ = auVar322._12_4_ * fVar214;
      auVar68._16_4_ = auVar322._16_4_ * fVar242;
      auVar68._20_4_ = auVar322._20_4_ * fVar182;
      auVar68._24_4_ = auVar322._24_4_ * fVar215;
      auVar68._28_4_ = auVar322._28_4_;
      auVar69._4_4_ = auVar300._4_4_ * fVar340;
      auVar69._0_4_ = auVar300._0_4_ * fVar243;
      auVar69._8_4_ = auVar300._8_4_ * fVar265;
      auVar69._12_4_ = auVar300._12_4_ * fVar266;
      auVar69._16_4_ = auVar300._16_4_ * fVar267;
      auVar69._20_4_ = auVar300._20_4_ * fVar268;
      auVar69._24_4_ = auVar300._24_4_ * fVar269;
      auVar69._28_4_ = auVar300._28_4_;
      auVar118 = vsubps_avx(auVar68,auVar69);
      auVar70._4_4_ = fVar183 * fStack_25c;
      auVar70._0_4_ = fVar213 * local_260;
      auVar70._8_4_ = fVar157 * fStack_258;
      auVar70._12_4_ = fVar214 * fStack_254;
      auVar70._16_4_ = fVar242 * fStack_250;
      auVar70._20_4_ = fVar182 * fStack_24c;
      auVar70._24_4_ = fVar215 * fStack_248;
      auVar70._28_4_ = auVar322._28_4_;
      auVar71._4_4_ = fVar340 * fStack_23c;
      auVar71._0_4_ = fVar243 * local_240;
      auVar71._8_4_ = fVar265 * fStack_238;
      auVar71._12_4_ = fVar266 * fStack_234;
      auVar71._16_4_ = fVar267 * fStack_230;
      auVar71._20_4_ = fVar268 * fStack_22c;
      auVar71._24_4_ = fVar269 * fStack_228;
      auVar71._28_4_ = uVar4;
      auVar151 = vsubps_avx(auVar70,auVar71);
      auVar72._4_4_ = fVar183 * auVar38._4_4_;
      auVar72._0_4_ = fVar213 * auVar38._0_4_;
      auVar72._8_4_ = fVar157 * auVar38._8_4_;
      auVar72._12_4_ = fVar214 * auVar38._12_4_;
      auVar72._16_4_ = fVar242 * auVar38._16_4_;
      auVar72._20_4_ = fVar182 * auVar38._20_4_;
      auVar72._24_4_ = fVar215 * auVar38._24_4_;
      auVar72._28_4_ = uVar4;
      auVar73._4_4_ = fVar340 * auVar35._4_4_;
      auVar73._0_4_ = fVar243 * auVar35._0_4_;
      auVar73._8_4_ = fVar265 * auVar35._8_4_;
      auVar73._12_4_ = fVar266 * auVar35._12_4_;
      auVar73._16_4_ = fVar267 * auVar35._16_4_;
      auVar73._20_4_ = fVar268 * auVar35._20_4_;
      auVar73._24_4_ = fVar269 * auVar35._24_4_;
      auVar73._28_4_ = local_200._28_4_;
      auVar35 = vsubps_avx(auVar72,auVar73);
      auVar74._4_4_ = auVar39._4_4_ * fVar183;
      auVar74._0_4_ = auVar39._0_4_ * fVar213;
      auVar74._8_4_ = auVar39._8_4_ * fVar157;
      auVar74._12_4_ = auVar39._12_4_ * fVar214;
      auVar74._16_4_ = auVar39._16_4_ * fVar242;
      auVar74._20_4_ = auVar39._20_4_ * fVar182;
      auVar74._24_4_ = auVar39._24_4_ * fVar215;
      auVar74._28_4_ = auVar28._28_4_ + auVar29._28_4_;
      auVar75._4_4_ = auVar34._4_4_ * fVar340;
      auVar75._0_4_ = auVar34._0_4_ * fVar243;
      auVar75._8_4_ = auVar34._8_4_ * fVar265;
      auVar75._12_4_ = auVar34._12_4_ * fVar266;
      auVar75._16_4_ = auVar34._16_4_ * fVar267;
      auVar75._20_4_ = auVar34._20_4_ * fVar268;
      auVar75._24_4_ = auVar34._24_4_ * fVar269;
      auVar75._28_4_ = auVar30._28_4_ + fVar270;
      auVar34 = vsubps_avx(auVar74,auVar75);
      auVar29 = vminps_avx(auVar31,auVar117);
      auVar28 = vmaxps_avx(auVar31,auVar117);
      auVar30 = vminps_avx(auVar32,auVar33);
      auVar30 = vminps_avx(auVar29,auVar30);
      auVar29 = vmaxps_avx(auVar32,auVar33);
      auVar28 = vmaxps_avx(auVar28,auVar29);
      auVar31 = vminps_avx(auVar118,auVar151);
      auVar29 = vmaxps_avx(auVar118,auVar151);
      auVar32 = vminps_avx(auVar35,auVar34);
      auVar31 = vminps_avx(auVar31,auVar32);
      auVar31 = vminps_avx(auVar30,auVar31);
      auVar30 = vmaxps_avx(auVar35,auVar34);
      auVar29 = vmaxps_avx(auVar29,auVar30);
      auVar29 = vmaxps_avx(auVar28,auVar29);
      auVar28 = vcmpps_avx(auVar31,local_280,2);
      auVar29 = vcmpps_avx(auVar29,local_2a0,5);
      auVar28 = vandps_avx(auVar29,auVar28);
      auVar116 = vandps_avx(auVar116,local_340);
      auVar29 = auVar116 & auVar28;
      if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar29 >> 0x7f,0) != '\0') ||
            (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar29 >> 0xbf,0) != '\0') ||
          (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar29[0x1f] < '\0') {
        auVar116 = vandps_avx(auVar28,auVar116);
        uVar91 = vmovmskps_avx(auVar116);
      }
    }
    if (uVar91 != 0) {
      auStack_450[uVar93] = uVar91;
      uVar5 = vmovlps_avx(local_400);
      *(undefined8 *)(afStack_320 + uVar93 * 2) = uVar5;
      uVar6 = vmovlps_avx(_local_730);
      auStack_1a0[uVar93] = uVar6;
      uVar93 = (ulong)((int)uVar93 + 1);
    }
    auVar408 = ZEXT864(0) << 0x20;
    do {
      if ((int)uVar93 == 0) {
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar125._4_4_ = uVar4;
        auVar125._0_4_ = uVar4;
        auVar125._8_4_ = uVar4;
        auVar125._12_4_ = uVar4;
        auVar125._16_4_ = uVar4;
        auVar125._20_4_ = uVar4;
        auVar125._24_4_ = uVar4;
        auVar125._28_4_ = uVar4;
        auVar116 = vcmpps_avx(local_2c0,auVar125,2);
        uVar90 = vmovmskps_avx(auVar116);
        uVar89 = uVar89 & local_528 & uVar90;
        if (uVar89 == 0) {
          return;
        }
        goto LAB_0123f677;
      }
      uVar95 = (int)uVar93 - 1;
      uVar96 = (ulong)uVar95;
      uVar91 = auStack_450[uVar96];
      fVar270 = afStack_320[uVar96 * 2];
      fVar213 = afStack_320[uVar96 * 2 + 1];
      register0x00001548 = 0;
      local_730 = (undefined1  [8])auStack_1a0[uVar96];
      uVar6 = 0;
      if (uVar91 != 0) {
        for (; (uVar91 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      uVar91 = uVar91 - 1 & uVar91;
      auStack_450[uVar96] = uVar91;
      if (uVar91 == 0) {
        uVar93 = (ulong)uVar95;
      }
      fVar157 = (float)(uVar6 + 1) * 0.14285715;
      fVar183 = (1.0 - (float)uVar6 * 0.14285715) * fVar270 + fVar213 * (float)uVar6 * 0.14285715;
      fVar270 = (1.0 - fVar157) * fVar270 + fVar213 * fVar157;
      fVar213 = fVar270 - fVar183;
      if (0.16666667 <= fVar213) break;
      auVar141 = vshufps_avx(_local_730,_local_730,0x50);
      auVar170._8_4_ = 0x3f800000;
      auVar170._0_8_ = &DAT_3f8000003f800000;
      auVar170._12_4_ = 0x3f800000;
      auVar223 = vsubps_avx(auVar170,auVar141);
      fVar157 = auVar141._0_4_;
      fVar214 = auVar141._4_4_;
      fVar242 = auVar141._8_4_;
      fVar182 = auVar141._12_4_;
      fVar215 = auVar223._0_4_;
      fVar243 = auVar223._4_4_;
      fVar340 = auVar223._8_4_;
      fVar265 = auVar223._12_4_;
      auVar194._0_4_ = auVar310._0_4_ * fVar157 + fVar215 * (float)local_5f0._0_4_;
      auVar194._4_4_ = auVar310._4_4_ * fVar214 + fVar243 * (float)local_5f0._4_4_;
      auVar194._8_4_ = auVar310._0_4_ * fVar242 + fVar340 * (float)local_5f0._0_4_;
      auVar194._12_4_ = auVar310._4_4_ * fVar182 + fVar265 * (float)local_5f0._4_4_;
      auVar229._0_4_ = auVar323._0_4_ * fVar157 + fVar215 * auVar396._0_4_;
      auVar229._4_4_ = auVar323._4_4_ * fVar214 + fVar243 * auVar396._4_4_;
      auVar229._8_4_ = auVar323._0_4_ * fVar242 + fVar340 * auVar396._0_4_;
      auVar229._12_4_ = auVar323._4_4_ * fVar182 + fVar265 * auVar396._4_4_;
      auVar253._0_4_ = auVar344._0_4_ * fVar157 + auVar377._0_4_ * fVar215;
      auVar253._4_4_ = auVar344._4_4_ * fVar214 + auVar377._4_4_ * fVar243;
      auVar253._8_4_ = auVar344._0_4_ * fVar242 + auVar377._0_4_ * fVar340;
      auVar253._12_4_ = auVar344._4_4_ * fVar182 + auVar377._4_4_ * fVar265;
      auVar137._0_4_ = auVar112._0_4_ * fVar157 + auVar135._0_4_ * fVar215;
      auVar137._4_4_ = auVar112._4_4_ * fVar214 + auVar135._4_4_ * fVar243;
      auVar137._8_4_ = auVar112._0_4_ * fVar242 + auVar135._0_4_ * fVar340;
      auVar137._12_4_ = auVar112._4_4_ * fVar182 + auVar135._4_4_ * fVar265;
      auVar179._16_16_ = auVar194;
      auVar179._0_16_ = auVar194;
      auVar210._16_16_ = auVar229;
      auVar210._0_16_ = auVar229;
      auVar240._16_16_ = auVar253;
      auVar240._0_16_ = auVar253;
      auVar116 = vshufps_avx(ZEXT2032(CONCAT416(fVar270,ZEXT416((uint)fVar183))),
                             ZEXT2032(CONCAT416(fVar270,ZEXT416((uint)fVar183))),0);
      auVar28 = vsubps_avx(auVar210,auVar179);
      fVar157 = auVar116._0_4_;
      fVar214 = auVar116._4_4_;
      fVar242 = auVar116._8_4_;
      fVar182 = auVar116._12_4_;
      fVar215 = auVar116._16_4_;
      fVar243 = auVar116._20_4_;
      fVar340 = auVar116._24_4_;
      auVar180._0_4_ = auVar194._0_4_ + auVar28._0_4_ * fVar157;
      auVar180._4_4_ = auVar194._4_4_ + auVar28._4_4_ * fVar214;
      auVar180._8_4_ = auVar194._8_4_ + auVar28._8_4_ * fVar242;
      auVar180._12_4_ = auVar194._12_4_ + auVar28._12_4_ * fVar182;
      auVar180._16_4_ = auVar194._0_4_ + auVar28._16_4_ * fVar215;
      auVar180._20_4_ = auVar194._4_4_ + auVar28._20_4_ * fVar243;
      auVar180._24_4_ = auVar194._8_4_ + auVar28._24_4_ * fVar340;
      auVar180._28_4_ = auVar194._12_4_ + auVar28._28_4_;
      auVar28 = vsubps_avx(auVar240,auVar210);
      auVar211._0_4_ = auVar229._0_4_ + auVar28._0_4_ * fVar157;
      auVar211._4_4_ = auVar229._4_4_ + auVar28._4_4_ * fVar214;
      auVar211._8_4_ = auVar229._8_4_ + auVar28._8_4_ * fVar242;
      auVar211._12_4_ = auVar229._12_4_ + auVar28._12_4_ * fVar182;
      auVar211._16_4_ = auVar229._0_4_ + auVar28._16_4_ * fVar215;
      auVar211._20_4_ = auVar229._4_4_ + auVar28._20_4_ * fVar243;
      auVar211._24_4_ = auVar229._8_4_ + auVar28._24_4_ * fVar340;
      auVar211._28_4_ = auVar229._12_4_ + auVar28._28_4_;
      auVar141 = vsubps_avx(auVar137,auVar253);
      auVar154._0_4_ = auVar253._0_4_ + auVar141._0_4_ * fVar157;
      auVar154._4_4_ = auVar253._4_4_ + auVar141._4_4_ * fVar214;
      auVar154._8_4_ = auVar253._8_4_ + auVar141._8_4_ * fVar242;
      auVar154._12_4_ = auVar253._12_4_ + auVar141._12_4_ * fVar182;
      auVar154._16_4_ = auVar253._0_4_ + auVar141._0_4_ * fVar215;
      auVar154._20_4_ = auVar253._4_4_ + auVar141._4_4_ * fVar243;
      auVar154._24_4_ = auVar253._8_4_ + auVar141._8_4_ * fVar340;
      auVar154._28_4_ = auVar253._12_4_ + auVar141._12_4_;
      auVar28 = vsubps_avx(auVar211,auVar180);
      auVar181._0_4_ = auVar180._0_4_ + fVar157 * auVar28._0_4_;
      auVar181._4_4_ = auVar180._4_4_ + fVar214 * auVar28._4_4_;
      auVar181._8_4_ = auVar180._8_4_ + fVar242 * auVar28._8_4_;
      auVar181._12_4_ = auVar180._12_4_ + fVar182 * auVar28._12_4_;
      auVar181._16_4_ = auVar180._16_4_ + fVar215 * auVar28._16_4_;
      auVar181._20_4_ = auVar180._20_4_ + fVar243 * auVar28._20_4_;
      auVar181._24_4_ = auVar180._24_4_ + fVar340 * auVar28._24_4_;
      auVar181._28_4_ = auVar180._28_4_ + auVar28._28_4_;
      auVar28 = vsubps_avx(auVar154,auVar211);
      auVar155._0_4_ = auVar211._0_4_ + fVar157 * auVar28._0_4_;
      auVar155._4_4_ = auVar211._4_4_ + fVar214 * auVar28._4_4_;
      auVar155._8_4_ = auVar211._8_4_ + fVar242 * auVar28._8_4_;
      auVar155._12_4_ = auVar211._12_4_ + fVar182 * auVar28._12_4_;
      auVar155._16_4_ = auVar211._16_4_ + fVar215 * auVar28._16_4_;
      auVar155._20_4_ = auVar211._20_4_ + fVar243 * auVar28._20_4_;
      auVar155._24_4_ = auVar211._24_4_ + fVar340 * auVar28._24_4_;
      auVar155._28_4_ = auVar211._28_4_ + auVar28._28_4_;
      auVar28 = vsubps_avx(auVar155,auVar181);
      auVar195._0_4_ = auVar181._0_4_ + fVar157 * auVar28._0_4_;
      auVar195._4_4_ = auVar181._4_4_ + fVar214 * auVar28._4_4_;
      auVar195._8_4_ = auVar181._8_4_ + fVar242 * auVar28._8_4_;
      auVar195._12_4_ = auVar181._12_4_ + fVar182 * auVar28._12_4_;
      auVar212._16_4_ = auVar181._16_4_ + fVar215 * auVar28._16_4_;
      auVar212._0_16_ = auVar195;
      auVar212._20_4_ = auVar181._20_4_ + fVar243 * auVar28._20_4_;
      auVar212._24_4_ = auVar181._24_4_ + fVar340 * auVar28._24_4_;
      auVar212._28_4_ = auVar181._28_4_ + auVar211._28_4_;
      fVar157 = auVar28._4_4_ * 3.0;
      auVar171 = auVar212._16_16_;
      auVar140 = vshufps_avx(ZEXT416((uint)(fVar213 * 0.33333334)),
                             ZEXT416((uint)(fVar213 * 0.33333334)),0);
      auVar324._0_4_ = auVar195._0_4_ + auVar140._0_4_ * auVar28._0_4_ * 3.0;
      auVar324._4_4_ = auVar195._4_4_ + auVar140._4_4_ * fVar157;
      auVar324._8_4_ = auVar195._8_4_ + auVar140._8_4_ * auVar28._8_4_ * 3.0;
      auVar324._12_4_ = auVar195._12_4_ + auVar140._12_4_ * auVar28._12_4_ * 3.0;
      auVar261 = vshufpd_avx(auVar195,auVar195,3);
      auVar202 = vshufpd_avx(auVar171,auVar171,3);
      auVar141 = vsubps_avx(auVar261,auVar195);
      auVar223 = vsubps_avx(auVar202,auVar171);
      auVar138._0_4_ = auVar141._0_4_ + auVar223._0_4_;
      auVar138._4_4_ = auVar141._4_4_ + auVar223._4_4_;
      auVar138._8_4_ = auVar141._8_4_ + auVar223._8_4_;
      auVar138._12_4_ = auVar141._12_4_ + auVar223._12_4_;
      auVar141 = vmovshdup_avx(auVar195);
      auVar223 = vmovshdup_avx(auVar324);
      auVar201 = vshufps_avx(auVar138,auVar138,0);
      auVar114 = vshufps_avx(auVar138,auVar138,0x55);
      fVar243 = auVar114._0_4_;
      fVar340 = auVar114._4_4_;
      fVar265 = auVar114._8_4_;
      fVar266 = auVar114._12_4_;
      fVar214 = auVar201._0_4_;
      fVar242 = auVar201._4_4_;
      fVar182 = auVar201._8_4_;
      fVar215 = auVar201._12_4_;
      auVar311._0_4_ = fVar214 * auVar195._0_4_ + fVar243 * auVar141._0_4_;
      auVar311._4_4_ = fVar242 * auVar195._4_4_ + fVar340 * auVar141._4_4_;
      auVar311._8_4_ = fVar182 * auVar195._8_4_ + fVar265 * auVar141._8_4_;
      auVar311._12_4_ = fVar215 * auVar195._12_4_ + fVar266 * auVar141._12_4_;
      auVar325._0_4_ = auVar324._0_4_ * fVar214 + fVar243 * auVar223._0_4_;
      auVar325._4_4_ = auVar324._4_4_ * fVar242 + fVar340 * auVar223._4_4_;
      auVar325._8_4_ = auVar324._8_4_ * fVar182 + fVar265 * auVar223._8_4_;
      auVar325._12_4_ = auVar324._12_4_ * fVar215 + fVar266 * auVar223._12_4_;
      auVar223 = vshufps_avx(auVar311,auVar311,0xe8);
      auVar201 = vshufps_avx(auVar325,auVar325,0xe8);
      auVar141 = vcmpps_avx(auVar223,auVar201,1);
      uVar91 = vextractps_avx(auVar141,0);
      auVar114 = auVar325;
      if ((uVar91 & 1) == 0) {
        auVar114 = auVar311;
      }
      auVar139._0_4_ = auVar140._0_4_ * auVar28._16_4_ * 3.0;
      auVar139._4_4_ = auVar140._4_4_ * fVar157;
      auVar139._8_4_ = auVar140._8_4_ * auVar28._24_4_ * 3.0;
      auVar139._12_4_ = auVar140._12_4_ * auVar116._28_4_;
      auVar10 = vsubps_avx(auVar171,auVar139);
      auVar140 = vmovshdup_avx(auVar10);
      auVar171 = vmovshdup_avx(auVar171);
      fVar157 = auVar10._0_4_;
      fVar267 = auVar10._4_4_;
      auVar413._0_4_ = fVar214 * fVar157 + fVar243 * auVar140._0_4_;
      auVar413._4_4_ = fVar242 * fVar267 + fVar340 * auVar140._4_4_;
      auVar413._8_4_ = fVar182 * auVar10._8_4_ + fVar265 * auVar140._8_4_;
      auVar413._12_4_ = fVar215 * auVar10._12_4_ + fVar266 * auVar140._12_4_;
      auVar397._0_4_ = fVar214 * auVar212._16_4_ + fVar243 * auVar171._0_4_;
      auVar397._4_4_ = fVar242 * auVar212._20_4_ + fVar340 * auVar171._4_4_;
      auVar397._8_4_ = fVar182 * auVar212._24_4_ + fVar265 * auVar171._8_4_;
      auVar397._12_4_ = fVar215 * auVar212._28_4_ + fVar266 * auVar171._12_4_;
      auVar171 = vshufps_avx(auVar413,auVar413,0xe8);
      auVar9 = vshufps_avx(auVar397,auVar397,0xe8);
      auVar140 = vcmpps_avx(auVar171,auVar9,1);
      uVar91 = vextractps_avx(auVar140,0);
      auVar291 = auVar397;
      if ((uVar91 & 1) == 0) {
        auVar291 = auVar413;
      }
      auVar114 = vmaxss_avx(auVar291,auVar114);
      auVar223 = vminps_avx(auVar223,auVar201);
      auVar201 = vminps_avx(auVar171,auVar9);
      auVar201 = vminps_avx(auVar223,auVar201);
      auVar141 = vshufps_avx(auVar141,auVar141,0x55);
      auVar141 = vblendps_avx(auVar141,auVar140,2);
      auVar140 = vpslld_avx(auVar141,0x1f);
      auVar141 = vshufpd_avx(auVar325,auVar325,1);
      auVar141 = vinsertps_avx(auVar141,auVar397,0x9c);
      auVar223 = vshufpd_avx(auVar311,auVar311,1);
      auVar223 = vinsertps_avx(auVar223,auVar413,0x9c);
      auVar141 = vblendvps_avx(auVar223,auVar141,auVar140);
      auVar223 = vmovshdup_avx(auVar141);
      auVar141 = vmaxss_avx(auVar223,auVar141);
      fVar182 = auVar201._0_4_;
      auVar223 = vmovshdup_avx(auVar201);
      fVar242 = auVar141._0_4_;
      fVar215 = auVar223._0_4_;
      fVar214 = auVar114._0_4_;
      if ((0.0001 <= fVar182) || (fVar242 <= -0.0001)) {
        if ((-0.0001 < fVar214 && fVar215 < 0.0001) ||
           ((fVar182 < 0.0001 && -0.0001 < fVar214 || (fVar215 < 0.0001 && -0.0001 < fVar242))))
        goto LAB_01240d97;
LAB_0124183e:
        bVar76 = true;
        auVar408 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_01240d97:
        auVar408 = ZEXT864(0) << 0x20;
        auVar140 = vcmpps_avx(auVar201,ZEXT816(0) << 0x20,1);
        auVar223 = vcmpss_avx(auVar114,ZEXT416(0),1);
        auVar254._8_4_ = 0x3f800000;
        auVar254._0_8_ = &DAT_3f8000003f800000;
        auVar254._12_4_ = 0x3f800000;
        auVar326._8_4_ = 0xbf800000;
        auVar326._0_8_ = 0xbf800000bf800000;
        auVar326._12_4_ = 0xbf800000;
        auVar223 = vblendvps_avx(auVar254,auVar326,auVar223);
        auVar140 = vblendvps_avx(auVar254,auVar326,auVar140);
        auVar171 = vcmpss_avx(auVar223,auVar140,4);
        auVar171 = vpshufd_avx(ZEXT416(auVar171._0_4_ & 1),0x50);
        auVar171 = vpslld_avx(auVar171,0x1f);
        auVar171 = vpsrad_avx(auVar171,0x1f);
        auVar171 = vpandn_avx(auVar171,_DAT_02020eb0);
        auVar9 = vmovshdup_avx(auVar140);
        fVar243 = auVar9._0_4_;
        local_650 = auVar7._0_4_;
        fStack_64c = auVar7._4_4_;
        fStack_648 = auVar7._8_4_;
        fStack_644 = auVar7._12_4_;
        if ((auVar140._0_4_ != fVar243) || (NAN(auVar140._0_4_) || NAN(fVar243))) {
          if ((fVar215 != fVar182) || (NAN(fVar215) || NAN(fVar182))) {
            fVar182 = -fVar182 / (fVar215 - fVar182);
            auVar140 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar182) * 0.0 + fVar182)));
          }
          else {
            auVar140 = vcmpss_avx(auVar201,ZEXT416(0),0);
            auVar140 = vpshufd_avx(ZEXT416(auVar140._0_4_ & 1),0x50);
            auVar140 = vpslld_avx(auVar140,0x1f);
            auVar140 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar140);
          }
          auVar9 = vcmpps_avx(auVar171,auVar140,1);
          auVar201 = vblendps_avx(auVar171,auVar140,2);
          auVar140 = vblendps_avx(auVar140,auVar171,2);
          auVar171 = vblendvps_avx(auVar140,auVar201,auVar9);
        }
        auVar141 = vcmpss_avx(auVar141,ZEXT416(0),1);
        auVar172._8_4_ = 0x3f800000;
        auVar172._0_8_ = &DAT_3f8000003f800000;
        auVar172._12_4_ = 0x3f800000;
        auVar255._8_4_ = 0xbf800000;
        auVar255._0_8_ = 0xbf800000bf800000;
        auVar255._12_4_ = 0xbf800000;
        auVar141 = vblendvps_avx(auVar172,auVar255,auVar141);
        fVar182 = auVar141._0_4_;
        if ((auVar223._0_4_ != fVar182) || (NAN(auVar223._0_4_) || NAN(fVar182))) {
          if ((fVar242 != fVar214) || (NAN(fVar242) || NAN(fVar214))) {
            fVar214 = -fVar214 / (fVar242 - fVar214);
            auVar141 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar214) * 0.0 + fVar214)));
          }
          else {
            auVar141 = vcmpss_avx(auVar114,ZEXT416(0),0);
            auVar141 = vpshufd_avx(ZEXT416(auVar141._0_4_ & 1),0x50);
            auVar141 = vpslld_avx(auVar141,0x1f);
            auVar141 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar141);
          }
          auVar140 = vcmpps_avx(auVar171,auVar141,1);
          auVar223 = vblendps_avx(auVar171,auVar141,2);
          auVar141 = vblendps_avx(auVar141,auVar171,2);
          auVar171 = vblendvps_avx(auVar141,auVar223,auVar140);
        }
        if ((fVar243 != fVar182) || (NAN(fVar243) || NAN(fVar182))) {
          auVar142._8_4_ = 0x3f800000;
          auVar142._0_8_ = &DAT_3f8000003f800000;
          auVar142._12_4_ = 0x3f800000;
          auVar141 = vcmpps_avx(auVar171,auVar142,1);
          auVar223 = vinsertps_avx(auVar171,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar256._4_12_ = auVar171._4_12_;
          auVar256._0_4_ = 0x3f800000;
          auVar171 = vblendvps_avx(auVar256,auVar223,auVar141);
        }
        auVar141 = vcmpps_avx(auVar171,_DAT_01fec6f0,1);
        auVar77._12_4_ = 0;
        auVar77._0_12_ = auVar171._4_12_;
        auVar223 = vinsertps_avx(auVar171,ZEXT416(0x3f800000),0x10);
        auVar141 = vblendvps_avx(auVar223,auVar77 << 0x20,auVar141);
        auVar223 = vmovshdup_avx(auVar141);
        bVar76 = true;
        if (auVar141._0_4_ <= auVar223._0_4_) {
          auVar143._0_4_ = auVar141._0_4_ + -0.1;
          auVar143._4_4_ = auVar141._4_4_ + 0.1;
          auVar143._8_4_ = auVar141._8_4_ + 0.0;
          auVar143._12_4_ = auVar141._12_4_ + 0.0;
          auVar140 = vshufpd_avx(auVar324,auVar324,3);
          auVar196._8_8_ = 0x3f80000000000000;
          auVar196._0_8_ = 0x3f80000000000000;
          auVar141 = vcmpps_avx(auVar143,auVar196,1);
          auVar78._12_4_ = 0;
          auVar78._0_12_ = auVar143._4_12_;
          auVar223 = vinsertps_avx(auVar143,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar141 = vblendvps_avx(auVar223,auVar78 << 0x20,auVar141);
          auVar223 = vshufpd_avx(auVar10,auVar10,3);
          auVar201 = vshufps_avx(auVar141,auVar141,0x50);
          auVar197._8_4_ = 0x3f800000;
          auVar197._0_8_ = &DAT_3f8000003f800000;
          auVar197._12_4_ = 0x3f800000;
          auVar114 = vsubps_avx(auVar197,auVar201);
          local_640 = auVar261._0_4_;
          fStack_63c = auVar261._4_4_;
          fStack_638 = auVar261._8_4_;
          fStack_634 = auVar261._12_4_;
          fVar214 = auVar201._0_4_;
          fVar242 = auVar201._4_4_;
          fVar182 = auVar201._8_4_;
          fVar215 = auVar201._12_4_;
          local_6c0 = auVar202._0_4_;
          fStack_6bc = auVar202._4_4_;
          fStack_6b8 = auVar202._8_4_;
          fStack_6b4 = auVar202._12_4_;
          fVar243 = auVar114._0_4_;
          fVar340 = auVar114._4_4_;
          fVar265 = auVar114._8_4_;
          fVar266 = auVar114._12_4_;
          auVar173._0_4_ = fVar214 * local_640 + fVar243 * auVar195._0_4_;
          auVar173._4_4_ = fVar242 * fStack_63c + fVar340 * auVar195._4_4_;
          auVar173._8_4_ = fVar182 * fStack_638 + fVar265 * auVar195._0_4_;
          auVar173._12_4_ = fVar215 * fStack_634 + fVar266 * auVar195._4_4_;
          auVar230._0_4_ = fVar214 * auVar140._0_4_ + fVar243 * auVar324._0_4_;
          auVar230._4_4_ = fVar242 * auVar140._4_4_ + fVar340 * auVar324._4_4_;
          auVar230._8_4_ = fVar182 * auVar140._8_4_ + fVar265 * auVar324._0_4_;
          auVar230._12_4_ = fVar215 * auVar140._12_4_ + fVar266 * auVar324._4_4_;
          auVar292._0_4_ = fVar214 * auVar223._0_4_ + fVar243 * fVar157;
          auVar292._4_4_ = fVar242 * auVar223._4_4_ + fVar340 * fVar267;
          auVar292._8_4_ = fVar182 * auVar223._8_4_ + fVar265 * fVar157;
          auVar292._12_4_ = fVar215 * auVar223._12_4_ + fVar266 * fVar267;
          auVar312._0_4_ = fVar214 * local_6c0 + fVar243 * auVar212._16_4_;
          auVar312._4_4_ = fVar242 * fStack_6bc + fVar340 * auVar212._20_4_;
          auVar312._8_4_ = fVar182 * fStack_6b8 + fVar265 * auVar212._16_4_;
          auVar312._12_4_ = fVar215 * fStack_6b4 + fVar266 * auVar212._20_4_;
          auVar202 = vsubps_avx(auVar197,auVar141);
          auVar223 = vmovshdup_avx(_local_730);
          auVar261 = vmovsldup_avx(_local_730);
          local_730._0_4_ = auVar202._0_4_ * auVar261._0_4_ + auVar223._0_4_ * auVar141._0_4_;
          local_730._4_4_ = auVar202._4_4_ * auVar261._4_4_ + auVar223._4_4_ * auVar141._4_4_;
          fStack_728 = auVar202._8_4_ * auVar261._8_4_ + auVar223._8_4_ * auVar141._8_4_;
          fStack_724 = auVar202._12_4_ * auVar261._12_4_ + auVar223._12_4_ * auVar141._12_4_;
          auVar10 = vmovshdup_avx(_local_730);
          auVar141 = vsubps_avx(auVar230,auVar173);
          auVar257._0_4_ = auVar141._0_4_ * 3.0;
          auVar257._4_4_ = auVar141._4_4_ * 3.0;
          auVar257._8_4_ = auVar141._8_4_ * 3.0;
          auVar257._12_4_ = auVar141._12_4_ * 3.0;
          auVar141 = vsubps_avx(auVar292,auVar230);
          auVar276._0_4_ = auVar141._0_4_ * 3.0;
          auVar276._4_4_ = auVar141._4_4_ * 3.0;
          auVar276._8_4_ = auVar141._8_4_ * 3.0;
          auVar276._12_4_ = auVar141._12_4_ * 3.0;
          auVar141 = vsubps_avx(auVar312,auVar292);
          auVar327._0_4_ = auVar141._0_4_ * 3.0;
          auVar327._4_4_ = auVar141._4_4_ * 3.0;
          auVar327._8_4_ = auVar141._8_4_ * 3.0;
          auVar327._12_4_ = auVar141._12_4_ * 3.0;
          auVar223 = vminps_avx(auVar276,auVar327);
          auVar141 = vmaxps_avx(auVar276,auVar327);
          auVar223 = vminps_avx(auVar257,auVar223);
          auVar141 = vmaxps_avx(auVar257,auVar141);
          auVar261 = vshufpd_avx(auVar223,auVar223,3);
          auVar202 = vshufpd_avx(auVar141,auVar141,3);
          auVar223 = vminps_avx(auVar223,auVar261);
          auVar141 = vmaxps_avx(auVar141,auVar202);
          auVar261 = vshufps_avx(ZEXT416((uint)(1.0 / fVar213)),ZEXT416((uint)(1.0 / fVar213)),0);
          auVar258._0_4_ = auVar261._0_4_ * auVar223._0_4_;
          auVar258._4_4_ = auVar261._4_4_ * auVar223._4_4_;
          auVar258._8_4_ = auVar261._8_4_ * auVar223._8_4_;
          auVar258._12_4_ = auVar261._12_4_ * auVar223._12_4_;
          auVar277._0_4_ = auVar141._0_4_ * auVar261._0_4_;
          auVar277._4_4_ = auVar141._4_4_ * auVar261._4_4_;
          auVar277._8_4_ = auVar141._8_4_ * auVar261._8_4_;
          auVar277._12_4_ = auVar141._12_4_ * auVar261._12_4_;
          auVar114 = ZEXT416((uint)(1.0 / (auVar10._0_4_ - (float)local_730._0_4_)));
          auVar141 = vshufpd_avx(auVar173,auVar173,3);
          auVar223 = vshufpd_avx(auVar230,auVar230,3);
          auVar261 = vshufpd_avx(auVar292,auVar292,3);
          auVar202 = vshufpd_avx(auVar312,auVar312,3);
          auVar141 = vsubps_avx(auVar141,auVar173);
          auVar140 = vsubps_avx(auVar223,auVar230);
          auVar201 = vsubps_avx(auVar261,auVar292);
          auVar202 = vsubps_avx(auVar202,auVar312);
          auVar223 = vminps_avx(auVar141,auVar140);
          auVar141 = vmaxps_avx(auVar141,auVar140);
          auVar261 = vminps_avx(auVar201,auVar202);
          auVar261 = vminps_avx(auVar223,auVar261);
          auVar223 = vmaxps_avx(auVar201,auVar202);
          auVar141 = vmaxps_avx(auVar141,auVar223);
          auVar223 = vshufps_avx(auVar114,auVar114,0);
          auVar345._0_4_ = auVar223._0_4_ * auVar261._0_4_;
          auVar345._4_4_ = auVar223._4_4_ * auVar261._4_4_;
          auVar345._8_4_ = auVar223._8_4_ * auVar261._8_4_;
          auVar345._12_4_ = auVar223._12_4_ * auVar261._12_4_;
          auVar355._0_4_ = auVar223._0_4_ * auVar141._0_4_;
          auVar355._4_4_ = auVar223._4_4_ * auVar141._4_4_;
          auVar355._8_4_ = auVar223._8_4_ * auVar141._8_4_;
          auVar355._12_4_ = auVar223._12_4_ * auVar141._12_4_;
          auVar141 = vmovsldup_avx(_local_730);
          auVar293._4_12_ = auVar141._4_12_;
          auVar293._0_4_ = fVar183;
          auVar313._4_12_ = local_730._4_12_;
          auVar313._0_4_ = fVar270;
          auVar115._0_4_ = (fVar270 + fVar183) * 0.5;
          auVar115._4_4_ = ((float)local_730._4_4_ + auVar141._4_4_) * 0.5;
          auVar115._8_4_ = (fStack_728 + auVar141._8_4_) * 0.5;
          auVar115._12_4_ = (fStack_724 + auVar141._12_4_) * 0.5;
          auVar141 = vshufps_avx(auVar115,auVar115,0);
          fVar157 = auVar141._0_4_;
          fVar214 = auVar141._4_4_;
          fVar242 = auVar141._8_4_;
          fVar182 = auVar141._12_4_;
          auVar231._0_4_ = local_650 + fVar157 * (float)local_350._0_4_;
          auVar231._4_4_ = fStack_64c + fVar214 * (float)local_350._4_4_;
          auVar231._8_4_ = fStack_648 + fVar242 * fStack_348;
          auVar231._12_4_ = fStack_644 + fVar182 * fStack_344;
          local_600 = auVar37._0_4_;
          fStack_5fc = auVar37._4_4_;
          fStack_5f8 = auVar37._8_4_;
          fStack_5f4 = auVar37._12_4_;
          auVar328._0_4_ = fVar157 * (float)local_360._0_4_ + local_600;
          auVar328._4_4_ = fVar214 * (float)local_360._4_4_ + fStack_5fc;
          auVar328._8_4_ = fVar242 * fStack_358 + fStack_5f8;
          auVar328._12_4_ = fVar182 * fStack_354 + fStack_5f4;
          local_610 = auVar8._0_4_;
          fStack_60c = auVar8._4_4_;
          fStack_608 = auVar8._8_4_;
          fStack_604 = auVar8._12_4_;
          auVar378._0_4_ = fVar157 * (float)local_370._0_4_ + local_610;
          auVar378._4_4_ = fVar214 * (float)local_370._4_4_ + fStack_60c;
          auVar378._8_4_ = fVar242 * fStack_368 + fStack_608;
          auVar378._12_4_ = fVar182 * fStack_364 + fStack_604;
          auVar141 = vsubps_avx(auVar328,auVar231);
          auVar232._0_4_ = auVar141._0_4_ * fVar157 + auVar231._0_4_;
          auVar232._4_4_ = auVar141._4_4_ * fVar214 + auVar231._4_4_;
          auVar232._8_4_ = auVar141._8_4_ * fVar242 + auVar231._8_4_;
          auVar232._12_4_ = auVar141._12_4_ * fVar182 + auVar231._12_4_;
          auVar141 = vsubps_avx(auVar378,auVar328);
          auVar329._0_4_ = auVar328._0_4_ + auVar141._0_4_ * fVar157;
          auVar329._4_4_ = auVar328._4_4_ + auVar141._4_4_ * fVar214;
          auVar329._8_4_ = auVar328._8_4_ + auVar141._8_4_ * fVar242;
          auVar329._12_4_ = auVar328._12_4_ + auVar141._12_4_ * fVar182;
          auVar141 = vsubps_avx(auVar329,auVar232);
          fVar157 = auVar232._0_4_ + auVar141._0_4_ * fVar157;
          fVar214 = auVar232._4_4_ + auVar141._4_4_ * fVar214;
          auVar174._0_8_ = CONCAT44(fVar214,fVar157);
          auVar174._8_4_ = auVar232._8_4_ + auVar141._8_4_ * fVar242;
          auVar174._12_4_ = auVar232._12_4_ + auVar141._12_4_ * fVar182;
          fVar242 = auVar141._0_4_ * 3.0;
          fVar182 = auVar141._4_4_ * 3.0;
          auVar233._0_8_ = CONCAT44(fVar182,fVar242);
          auVar233._8_4_ = auVar141._8_4_ * 3.0;
          auVar233._12_4_ = auVar141._12_4_ * 3.0;
          auVar330._8_8_ = auVar174._0_8_;
          auVar330._0_8_ = auVar174._0_8_;
          auVar141 = vshufpd_avx(auVar174,auVar174,3);
          auVar223 = vshufps_avx(auVar115,auVar115,0x55);
          auVar201 = vsubps_avx(auVar141,auVar330);
          auVar331._0_4_ = auVar223._0_4_ * auVar201._0_4_ + fVar157;
          auVar331._4_4_ = auVar223._4_4_ * auVar201._4_4_ + fVar214;
          auVar331._8_4_ = auVar223._8_4_ * auVar201._8_4_ + fVar157;
          auVar331._12_4_ = auVar223._12_4_ * auVar201._12_4_ + fVar214;
          auVar398._8_8_ = auVar233._0_8_;
          auVar398._0_8_ = auVar233._0_8_;
          auVar141 = vshufpd_avx(auVar233,auVar233,1);
          auVar141 = vsubps_avx(auVar141,auVar398);
          auVar234._0_4_ = fVar242 + auVar223._0_4_ * auVar141._0_4_;
          auVar234._4_4_ = fVar182 + auVar223._4_4_ * auVar141._4_4_;
          auVar234._8_4_ = fVar242 + auVar223._8_4_ * auVar141._8_4_;
          auVar234._12_4_ = fVar182 + auVar223._12_4_ * auVar141._12_4_;
          auVar223 = vmovshdup_avx(auVar234);
          auVar399._0_8_ = auVar223._0_8_ ^ 0x8000000080000000;
          auVar399._8_4_ = auVar223._8_4_ ^ 0x80000000;
          auVar399._12_4_ = auVar223._12_4_ ^ 0x80000000;
          auVar261 = vmovshdup_avx(auVar201);
          auVar141 = vunpcklps_avx(auVar261,auVar399);
          auVar202 = vshufps_avx(auVar141,auVar399,4);
          auVar175._0_8_ = auVar201._0_8_ ^ 0x8000000080000000;
          auVar175._8_4_ = -auVar201._8_4_;
          auVar175._12_4_ = -auVar201._12_4_;
          auVar141 = vmovlhps_avx(auVar175,auVar234);
          auVar140 = vshufps_avx(auVar141,auVar234,8);
          auVar141 = ZEXT416((uint)(auVar261._0_4_ * auVar234._0_4_ -
                                   auVar223._0_4_ * auVar201._0_4_));
          auVar223 = vshufps_avx(auVar141,auVar141,0);
          auVar141 = vdivps_avx(auVar202,auVar223);
          auVar223 = vdivps_avx(auVar140,auVar223);
          auVar140 = vinsertps_avx(auVar258,auVar345,0x1c);
          auVar201 = vinsertps_avx(auVar277,auVar355,0x1c);
          auVar114 = vinsertps_avx(auVar345,auVar258,0x4c);
          auVar171 = vinsertps_avx(auVar355,auVar277,0x4c);
          auVar261 = vmovsldup_avx(auVar141);
          auVar356._0_4_ = auVar261._0_4_ * auVar140._0_4_;
          auVar356._4_4_ = auVar261._4_4_ * auVar140._4_4_;
          auVar356._8_4_ = auVar261._8_4_ * auVar140._8_4_;
          auVar356._12_4_ = auVar261._12_4_ * auVar140._12_4_;
          auVar346._0_4_ = auVar261._0_4_ * auVar201._0_4_;
          auVar346._4_4_ = auVar261._4_4_ * auVar201._4_4_;
          auVar346._8_4_ = auVar261._8_4_ * auVar201._8_4_;
          auVar346._12_4_ = auVar261._12_4_ * auVar201._12_4_;
          auVar202 = vminps_avx(auVar356,auVar346);
          auVar261 = vmaxps_avx(auVar346,auVar356);
          auVar9 = vmovsldup_avx(auVar223);
          auVar414._0_4_ = auVar9._0_4_ * auVar114._0_4_;
          auVar414._4_4_ = auVar9._4_4_ * auVar114._4_4_;
          auVar414._8_4_ = auVar9._8_4_ * auVar114._8_4_;
          auVar414._12_4_ = auVar9._12_4_ * auVar114._12_4_;
          auVar347._0_4_ = auVar9._0_4_ * auVar171._0_4_;
          auVar347._4_4_ = auVar9._4_4_ * auVar171._4_4_;
          auVar347._8_4_ = auVar9._8_4_ * auVar171._8_4_;
          auVar347._12_4_ = auVar9._12_4_ * auVar171._12_4_;
          auVar9 = vminps_avx(auVar414,auVar347);
          auVar144._0_4_ = auVar202._0_4_ + auVar9._0_4_;
          auVar144._4_4_ = auVar202._4_4_ + auVar9._4_4_;
          auVar144._8_4_ = auVar202._8_4_ + auVar9._8_4_;
          auVar144._12_4_ = auVar202._12_4_ + auVar9._12_4_;
          auVar202 = vmaxps_avx(auVar347,auVar414);
          auVar9 = vsubps_avx(auVar293,auVar115);
          auVar291 = vsubps_avx(auVar313,auVar115);
          auVar314._0_4_ = auVar261._0_4_ + auVar202._0_4_;
          auVar314._4_4_ = auVar261._4_4_ + auVar202._4_4_;
          auVar314._8_4_ = auVar261._8_4_ + auVar202._8_4_;
          auVar314._12_4_ = auVar261._12_4_ + auVar202._12_4_;
          auVar357._8_8_ = 0x3f800000;
          auVar357._0_8_ = 0x3f800000;
          auVar261 = vsubps_avx(auVar357,auVar314);
          auVar202 = vsubps_avx(auVar357,auVar144);
          fVar340 = auVar9._0_4_;
          auVar358._0_4_ = fVar340 * auVar261._0_4_;
          fVar265 = auVar9._4_4_;
          auVar358._4_4_ = fVar265 * auVar261._4_4_;
          fVar266 = auVar9._8_4_;
          auVar358._8_4_ = fVar266 * auVar261._8_4_;
          fVar267 = auVar9._12_4_;
          auVar358._12_4_ = fVar267 * auVar261._12_4_;
          fVar242 = auVar291._0_4_;
          auVar315._0_4_ = auVar261._0_4_ * fVar242;
          fVar182 = auVar291._4_4_;
          auVar315._4_4_ = auVar261._4_4_ * fVar182;
          fVar215 = auVar291._8_4_;
          auVar315._8_4_ = auVar261._8_4_ * fVar215;
          fVar243 = auVar291._12_4_;
          auVar315._12_4_ = auVar261._12_4_ * fVar243;
          auVar406._0_4_ = fVar340 * auVar202._0_4_;
          auVar406._4_4_ = fVar265 * auVar202._4_4_;
          auVar406._8_4_ = fVar266 * auVar202._8_4_;
          auVar406._12_4_ = fVar267 * auVar202._12_4_;
          auVar145._0_4_ = fVar242 * auVar202._0_4_;
          auVar145._4_4_ = fVar182 * auVar202._4_4_;
          auVar145._8_4_ = fVar215 * auVar202._8_4_;
          auVar145._12_4_ = fVar243 * auVar202._12_4_;
          auVar261 = vminps_avx(auVar358,auVar406);
          auVar202 = vminps_avx(auVar315,auVar145);
          auVar9 = vminps_avx(auVar261,auVar202);
          auVar261 = vmaxps_avx(auVar406,auVar358);
          auVar202 = vmaxps_avx(auVar145,auVar315);
          auVar291 = vshufps_avx(auVar115,auVar115,0x54);
          auVar202 = vmaxps_avx(auVar202,auVar261);
          auVar227 = vshufps_avx(auVar331,auVar331,0);
          auVar11 = vshufps_avx(auVar331,auVar331,0x55);
          auVar261 = vhaddps_avx(auVar9,auVar9);
          auVar202 = vhaddps_avx(auVar202,auVar202);
          auVar316._0_4_ = auVar227._0_4_ * auVar141._0_4_ + auVar11._0_4_ * auVar223._0_4_;
          auVar316._4_4_ = auVar227._4_4_ * auVar141._4_4_ + auVar11._4_4_ * auVar223._4_4_;
          auVar316._8_4_ = auVar227._8_4_ * auVar141._8_4_ + auVar11._8_4_ * auVar223._8_4_;
          auVar316._12_4_ = auVar227._12_4_ * auVar141._12_4_ + auVar11._12_4_ * auVar223._12_4_;
          auVar9 = vsubps_avx(auVar291,auVar316);
          fVar157 = auVar9._0_4_ + auVar261._0_4_;
          fVar214 = auVar9._0_4_ + auVar202._0_4_;
          auVar261 = vmaxss_avx(ZEXT416((uint)fVar183),ZEXT416((uint)fVar157));
          auVar202 = vminss_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar270));
          if (auVar261._0_4_ <= auVar202._0_4_) {
            auVar261 = vmovshdup_avx(auVar141);
            auVar198._0_4_ = auVar140._0_4_ * auVar261._0_4_;
            auVar198._4_4_ = auVar140._4_4_ * auVar261._4_4_;
            auVar198._8_4_ = auVar140._8_4_ * auVar261._8_4_;
            auVar198._12_4_ = auVar140._12_4_ * auVar261._12_4_;
            auVar146._0_4_ = auVar201._0_4_ * auVar261._0_4_;
            auVar146._4_4_ = auVar201._4_4_ * auVar261._4_4_;
            auVar146._8_4_ = auVar201._8_4_ * auVar261._8_4_;
            auVar146._12_4_ = auVar201._12_4_ * auVar261._12_4_;
            auVar202 = vminps_avx(auVar198,auVar146);
            auVar261 = vmaxps_avx(auVar146,auVar198);
            auVar140 = vmovshdup_avx(auVar223);
            auVar259._0_4_ = auVar140._0_4_ * auVar114._0_4_;
            auVar259._4_4_ = auVar140._4_4_ * auVar114._4_4_;
            auVar259._8_4_ = auVar140._8_4_ * auVar114._8_4_;
            auVar259._12_4_ = auVar140._12_4_ * auVar114._12_4_;
            auVar199._0_4_ = auVar140._0_4_ * auVar171._0_4_;
            auVar199._4_4_ = auVar140._4_4_ * auVar171._4_4_;
            auVar199._8_4_ = auVar140._8_4_ * auVar171._8_4_;
            auVar199._12_4_ = auVar140._12_4_ * auVar171._12_4_;
            auVar140 = vminps_avx(auVar259,auVar199);
            auVar278._0_4_ = auVar202._0_4_ + auVar140._0_4_;
            auVar278._4_4_ = auVar202._4_4_ + auVar140._4_4_;
            auVar278._8_4_ = auVar202._8_4_ + auVar140._8_4_;
            auVar278._12_4_ = auVar202._12_4_ + auVar140._12_4_;
            auVar202 = vmaxps_avx(auVar199,auVar259);
            auVar147._0_4_ = auVar261._0_4_ + auVar202._0_4_;
            auVar147._4_4_ = auVar261._4_4_ + auVar202._4_4_;
            auVar147._8_4_ = auVar261._8_4_ + auVar202._8_4_;
            auVar147._12_4_ = auVar261._12_4_ + auVar202._12_4_;
            auVar261 = vsubps_avx(auVar196,auVar147);
            auVar202 = vsubps_avx(auVar196,auVar278);
            auVar260._0_4_ = fVar340 * auVar261._0_4_;
            auVar260._4_4_ = fVar265 * auVar261._4_4_;
            auVar260._8_4_ = fVar266 * auVar261._8_4_;
            auVar260._12_4_ = fVar267 * auVar261._12_4_;
            auVar279._0_4_ = fVar340 * auVar202._0_4_;
            auVar279._4_4_ = fVar265 * auVar202._4_4_;
            auVar279._8_4_ = fVar266 * auVar202._8_4_;
            auVar279._12_4_ = fVar267 * auVar202._12_4_;
            auVar148._0_4_ = fVar242 * auVar261._0_4_;
            auVar148._4_4_ = fVar182 * auVar261._4_4_;
            auVar148._8_4_ = fVar215 * auVar261._8_4_;
            auVar148._12_4_ = fVar243 * auVar261._12_4_;
            auVar200._0_4_ = fVar242 * auVar202._0_4_;
            auVar200._4_4_ = fVar182 * auVar202._4_4_;
            auVar200._8_4_ = fVar215 * auVar202._8_4_;
            auVar200._12_4_ = fVar243 * auVar202._12_4_;
            auVar261 = vminps_avx(auVar260,auVar279);
            auVar202 = vminps_avx(auVar148,auVar200);
            auVar261 = vminps_avx(auVar261,auVar202);
            auVar202 = vmaxps_avx(auVar279,auVar260);
            auVar140 = vmaxps_avx(auVar200,auVar148);
            auVar261 = vhaddps_avx(auVar261,auVar261);
            auVar202 = vmaxps_avx(auVar140,auVar202);
            auVar202 = vhaddps_avx(auVar202,auVar202);
            auVar140 = vmovshdup_avx(auVar9);
            auVar201 = ZEXT416((uint)(auVar140._0_4_ + auVar261._0_4_));
            auVar261 = vmaxss_avx(_local_730,auVar201);
            auVar140 = ZEXT416((uint)(auVar140._0_4_ + auVar202._0_4_));
            auVar202 = vminss_avx(auVar140,auVar10);
            if (auVar261._0_4_ <= auVar202._0_4_) {
              uVar91 = 0;
              auVar408 = ZEXT864(0) << 0x20;
              if (fVar157 <= fVar183) {
                auVar359._8_4_ = 0x7fffffff;
                auVar359._0_8_ = 0x7fffffff7fffffff;
                auVar359._12_4_ = 0x7fffffff;
              }
              else {
                auVar359._8_4_ = 0x7fffffff;
                auVar359._0_8_ = 0x7fffffff7fffffff;
                auVar359._12_4_ = 0x7fffffff;
                if (fVar214 < fVar270) {
                  auVar261 = vcmpps_avx(auVar140,auVar10,1);
                  auVar202 = vcmpps_avx(_local_730,auVar201,1);
                  auVar261 = vandps_avx(auVar202,auVar261);
                  uVar91 = auVar261._0_4_;
                }
              }
              if (((uint)uVar93 < 4 && 0.001 <= fVar213) && (uVar91 & 1) == 0) {
                bVar76 = false;
              }
              else {
                lVar94 = 200;
                do {
                  fVar157 = auVar9._0_4_;
                  fVar213 = 1.0 - fVar157;
                  auVar261 = ZEXT416((uint)(fVar213 * fVar213 * fVar213));
                  auVar261 = vshufps_avx(auVar261,auVar261,0);
                  auVar202 = ZEXT416((uint)(fVar157 * 3.0 * fVar213 * fVar213));
                  auVar202 = vshufps_avx(auVar202,auVar202,0);
                  auVar140 = ZEXT416((uint)(fVar213 * fVar157 * fVar157 * 3.0));
                  auVar140 = vshufps_avx(auVar140,auVar140,0);
                  auVar201 = ZEXT416((uint)(fVar157 * fVar157 * fVar157));
                  auVar201 = vshufps_avx(auVar201,auVar201,0);
                  fVar213 = local_650 * auVar261._0_4_ +
                            local_600 * auVar202._0_4_ +
                            (float)local_460._0_4_ * auVar201._0_4_ + local_610 * auVar140._0_4_;
                  fVar157 = fStack_64c * auVar261._4_4_ +
                            fStack_5fc * auVar202._4_4_ +
                            (float)local_460._4_4_ * auVar201._4_4_ + fStack_60c * auVar140._4_4_;
                  auVar149._0_8_ = CONCAT44(fVar157,fVar213);
                  auVar149._8_4_ =
                       fStack_648 * auVar261._8_4_ +
                       fStack_5f8 * auVar202._8_4_ +
                       fStack_458 * auVar201._8_4_ + fStack_608 * auVar140._8_4_;
                  auVar149._12_4_ =
                       fStack_644 * auVar261._12_4_ +
                       fStack_5f4 * auVar202._12_4_ +
                       fStack_454 * auVar201._12_4_ + fStack_604 * auVar140._12_4_;
                  auVar203._8_8_ = auVar149._0_8_;
                  auVar203._0_8_ = auVar149._0_8_;
                  auVar202 = vshufpd_avx(auVar149,auVar149,1);
                  auVar261 = vmovshdup_avx(auVar9);
                  auVar202 = vsubps_avx(auVar202,auVar203);
                  auVar150._0_4_ = auVar261._0_4_ * auVar202._0_4_ + fVar213;
                  auVar150._4_4_ = auVar261._4_4_ * auVar202._4_4_ + fVar157;
                  auVar150._8_4_ = auVar261._8_4_ * auVar202._8_4_ + fVar213;
                  auVar150._12_4_ = auVar261._12_4_ * auVar202._12_4_ + fVar157;
                  auVar261 = vshufps_avx(auVar150,auVar150,0);
                  auVar202 = vshufps_avx(auVar150,auVar150,0x55);
                  auVar204._0_4_ = auVar141._0_4_ * auVar261._0_4_ + auVar223._0_4_ * auVar202._0_4_
                  ;
                  auVar204._4_4_ = auVar141._4_4_ * auVar261._4_4_ + auVar223._4_4_ * auVar202._4_4_
                  ;
                  auVar204._8_4_ = auVar141._8_4_ * auVar261._8_4_ + auVar223._8_4_ * auVar202._8_4_
                  ;
                  auVar204._12_4_ =
                       auVar141._12_4_ * auVar261._12_4_ + auVar223._12_4_ * auVar202._12_4_;
                  auVar9 = vsubps_avx(auVar9,auVar204);
                  auVar261 = vandps_avx(auVar359,auVar150);
                  auVar202 = vshufps_avx(auVar261,auVar261,0xf5);
                  auVar261 = vmaxss_avx(auVar202,auVar261);
                  if (auVar261._0_4_ < fVar219) {
                    fVar213 = auVar9._0_4_;
                    if ((0.0 <= fVar213) && (fVar213 <= 1.0)) {
                      auVar141 = vmovshdup_avx(auVar9);
                      fVar157 = auVar141._0_4_;
                      if ((0.0 <= fVar157) && (fVar157 <= 1.0)) {
                        auVar141 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar171 = vinsertps_avx(auVar141,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar141 = vdpps_avx(auVar171,local_380,0x7f);
                        auVar223 = vdpps_avx(auVar171,local_390,0x7f);
                        auVar261 = vdpps_avx(auVar171,local_3a0,0x7f);
                        auVar202 = vdpps_avx(auVar171,local_3b0,0x7f);
                        auVar140 = vdpps_avx(auVar171,local_3c0,0x7f);
                        auVar201 = vdpps_avx(auVar171,local_3d0,0x7f);
                        auVar114 = vdpps_avx(auVar171,local_3e0,0x7f);
                        auVar171 = vdpps_avx(auVar171,local_3f0,0x7f);
                        fVar243 = 1.0 - fVar157;
                        fVar340 = 1.0 - fVar213;
                        fVar214 = auVar9._4_4_;
                        fVar242 = auVar9._8_4_;
                        fVar182 = auVar9._12_4_;
                        fVar215 = fVar340 * fVar213 * fVar213 * 3.0;
                        auVar294._0_4_ = fVar213 * fVar213 * fVar213;
                        auVar294._4_4_ = fVar214 * fVar214 * fVar214;
                        auVar294._8_4_ = fVar242 * fVar242 * fVar242;
                        auVar294._12_4_ = fVar182 * fVar182 * fVar182;
                        fVar242 = fVar340 * fVar340 * fVar213 * 3.0;
                        fVar182 = fVar340 * fVar340 * fVar340;
                        fVar214 = fVar182 * (fVar243 * auVar141._0_4_ + fVar157 * auVar140._0_4_) +
                                  (fVar243 * auVar223._0_4_ + auVar201._0_4_ * fVar157) * fVar242 +
                                  fVar215 * (auVar114._0_4_ * fVar157 + fVar243 * auVar261._0_4_) +
                                  auVar294._0_4_ *
                                  (fVar243 * auVar202._0_4_ + fVar157 * auVar171._0_4_);
                        if (((fVar184 <= fVar214) &&
                            (fVar243 = *(float *)(ray + k * 4 + 0x100), fVar214 <= fVar243)) &&
                           (pGVar22 = (context->scene->geometries).items[uVar90].ptr,
                           (pGVar22->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
                          auStack_f0 = vshufps_avx(auVar9,auVar9,0x55);
                          auVar332._8_4_ = 0x3f800000;
                          auVar332._0_8_ = &DAT_3f8000003f800000;
                          auVar332._12_4_ = 0x3f800000;
                          auVar141 = vsubps_avx(auVar332,auStack_f0);
                          fVar265 = auStack_f0._0_4_;
                          fVar266 = auStack_f0._4_4_;
                          fVar267 = auStack_f0._8_4_;
                          fVar268 = auStack_f0._12_4_;
                          fVar269 = auVar141._0_4_;
                          fVar339 = auVar141._4_4_;
                          fVar341 = auVar141._8_4_;
                          fVar342 = auVar141._12_4_;
                          auVar348._0_4_ =
                               fVar265 * (float)local_4a0._0_4_ + fVar269 * (float)local_470._0_4_;
                          auVar348._4_4_ =
                               fVar266 * (float)local_4a0._4_4_ + fVar339 * (float)local_470._4_4_;
                          auVar348._8_4_ = fVar267 * fStack_498 + fVar341 * fStack_468;
                          auVar348._12_4_ = fVar268 * fStack_494 + fVar342 * fStack_464;
                          auVar360._0_4_ = fVar265 * fVar245 + fVar269 * fVar216;
                          auVar360._4_4_ = fVar266 * fVar246 + fVar339 * fVar217;
                          auVar360._8_4_ = fVar267 * fVar247 + fVar341 * fVar218;
                          auVar360._12_4_ = fVar268 * fVar264 + fVar342 * fVar248;
                          auVar379._0_4_ = fVar265 * local_4b0 + fVar269 * (float)local_480._0_4_;
                          auVar379._4_4_ = fVar266 * fStack_4ac + fVar339 * (float)local_480._4_4_;
                          auVar379._8_4_ = fVar267 * fStack_4a8 + fVar341 * fStack_478;
                          auVar379._12_4_ = fVar268 * fStack_4a4 + fVar342 * fStack_474;
                          auVar333._0_4_ =
                               fVar265 * (float)local_4c0._0_4_ + fVar269 * (float)local_490._0_4_;
                          auVar333._4_4_ =
                               fVar266 * (float)local_4c0._4_4_ + fVar339 * (float)local_490._4_4_;
                          auVar333._8_4_ = fVar267 * fStack_4b8 + fVar341 * fStack_488;
                          auVar333._12_4_ = fVar268 * fStack_4b4 + fVar342 * fStack_484;
                          auVar202 = vsubps_avx(auVar360,auVar348);
                          auVar140 = vsubps_avx(auVar379,auVar360);
                          auVar201 = vsubps_avx(auVar333,auVar379);
                          auStack_110 = vshufps_avx(auVar9,auVar9,0);
                          fVar268 = auStack_110._0_4_;
                          fVar269 = auStack_110._4_4_;
                          fVar339 = auStack_110._8_4_;
                          fVar341 = auStack_110._12_4_;
                          auVar141 = vshufps_avx(ZEXT416((uint)fVar340),ZEXT416((uint)fVar340),0);
                          fVar340 = auVar141._0_4_;
                          fVar265 = auVar141._4_4_;
                          fVar266 = auVar141._8_4_;
                          fVar267 = auVar141._12_4_;
                          auVar141 = vshufps_avx(auVar294,auVar294,0);
                          auVar223 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
                          auVar261 = vshufps_avx(ZEXT416((uint)fVar242),ZEXT416((uint)fVar242),0);
                          auVar280._0_4_ =
                               (fVar340 * (fVar340 * auVar202._0_4_ + fVar268 * auVar140._0_4_) +
                               fVar268 * (fVar340 * auVar140._0_4_ + fVar268 * auVar201._0_4_)) *
                               3.0;
                          auVar280._4_4_ =
                               (fVar265 * (fVar265 * auVar202._4_4_ + fVar269 * auVar140._4_4_) +
                               fVar269 * (fVar265 * auVar140._4_4_ + fVar269 * auVar201._4_4_)) *
                               3.0;
                          auVar280._8_4_ =
                               (fVar266 * (fVar266 * auVar202._8_4_ + fVar339 * auVar140._8_4_) +
                               fVar339 * (fVar266 * auVar140._8_4_ + fVar339 * auVar201._8_4_)) *
                               3.0;
                          auVar280._12_4_ =
                               (fVar267 * (fVar267 * auVar202._12_4_ + fVar341 * auVar140._12_4_) +
                               fVar341 * (fVar267 * auVar140._12_4_ + fVar341 * auVar201._12_4_)) *
                               3.0;
                          auVar202 = vshufps_avx(ZEXT416((uint)fVar182),ZEXT416((uint)fVar182),0);
                          auVar235._0_4_ =
                               auVar202._0_4_ * (float)local_410._0_4_ +
                               auVar261._0_4_ * (float)local_420._0_4_ +
                               auVar141._0_4_ * (float)local_440._0_4_ +
                               auVar223._0_4_ * (float)local_430._0_4_;
                          auVar235._4_4_ =
                               auVar202._4_4_ * (float)local_410._4_4_ +
                               auVar261._4_4_ * (float)local_420._4_4_ +
                               auVar141._4_4_ * (float)local_440._4_4_ +
                               auVar223._4_4_ * (float)local_430._4_4_;
                          auVar235._8_4_ =
                               auVar202._8_4_ * fStack_408 +
                               auVar261._8_4_ * fStack_418 +
                               auVar141._8_4_ * fStack_438 + auVar223._8_4_ * fStack_428;
                          auVar235._12_4_ =
                               auVar202._12_4_ * fStack_404 +
                               auVar261._12_4_ * fStack_414 +
                               auVar141._12_4_ * fStack_434 + auVar223._12_4_ * fStack_424;
                          auVar141 = vshufps_avx(auVar280,auVar280,0xc9);
                          auVar262._0_4_ = auVar235._0_4_ * auVar141._0_4_;
                          auVar262._4_4_ = auVar235._4_4_ * auVar141._4_4_;
                          auVar262._8_4_ = auVar235._8_4_ * auVar141._8_4_;
                          auVar262._12_4_ = auVar235._12_4_ * auVar141._12_4_;
                          auVar141 = vshufps_avx(auVar235,auVar235,0xc9);
                          auVar236._0_4_ = auVar280._0_4_ * auVar141._0_4_;
                          auVar236._4_4_ = auVar280._4_4_ * auVar141._4_4_;
                          auVar236._8_4_ = auVar280._8_4_ * auVar141._8_4_;
                          auVar236._12_4_ = auVar280._12_4_ * auVar141._12_4_;
                          auVar141 = vsubps_avx(auVar236,auVar262);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x100) = fVar214;
                            uVar4 = vextractps_avx(auVar141,1);
                            *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                            uVar4 = vextractps_avx(auVar141,2);
                            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                            *(int *)(ray + k * 4 + 0x1c0) = auVar141._0_4_;
                            *(float *)(ray + k * 4 + 0x1e0) = fVar213;
                            *(float *)(ray + k * 4 + 0x200) = fVar157;
                            *(uint *)(ray + k * 4 + 0x220) = uVar21;
                            *(uint *)(ray + k * 4 + 0x240) = uVar90;
                            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                          }
                          else {
                            auStack_170 = vshufps_avx(auVar141,auVar141,0x55);
                            auStack_150 = vshufps_avx(auVar141,auVar141,0xaa);
                            auStack_130 = vshufps_avx(auVar141,auVar141,0);
                            local_180[0] = (RTCHitN)auStack_170[0];
                            local_180[1] = (RTCHitN)auStack_170[1];
                            local_180[2] = (RTCHitN)auStack_170[2];
                            local_180[3] = (RTCHitN)auStack_170[3];
                            local_180[4] = (RTCHitN)auStack_170[4];
                            local_180[5] = (RTCHitN)auStack_170[5];
                            local_180[6] = (RTCHitN)auStack_170[6];
                            local_180[7] = (RTCHitN)auStack_170[7];
                            local_180[8] = (RTCHitN)auStack_170[8];
                            local_180[9] = (RTCHitN)auStack_170[9];
                            local_180[10] = (RTCHitN)auStack_170[10];
                            local_180[0xb] = (RTCHitN)auStack_170[0xb];
                            local_180[0xc] = (RTCHitN)auStack_170[0xc];
                            local_180[0xd] = (RTCHitN)auStack_170[0xd];
                            local_180[0xe] = (RTCHitN)auStack_170[0xe];
                            local_180[0xf] = (RTCHitN)auStack_170[0xf];
                            local_160 = auStack_150;
                            local_140 = auStack_130;
                            local_120 = auStack_110;
                            local_100 = auStack_f0;
                            local_e0 = local_300._0_8_;
                            uStack_d8 = local_300._8_8_;
                            uStack_d0 = local_300._16_8_;
                            uStack_c8 = local_300._24_8_;
                            local_c0 = local_2e0._0_8_;
                            uStack_b8 = local_2e0._8_8_;
                            uStack_b0 = local_2e0._16_8_;
                            uStack_a8 = local_2e0._24_8_;
                            auVar116 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_9c = context->user->instID[0];
                            local_a0 = uStack_9c;
                            uStack_98 = uStack_9c;
                            uStack_94 = uStack_9c;
                            uStack_90 = uStack_9c;
                            uStack_8c = uStack_9c;
                            uStack_84 = auVar116._28_4_;
                            uVar91 = uStack_84;
                            uStack_88 = uStack_9c;
                            uStack_84 = uStack_9c;
                            uStack_7c = context->user->instPrimID[0];
                            local_80 = uStack_7c;
                            uStack_78 = uStack_7c;
                            uStack_74 = uStack_7c;
                            uStack_70 = uStack_7c;
                            uStack_6c = uStack_7c;
                            uStack_68 = uStack_7c;
                            uStack_64 = uStack_7c;
                            *(float *)(ray + k * 4 + 0x100) = fVar214;
                            local_520 = *(undefined8 *)(mm_lookupmask_ps + uVar92);
                            uStack_518 = *(undefined8 *)(mm_lookupmask_ps + uVar92 + 8);
                            local_510 = *(undefined8 *)(mm_lookupmask_ps + lVar98);
                            uStack_508 = *(undefined8 *)(mm_lookupmask_ps + lVar98 + 8);
                            local_4f0.valid = (int *)&local_520;
                            local_4f0.geometryUserPtr = pGVar22->userPtr;
                            local_4f0.context = context->user;
                            local_4f0.hit = local_180;
                            local_4f0.N = 8;
                            local_4f0.ray = (RTCRayN *)ray;
                            if (pGVar22->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar22->intersectionFilterN)(&local_4f0);
                              auVar408 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            auVar83._8_8_ = uStack_518;
                            auVar83._0_8_ = local_520;
                            auVar141 = vpcmpeqd_avx(auVar408._0_16_,auVar83);
                            auVar85._8_8_ = uStack_508;
                            auVar85._0_8_ = local_510;
                            auVar223 = vpcmpeqd_avx(auVar408._0_16_,auVar85);
                            auVar123._16_16_ = auVar223;
                            auVar123._0_16_ = auVar141;
                            auVar28 = auVar116 & ~auVar123;
                            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar28 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar28 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar28 >> 0x7f,0) == '\0') &&
                                  (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar28 >> 0xbf,0) == '\0') &&
                                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar28[0x1f]) {
                              auVar124._0_4_ = auVar141._0_4_ ^ auVar116._0_4_;
                              auVar124._4_4_ = auVar141._4_4_ ^ auVar116._4_4_;
                              auVar124._8_4_ = auVar141._8_4_ ^ auVar116._8_4_;
                              auVar124._12_4_ = auVar141._12_4_ ^ auVar116._12_4_;
                              auVar124._16_4_ = auVar223._0_4_ ^ auVar116._16_4_;
                              auVar124._20_4_ = auVar223._4_4_ ^ auVar116._20_4_;
                              auVar124._24_4_ = auVar223._8_4_ ^ auVar116._24_4_;
                              auVar124._28_4_ = auVar223._12_4_ ^ uVar91;
                            }
                            else {
                              p_Var27 = context->args->filter;
                              if ((p_Var27 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var27)(&local_4f0);
                                auVar408 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar84._8_8_ = uStack_518;
                              auVar84._0_8_ = local_520;
                              auVar141 = vpcmpeqd_avx(auVar408._0_16_,auVar84);
                              auVar86._8_8_ = uStack_508;
                              auVar86._0_8_ = local_510;
                              auVar223 = vpcmpeqd_avx(auVar408._0_16_,auVar86);
                              auVar156._16_16_ = auVar223;
                              auVar156._0_16_ = auVar141;
                              auVar124._0_4_ = auVar141._0_4_ ^ auVar116._0_4_;
                              auVar124._4_4_ = auVar141._4_4_ ^ auVar116._4_4_;
                              auVar124._8_4_ = auVar141._8_4_ ^ auVar116._8_4_;
                              auVar124._12_4_ = auVar141._12_4_ ^ auVar116._12_4_;
                              auVar124._16_4_ = auVar223._0_4_ ^ auVar116._16_4_;
                              auVar124._20_4_ = auVar223._4_4_ ^ auVar116._20_4_;
                              auVar124._24_4_ = auVar223._8_4_ ^ auVar116._24_4_;
                              auVar124._28_4_ = auVar223._12_4_ ^ uVar91;
                              auVar116 = auVar116 & ~auVar156;
                              if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar116 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar116 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar116 >> 0x7f,0) != '\0')
                                    || (auVar116 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar116 >> 0xbf,0) != '\0')
                                  || (auVar116 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar116[0x1f] < '\0') {
                                auVar116 = vmaskmovps_avx(auVar124,*(undefined1 (*) [32])
                                                                    local_4f0.hit);
                                *(undefined1 (*) [32])(local_4f0.ray + 0x180) = auVar116;
                                auVar116 = vmaskmovps_avx(auVar124,*(undefined1 (*) [32])
                                                                    (local_4f0.hit + 0x20));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x1a0) = auVar116;
                                auVar116 = vmaskmovps_avx(auVar124,*(undefined1 (*) [32])
                                                                    (local_4f0.hit + 0x40));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x1c0) = auVar116;
                                auVar116 = vmaskmovps_avx(auVar124,*(undefined1 (*) [32])
                                                                    (local_4f0.hit + 0x60));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x1e0) = auVar116;
                                auVar116 = vmaskmovps_avx(auVar124,*(undefined1 (*) [32])
                                                                    (local_4f0.hit + 0x80));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x200) = auVar116;
                                auVar116 = vmaskmovps_avx(auVar124,*(undefined1 (*) [32])
                                                                    (local_4f0.hit + 0xa0));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x220) = auVar116;
                                auVar116 = vmaskmovps_avx(auVar124,*(undefined1 (*) [32])
                                                                    (local_4f0.hit + 0xc0));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x240) = auVar116;
                                auVar116 = vmaskmovps_avx(auVar124,*(undefined1 (*) [32])
                                                                    (local_4f0.hit + 0xe0));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x260) = auVar116;
                                auVar116 = vmaskmovps_avx(auVar124,*(undefined1 (*) [32])
                                                                    (local_4f0.hit + 0x100));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x280) = auVar116;
                              }
                            }
                            if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar124 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar124 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar124 >> 0x7f,0) == '\0') &&
                                  (auVar124 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar124 >> 0xbf,0) == '\0') &&
                                (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar124[0x1f]) {
                              *(float *)(ray + k * 4 + 0x100) = fVar243;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar94 = lVar94 + -1;
                } while (lVar94 != 0);
              }
              goto LAB_01241828;
            }
          }
          goto LAB_0124183e;
        }
      }
LAB_01241828:
    } while (bVar76);
    _local_6a0 = ZEXT416((uint)fVar183);
    local_400 = vinsertps_avx(_local_6a0,ZEXT416((uint)fVar270),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }